

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::UnaryOp_x86_fma::forward_inplace(UnaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong uVar16;
  uint uVar17;
  long lVar18;
  undefined1 (*pauVar19) [32];
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar26;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar42 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar49 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar122 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar123 [16];
  undefined1 extraout_var_17 [60];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar124 [16];
  undefined1 auVar152 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar133 [16];
  undefined1 auVar160 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar161 [32];
  undefined1 auVar139 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar143 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar168 [16];
  undefined1 auVar167 [32];
  float fVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar194;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar185 [32];
  undefined1 auVar187 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar196;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar231;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar206 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar229;
  float fVar230;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 in_ZMM3 [64];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar262 [32];
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar263 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar264 [32];
  undefined1 auVar256 [16];
  undefined1 auVar235 [16];
  undefined1 auVar257 [32];
  undefined1 auVar236 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar265 [64];
  undefined1 auVar241 [16];
  undefined1 auVar266 [64];
  undefined1 auVar252 [16];
  undefined1 auVar267 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [32];
  undefined1 auVar499 [32];
  undefined1 auVar500 [32];
  undefined1 auVar501 [32];
  undefined1 auVar502 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [32];
  undefined1 auVar514 [32];
  undefined1 auVar515 [32];
  undefined1 auVar516 [32];
  undefined1 auVar517 [32];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [32];
  undefined1 auVar530 [32];
  undefined1 auVar531 [32];
  undefined1 auVar532 [32];
  undefined1 auVar533 [32];
  undefined1 auVar534 [32];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [32];
  undefined1 auVar546 [32];
  undefined1 auVar547 [32];
  undefined1 auVar548 [32];
  undefined1 auVar549 [32];
  undefined1 auVar550 [32];
  undefined1 auVar551 [32];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [32];
  undefined1 auVar563 [32];
  undefined1 auVar564 [32];
  undefined1 auVar565 [32];
  undefined1 auVar566 [32];
  undefined1 auVar567 [32];
  undefined1 auVar568 [32];
  undefined1 auVar569 [32];
  undefined1 auVar570 [32];
  undefined1 auVar571 [32];
  undefined1 local_118 [16];
  undefined1 local_e8 [16];
  undefined1 local_c8 [16];
  undefined1 auVar50 [32];
  undefined1 auVar52 [32];
  undefined1 auVar67 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  undefined1 extraout_var_15 [60];
  undefined1 extraout_var_16 [60];
  undefined1 extraout_var_18 [60];
  undefined1 extraout_var_19 [60];
  undefined1 extraout_var_20 [60];
  undefined1 extraout_var_21 [60];
  undefined1 extraout_var_22 [60];
  undefined1 extraout_var_23 [60];
  undefined1 extraout_var_24 [60];
  undefined1 extraout_var_25 [60];
  undefined1 extraout_var_26 [60];
  undefined1 extraout_var_27 [60];
  undefined1 extraout_var_28 [60];
  undefined1 extraout_var_29 [60];
  undefined1 extraout_var_30 [60];
  undefined1 extraout_var_31 [60];
  undefined1 extraout_var_32 [60];
  undefined1 extraout_var_33 [60];
  undefined1 extraout_var_34 [60];
  undefined1 auVar153 [28];
  undefined1 auVar186 [32];
  undefined1 auVar188 [32];
  undefined1 auVar258 [32];
  undefined1 auVar311 [32];
  
  auVar51 = _DAT_005a57e0;
  auVar258 = _DAT_005a57c0;
  auVar206 = in_ZMM3._0_16_;
  auVar180 = in_ZMM5._0_16_;
  switch((this->super_UnaryOp).op_type) {
  case 0:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar49._8_4_ = 0x7fffffff;
      auVar49._0_8_ = 0x7fffffff7fffffff;
      auVar49._12_4_ = 0x7fffffff;
      auVar49._16_4_ = 0x7fffffff;
      auVar49._20_4_ = 0x7fffffff;
      auVar49._24_4_ = 0x7fffffff;
      auVar49._28_4_ = 0x7fffffff;
      auVar124._8_4_ = 0x7fffffff;
      auVar124._0_8_ = 0x7fffffff7fffffff;
      auVar124._12_4_ = 0x7fffffff;
      auVar235._8_8_ = 0x8000000000000000;
      auVar235._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar180,auVar180);
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar458 = vandps_avx(auVar49,*pauVar19);
            *pauVar19 = auVar458;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar180 = vandps_avx(auVar124,*(undefined1 (*) [16])*pauVar19);
          *(undefined1 (*) [16])*pauVar19 = auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar312._8_8_ = 0;
          auVar312._0_8_ = uVar16;
          auVar314 = vpshufd_avx(auVar312,0x44);
          auVar180 = vorps_avx(auVar314,auVar235);
          auVar148 = vorps_avx(auVar314,auVar235);
          auVar314 = vorps_avx(auVar314,auVar235);
          uVar24 = 0;
          do {
            auVar419._8_8_ = 0;
            auVar419._0_8_ = uVar24;
            auVar346 = vpshufd_avx(auVar419,0x44);
            auVar447._16_16_ = auVar346;
            auVar447._0_16_ = auVar346;
            auVar458 = vorps_avx(auVar447,auVar258);
            auVar390 = vorps_avx(auVar447,auVar51);
            auVar482._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar482._8_4_ = auVar390._24_4_;
            auVar482._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar346 = vpcmpgtq_avx(auVar482,auVar180);
            auVar420._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar420._8_4_ = auVar390._8_4_;
            auVar420._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar420,auVar148);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar483._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar483._8_4_ = auVar458._24_4_;
            auVar483._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar483,auVar180);
            auVar461._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar461._8_4_ = auVar458._8_4_;
            auVar461._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar461,auVar314);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar346 = vpackssdw_avx(auVar123 ^ auVar206,auVar346 ^ auVar206);
            auVar123 = vpmovsxwd_avx(auVar346);
            auVar346 = vpunpckhwd_avx(auVar346,auVar346);
            auVar448._16_16_ = auVar346;
            auVar448._0_16_ = auVar123;
            auVar458 = vmaskmovps_avx(auVar448,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar458 = vandps_avx(auVar458,auVar49);
            auVar458 = vmaskmovps_avx(auVar448,auVar458);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 1:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar250._8_8_ = 0x8000000000000000;
      auVar250._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar180,auVar180);
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar458 = *pauVar19;
            auVar340._0_8_ = auVar458._0_8_ ^ 0x8000000080000000;
            auVar340._8_4_ = auVar458._8_4_ ^ 0x80000000;
            auVar340._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar340._16_4_ = auVar458._16_4_ ^ 0x80000000;
            auVar340._20_4_ = auVar458._20_4_ ^ 0x80000000;
            auVar340._24_4_ = auVar458._24_4_ ^ 0x80000000;
            auVar340._28_4_ = auVar458._28_4_ ^ 0x80000000;
            *pauVar19 = auVar340;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar180 = *(undefined1 (*) [16])*pauVar19;
          auVar324._0_8_ = auVar180._0_8_ ^ 0x8000000080000000;
          auVar324._8_4_ = auVar180._8_4_ ^ 0x80000000;
          auVar324._12_4_ = auVar180._12_4_ ^ 0x80000000;
          *(undefined1 (*) [16])*pauVar19 = auVar324;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar325._8_8_ = 0;
          auVar325._0_8_ = uVar16;
          auVar314 = vpshufd_avx(auVar325,0x44);
          auVar180 = vorps_avx(auVar314,auVar250);
          auVar148 = vorps_avx(auVar314,auVar250);
          auVar314 = vorps_avx(auVar314,auVar250);
          uVar24 = 0;
          do {
            auVar435._8_8_ = 0;
            auVar435._0_8_ = uVar24;
            auVar346 = vpshufd_avx(auVar435,0x44);
            auVar456._16_16_ = auVar346;
            auVar456._0_16_ = auVar346;
            auVar458 = vorps_avx(auVar456,auVar258);
            auVar390 = vorps_avx(auVar456,auVar51);
            auVar492._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar492._8_4_ = auVar390._24_4_;
            auVar492._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar346 = vpcmpgtq_avx(auVar492,auVar180);
            auVar436._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar436._8_4_ = auVar390._8_4_;
            auVar436._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar436,auVar148);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar493._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar493._8_4_ = auVar458._24_4_;
            auVar493._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar493,auVar180);
            auVar468._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar468._8_4_ = auVar458._8_4_;
            auVar468._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar468,auVar314);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar346 = vpackssdw_avx(auVar123 ^ auVar206,auVar346 ^ auVar206);
            auVar123 = vpmovsxwd_avx(auVar346);
            auVar346 = vpunpckhwd_avx(auVar346,auVar346);
            auVar457._16_16_ = auVar346;
            auVar457._0_16_ = auVar123;
            auVar458 = vmaskmovps_avx(auVar457,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar479._0_8_ = auVar458._0_8_ ^ 0x8000000080000000;
            auVar479._8_4_ = auVar458._8_4_ ^ 0x80000000;
            auVar479._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar479._16_4_ = auVar458._16_4_ ^ 0x80000000;
            auVar479._20_4_ = auVar458._20_4_ ^ 0x80000000;
            auVar479._24_4_ = auVar458._24_4_ ^ 0x80000000;
            auVar479._28_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar458 = vmaskmovps_avx(auVar457,auVar479);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 2:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar176._8_8_ = 0x8000000000000000;
      auVar176._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar206,auVar206);
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar458 = vroundps_avx(*pauVar19,1);
            *pauVar19 = auVar458;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar180 = vroundps_avx(*(undefined1 (*) [16])*pauVar19,1);
          *(undefined1 (*) [16])*pauVar19 = auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar245._8_8_ = 0;
          auVar245._0_8_ = uVar16;
          auVar314 = vpshufd_avx(auVar245,0x44);
          auVar180 = vorps_avx(auVar314,auVar176);
          auVar148 = vorps_avx(auVar314,auVar176);
          auVar314 = vorps_avx(auVar314,auVar176);
          uVar24 = 0;
          do {
            auVar351._8_8_ = 0;
            auVar351._0_8_ = uVar24;
            auVar346 = vpshufd_avx(auVar351,0x44);
            auVar379._16_16_ = auVar346;
            auVar379._0_16_ = auVar346;
            auVar458 = vorps_avx(auVar379,auVar258);
            auVar390 = vorps_avx(auVar379,auVar51);
            auVar428._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar428._8_4_ = auVar390._24_4_;
            auVar428._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar346 = vpcmpgtq_avx(auVar428,auVar180);
            auVar352._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar352._8_4_ = auVar390._8_4_;
            auVar352._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar352,auVar148);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar429._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar429._8_4_ = auVar458._24_4_;
            auVar429._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar429,auVar180);
            auVar400._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar400._8_4_ = auVar458._8_4_;
            auVar400._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar400,auVar314);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar346 = vpackssdw_avx(auVar123 ^ auVar206,auVar346 ^ auVar206);
            auVar123 = vpmovsxwd_avx(auVar346);
            auVar346 = vpunpckhwd_avx(auVar346,auVar346);
            auVar380._16_16_ = auVar346;
            auVar380._0_16_ = auVar123;
            auVar458 = vmaskmovps_avx(auVar380,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar458 = vroundps_avx(auVar458,9);
            auVar458 = vmaskmovps_avx(auVar380,auVar458);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 3:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar177._8_8_ = 0x8000000000000000;
      auVar177._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar206,auVar206);
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar458 = vroundps_avx(*pauVar19,2);
            *pauVar19 = auVar458;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar180 = vroundps_avx(*(undefined1 (*) [16])*pauVar19,2);
          *(undefined1 (*) [16])*pauVar19 = auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar247._8_8_ = 0;
          auVar247._0_8_ = uVar16;
          auVar314 = vpshufd_avx(auVar247,0x44);
          auVar180 = vorps_avx(auVar314,auVar177);
          auVar148 = vorps_avx(auVar314,auVar177);
          auVar314 = vorps_avx(auVar314,auVar177);
          uVar24 = 0;
          do {
            auVar353._8_8_ = 0;
            auVar353._0_8_ = uVar24;
            auVar346 = vpshufd_avx(auVar353,0x44);
            auVar381._16_16_ = auVar346;
            auVar381._0_16_ = auVar346;
            auVar458 = vorps_avx(auVar381,auVar258);
            auVar390 = vorps_avx(auVar381,auVar51);
            auVar432._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar432._8_4_ = auVar390._24_4_;
            auVar432._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar346 = vpcmpgtq_avx(auVar432,auVar180);
            auVar354._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar354._8_4_ = auVar390._8_4_;
            auVar354._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar354,auVar148);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar433._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar433._8_4_ = auVar458._24_4_;
            auVar433._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar433,auVar180);
            auVar401._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar401._8_4_ = auVar458._8_4_;
            auVar401._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar401,auVar314);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar346 = vpackssdw_avx(auVar123 ^ auVar206,auVar346 ^ auVar206);
            auVar123 = vpmovsxwd_avx(auVar346);
            auVar346 = vpunpckhwd_avx(auVar346,auVar346);
            auVar382._16_16_ = auVar346;
            auVar382._0_16_ = auVar123;
            auVar458 = vmaskmovps_avx(auVar382,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar458 = vroundps_avx(auVar458,10);
            auVar458 = vmaskmovps_avx(auVar382,auVar458);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 4:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar173._8_8_ = 0x8000000000000000;
      auVar173._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar206,auVar206);
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar4._4_4_ = *(float *)(*pauVar19 + 4) * *(float *)(*pauVar19 + 4);
            auVar4._0_4_ = *(float *)*pauVar19 * *(float *)*pauVar19;
            auVar4._8_4_ = *(float *)(*pauVar19 + 8) * *(float *)(*pauVar19 + 8);
            auVar4._12_4_ = *(float *)(*pauVar19 + 0xc) * *(float *)(*pauVar19 + 0xc);
            auVar4._16_4_ = *(float *)(*pauVar19 + 0x10) * *(float *)(*pauVar19 + 0x10);
            auVar4._20_4_ = *(float *)(*pauVar19 + 0x14) * *(float *)(*pauVar19 + 0x14);
            auVar4._24_4_ = *(float *)(*pauVar19 + 0x18) * *(float *)(*pauVar19 + 0x18);
            auVar4._28_4_ = *(undefined4 *)(*pauVar19 + 0x1c);
            *pauVar19 = auVar4;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar240._0_4_ = *(float *)*pauVar19 * *(float *)*pauVar19;
          auVar240._4_4_ = *(float *)(*pauVar19 + 4) * *(float *)(*pauVar19 + 4);
          auVar240._8_4_ = *(float *)(*pauVar19 + 8) * *(float *)(*pauVar19 + 8);
          auVar240._12_4_ = *(float *)(*pauVar19 + 0xc) * *(float *)(*pauVar19 + 0xc);
          *(undefined1 (*) [16])*pauVar19 = auVar240;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar241._8_8_ = 0;
          auVar241._0_8_ = uVar16;
          auVar314 = vpshufd_avx(auVar241,0x44);
          auVar180 = vorps_avx(auVar314,auVar173);
          auVar148 = vorps_avx(auVar314,auVar173);
          auVar314 = vorps_avx(auVar314,auVar173);
          uVar24 = 0;
          do {
            auVar347._8_8_ = 0;
            auVar347._0_8_ = uVar24;
            auVar346 = vpshufd_avx(auVar347,0x44);
            auVar375._16_16_ = auVar346;
            auVar375._0_16_ = auVar346;
            auVar458 = vorps_avx(auVar375,auVar258);
            auVar390 = vorps_avx(auVar375,auVar51);
            auVar424._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar424._8_4_ = auVar390._24_4_;
            auVar424._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar346 = vpcmpgtq_avx(auVar424,auVar180);
            auVar348._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar348._8_4_ = auVar390._8_4_;
            auVar348._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar348,auVar148);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar425._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar425._8_4_ = auVar458._24_4_;
            auVar425._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar425,auVar180);
            auVar397._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar397._8_4_ = auVar458._8_4_;
            auVar397._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar397,auVar314);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar346 = vpackssdw_avx(auVar123 ^ auVar206,auVar346 ^ auVar206);
            auVar123 = vpmovsxwd_avx(auVar346);
            auVar346 = vpunpckhwd_avx(auVar346,auVar346);
            auVar376._16_16_ = auVar346;
            auVar376._0_16_ = auVar123;
            auVar458 = vmaskmovps_avx(auVar376,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar5._4_4_ = auVar458._4_4_ * auVar458._4_4_;
            auVar5._0_4_ = auVar458._0_4_ * auVar458._0_4_;
            auVar5._8_4_ = auVar458._8_4_ * auVar458._8_4_;
            auVar5._12_4_ = auVar458._12_4_ * auVar458._12_4_;
            auVar5._16_4_ = auVar458._16_4_ * auVar458._16_4_;
            auVar5._20_4_ = auVar458._20_4_ * auVar458._20_4_;
            auVar5._24_4_ = auVar458._24_4_ * auVar458._24_4_;
            auVar5._28_4_ = auVar458._28_4_;
            auVar458 = vmaskmovps_avx(auVar376,auVar5);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 5:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar181._8_8_ = 0x8000000000000000;
      auVar181._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar206,auVar206);
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar458 = vsqrtps_avx(*pauVar19);
            *pauVar19 = auVar458;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar180 = vsqrtps_avx(*(undefined1 (*) [16])*pauVar19);
          *(undefined1 (*) [16])*pauVar19 = auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar252._8_8_ = 0;
          auVar252._0_8_ = uVar16;
          auVar314 = vpshufd_avx(auVar252,0x44);
          auVar180 = vorps_avx(auVar314,auVar181);
          auVar148 = vorps_avx(auVar314,auVar181);
          auVar314 = vorps_avx(auVar314,auVar181);
          uVar24 = 0;
          do {
            auVar357._8_8_ = 0;
            auVar357._0_8_ = uVar24;
            auVar346 = vpshufd_avx(auVar357,0x44);
            auVar384._16_16_ = auVar346;
            auVar384._0_16_ = auVar346;
            auVar458 = vorps_avx(auVar384,auVar258);
            auVar390 = vorps_avx(auVar384,auVar51);
            auVar438._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar438._8_4_ = auVar390._24_4_;
            auVar438._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar346 = vpcmpgtq_avx(auVar438,auVar180);
            auVar358._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar358._8_4_ = auVar390._8_4_;
            auVar358._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar358,auVar148);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar439._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar439._8_4_ = auVar458._24_4_;
            auVar439._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar439,auVar180);
            auVar404._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar404._8_4_ = auVar458._8_4_;
            auVar404._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar404,auVar314);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar346 = vpackssdw_avx(auVar123 ^ auVar206,auVar346 ^ auVar206);
            auVar123 = vpmovsxwd_avx(auVar346);
            auVar346 = vpunpckhwd_avx(auVar346,auVar346);
            auVar385._16_16_ = auVar346;
            auVar385._0_16_ = auVar123;
            auVar458 = vmaskmovps_avx(auVar385,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar458 = vsqrtps_avx(auVar458);
            auVar458 = vmaskmovps_avx(auVar385,auVar458);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 6:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar182._8_8_ = 0x8000000000000000;
      auVar182._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar206,auVar206);
      auVar263._8_4_ = 0x3f800000;
      auVar263._0_8_ = 0x3f8000003f800000;
      auVar263._12_4_ = 0x3f800000;
      auVar263._16_4_ = 0x3f800000;
      auVar263._20_4_ = 0x3f800000;
      auVar263._24_4_ = 0x3f800000;
      auVar263._28_4_ = 0x3f800000;
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar458 = vrsqrtps_avx(*pauVar19);
            *pauVar19 = auVar458;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar180 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar19);
          *(undefined1 (*) [16])*pauVar19 = auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar280._8_8_ = 0;
          auVar280._0_8_ = uVar16;
          auVar314 = vpshufd_avx(auVar280,0x44);
          auVar180 = vorps_avx(auVar314,auVar182);
          auVar148 = vorps_avx(auVar314,auVar182);
          auVar314 = vorps_avx(auVar314,auVar182);
          uVar24 = 0;
          do {
            auVar406._8_8_ = 0;
            auVar406._0_8_ = uVar24;
            auVar346 = vpshufd_avx(auVar406,0x44);
            auVar416._16_16_ = auVar346;
            auVar416._0_16_ = auVar346;
            auVar458 = vorps_avx(auVar416,auVar258);
            auVar390 = vorps_avx(auVar416,auVar51);
            auVar472._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar472._8_4_ = auVar390._24_4_;
            auVar472._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar346 = vpcmpgtq_avx(auVar472,auVar180);
            auVar407._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar407._8_4_ = auVar390._8_4_;
            auVar407._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar407,auVar148);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar473._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar473._8_4_ = auVar458._24_4_;
            auVar473._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar473,auVar180);
            auVar441._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar441._8_4_ = auVar458._8_4_;
            auVar441._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar441,auVar314);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar346 = vpackssdw_avx(auVar123 ^ auVar206,auVar346 ^ auVar206);
            auVar123 = vpmovsxwd_avx(auVar346);
            auVar346 = vpunpckhwd_avx(auVar346,auVar346);
            auVar417._16_16_ = auVar346;
            auVar417._0_16_ = auVar123;
            auVar458 = vmaskmovps_avx(auVar417,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar458 = vsqrtps_avx(auVar458);
            auVar458 = vdivps_avx(auVar263,auVar458);
            auVar458 = vmaskmovps_avx(auVar417,auVar458);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 7:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      local_c8._8_8_ = 0x8000000000000000;
      local_c8._0_8_ = 0x8000000000000000;
      do {
        auVar566._8_4_ = 0x3e2aaaaa;
        auVar566._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar500._8_4_ = 0x395e8083;
        auVar500._0_8_ = 0x395e8083395e8083;
        auVar455._8_4_ = 0x3f318000;
        auVar455._0_8_ = 0x3f3180003f318000;
        auVar414._8_4_ = 0x3f800000;
        auVar414._0_8_ = 0x3f8000003f800000;
        auVar383._8_4_ = 0x3d2aa9c1;
        auVar383._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar339._8_4_ = 0x3f000000;
        auVar339._0_8_ = 0x3f0000003f000000;
        auVar294._8_4_ = 0x3c088908;
        auVar294._0_8_ = 0x3c0889083c088908;
        auVar260._8_4_ = 0x39506967;
        auVar260._0_8_ = 0x3950696739506967;
        auVar222._8_4_ = 0x3fb8aa3b;
        auVar222._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar189._8_4_ = 0xc2b0c0a5;
        auVar189._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar161._8_4_ = 0x42b0c0a5;
        auVar161._0_8_ = 0x42b0c0a542b0c0a5;
        auVar566._12_4_ = 0x3e2aaaaa;
        auVar500._12_4_ = 0x395e8083;
        auVar455._12_4_ = 0x3f318000;
        auVar414._12_4_ = 0x3f800000;
        auVar383._12_4_ = 0x3d2aa9c1;
        auVar339._12_4_ = 0x3f000000;
        auVar294._12_4_ = 0x3c088908;
        auVar260._12_4_ = 0x39506967;
        auVar222._12_4_ = 0x3fb8aa3b;
        auVar189._12_4_ = 0xc2b0c0a5;
        auVar161._12_4_ = 0x42b0c0a5;
        auVar566._16_4_ = 0x3e2aaaaa;
        auVar500._16_4_ = 0x395e8083;
        auVar455._16_4_ = 0x3f318000;
        auVar414._16_4_ = 0x3f800000;
        auVar383._16_4_ = 0x3d2aa9c1;
        auVar339._16_4_ = 0x3f000000;
        auVar294._16_4_ = 0x3c088908;
        auVar260._16_4_ = 0x39506967;
        auVar222._16_4_ = 0x3fb8aa3b;
        auVar189._16_4_ = 0xc2b0c0a5;
        auVar161._16_4_ = 0x42b0c0a5;
        auVar566._20_4_ = 0x3e2aaaaa;
        auVar500._20_4_ = 0x395e8083;
        auVar455._20_4_ = 0x3f318000;
        auVar414._20_4_ = 0x3f800000;
        auVar383._20_4_ = 0x3d2aa9c1;
        auVar339._20_4_ = 0x3f000000;
        auVar294._20_4_ = 0x3c088908;
        auVar260._20_4_ = 0x39506967;
        auVar222._20_4_ = 0x3fb8aa3b;
        auVar189._20_4_ = 0xc2b0c0a5;
        auVar161._20_4_ = 0x42b0c0a5;
        auVar566._24_4_ = 0x3e2aaaaa;
        auVar500._24_4_ = 0x395e8083;
        auVar455._24_4_ = 0x3f318000;
        auVar414._24_4_ = 0x3f800000;
        auVar383._24_4_ = 0x3d2aa9c1;
        auVar339._24_4_ = 0x3f000000;
        auVar294._24_4_ = 0x3c088908;
        auVar260._24_4_ = 0x39506967;
        auVar222._24_4_ = 0x3fb8aa3b;
        auVar189._24_4_ = 0xc2b0c0a5;
        auVar161._24_4_ = 0x42b0c0a5;
        auVar566._28_4_ = 0x3e2aaaaa;
        auVar500._28_4_ = 0x395e8083;
        auVar455._28_4_ = 0x3f318000;
        auVar414._28_4_ = 0x3f800000;
        auVar383._28_4_ = 0x3d2aa9c1;
        auVar339._28_4_ = 0x3f000000;
        auVar294._28_4_ = 0x3c088908;
        auVar260._28_4_ = 0x39506967;
        auVar222._28_4_ = 0x3fb8aa3b;
        auVar189._28_4_ = 0xc2b0c0a5;
        auVar161._28_4_ = 0x42b0c0a5;
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar258 = vminps_avx(auVar161,*pauVar19);
            auVar51 = vmaxps_avx(auVar258,auVar189);
            auVar206 = vfmadd213ps_fma(auVar222,auVar51,auVar339);
            auVar458 = vroundps_avx(ZEXT1632(auVar206),1);
            auVar258 = vcmpps_avx(ZEXT1632(auVar206),auVar458,1);
            auVar258 = vandps_avx(auVar414,auVar258);
            auVar258 = vsubps_avx(auVar458,auVar258);
            auVar206 = vfmsub231ps_fma(auVar51,auVar258,auVar455);
            auVar180 = vfmsub231ps_fma(ZEXT1632(auVar206),auVar258,auVar500);
            auVar51 = ZEXT1632(auVar180);
            auVar11._28_4_ = auVar458._28_4_;
            auVar11._0_28_ =
                 ZEXT1628(CONCAT412(auVar180._12_4_ * auVar180._12_4_,
                                    CONCAT48(auVar180._8_4_ * auVar180._8_4_,
                                             CONCAT44(auVar180._4_4_ * auVar180._4_4_,
                                                      auVar180._0_4_ * auVar180._0_4_))));
            auVar261._8_4_ = 0x3ab743ce;
            auVar261._0_8_ = 0x3ab743ce3ab743ce;
            auVar261._12_4_ = 0x3ab743ce;
            auVar261._16_4_ = 0x3ab743ce;
            auVar261._20_4_ = 0x3ab743ce;
            auVar261._24_4_ = 0x3ab743ce;
            auVar261._28_4_ = 0x3ab743ce;
            auVar206 = vfmadd213ps_fma(auVar260,auVar51,auVar261);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar51,auVar294);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar51,auVar383);
            auVar51 = ZEXT1632(auVar180);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar51,auVar566);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar51,auVar339);
            auVar148 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar11,auVar51);
            auVar36._0_4_ = (int)auVar258._0_4_;
            auVar36._4_4_ = (int)auVar258._4_4_;
            auVar36._8_4_ = (int)auVar258._8_4_;
            auVar36._12_4_ = (int)auVar258._12_4_;
            auVar67._16_4_ = (int)auVar258._16_4_;
            auVar67._0_16_ = auVar36;
            auVar67._20_4_ = (int)auVar258._20_4_;
            auVar67._24_4_ = (int)auVar258._24_4_;
            auVar67._28_4_ = (int)auVar258._28_4_;
            auVar180 = vpslld_avx(auVar36,0x17);
            auVar206 = vpslld_avx(auVar67._16_16_,0x17);
            auVar248._8_4_ = 0x3f800000;
            auVar248._0_8_ = 0x3f8000003f800000;
            auVar248._12_4_ = 0x3f800000;
            auVar206 = vpaddd_avx(auVar206,auVar248);
            auVar180 = vpaddd_avx(auVar180,auVar248);
            auVar68._16_16_ = auVar206;
            auVar68._0_16_ = auVar180;
            auVar206 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar148),auVar68);
            *pauVar19 = ZEXT1632(auVar206);
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar249._8_4_ = 0x3f800000;
        auVar249._0_8_ = 0x3f8000003f800000;
        auVar249._12_4_ = 0x3f800000;
        auVar274._8_4_ = 0x42b0c0a5;
        auVar274._0_8_ = 0x42b0c0a542b0c0a5;
        auVar274._12_4_ = 0x42b0c0a5;
        auVar323._8_4_ = 0xc2b0c0a5;
        auVar323._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar323._12_4_ = 0xc2b0c0a5;
        auVar355._8_4_ = 0x3fb8aa3b;
        auVar355._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar355._12_4_ = 0x3fb8aa3b;
        auVar402._8_4_ = 0x3f000000;
        auVar402._0_8_ = 0x3f0000003f000000;
        auVar402._12_4_ = 0x3f000000;
        auVar434._8_4_ = 0x3f318000;
        auVar434._0_8_ = 0x3f3180003f318000;
        auVar434._12_4_ = 0x3f318000;
        auVar467._8_4_ = 0x395e8083;
        auVar467._0_8_ = 0x395e8083395e8083;
        auVar467._12_4_ = 0x395e8083;
        auVar491._8_4_ = 0x3ab743ce;
        auVar491._0_8_ = 0x3ab743ce3ab743ce;
        auVar491._12_4_ = 0x3ab743ce;
        auVar509._8_4_ = 0x39506967;
        auVar509._0_8_ = 0x3950696739506967;
        auVar509._12_4_ = 0x39506967;
        auVar524._8_4_ = 0x3c088908;
        auVar524._0_8_ = 0x3c0889083c088908;
        auVar524._12_4_ = 0x3c088908;
        auVar540._8_4_ = 0x3d2aa9c1;
        auVar540._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar540._12_4_ = 0x3d2aa9c1;
        auVar557._8_4_ = 0x3e2aaaaa;
        auVar557._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar557._12_4_ = 0x3e2aaaaa;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar206 = vminps_avx(auVar274,*(undefined1 (*) [16])*pauVar19);
          auVar148 = vmaxps_avx(auVar206,auVar323);
          auVar206 = vfmadd213ps_fma(auVar355,auVar148,auVar402);
          auVar178._0_4_ = (int)auVar206._0_4_;
          auVar178._4_4_ = (int)auVar206._4_4_;
          auVar178._8_4_ = (int)auVar206._8_4_;
          auVar178._12_4_ = (int)auVar206._12_4_;
          auVar180 = vcvtdq2ps_avx(auVar178);
          auVar206 = vcmpps_avx(auVar206,auVar180,1);
          auVar206 = vandps_avx(auVar206,auVar249);
          auVar206 = vsubps_avx(auVar180,auVar206);
          auVar180 = vfmsub231ps_fma(auVar148,auVar206,auVar434);
          auVar148 = vfmsub231ps_fma(auVar180,auVar206,auVar467);
          auVar179._0_4_ = auVar148._0_4_ * auVar148._0_4_;
          auVar179._4_4_ = auVar148._4_4_ * auVar148._4_4_;
          auVar179._8_4_ = auVar148._8_4_ * auVar148._8_4_;
          auVar179._12_4_ = auVar148._12_4_ * auVar148._12_4_;
          auVar180 = vfmadd213ps_fma(auVar509,auVar148,auVar491);
          auVar180 = vfmadd213ps_fma(auVar180,auVar148,auVar524);
          auVar180 = vfmadd213ps_fma(auVar180,auVar148,auVar540);
          auVar180 = vfmadd213ps_fma(auVar180,auVar148,auVar557);
          auVar180 = vfmadd213ps_fma(auVar180,auVar148,auVar402);
          auVar180 = vfmadd213ps_fma(auVar180,auVar179,auVar148);
          auVar37._0_4_ = (int)auVar206._0_4_;
          auVar37._4_4_ = (int)auVar206._4_4_;
          auVar37._8_4_ = (int)auVar206._8_4_;
          auVar37._12_4_ = (int)auVar206._12_4_;
          auVar206 = vpslld_avx(auVar37,0x17);
          auVar206 = vpaddd_avx(auVar206,auVar249);
          auVar206 = vfmadd213ps_fma(auVar206,auVar180,auVar206);
          *(undefined1 (*) [16])*pauVar19 = auVar206;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        auVar206 = vpcmpeqd_avx(auVar274,auVar274);
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar16;
          auVar314 = vpshufd_avx(auVar38,0x44);
          auVar180 = vorps_avx(auVar314,local_c8);
          auVar148 = vorps_avx(auVar314,local_c8);
          uVar24 = 0;
          auVar258 = _DAT_005a57e0;
          do {
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar24;
            auVar346 = vpshufd_avx(auVar39,0x44);
            auVar69._16_16_ = auVar346;
            auVar69._0_16_ = auVar346;
            auVar51 = vorps_avx(auVar69,_DAT_005a57c0);
            auVar258 = vorps_avx(auVar69,auVar258);
            auVar122 = vpor_avx(auVar314,local_c8);
            auVar346 = vpcmpgtq_avx(auVar258._16_16_ ^ local_c8,auVar122);
            auVar123 = vpcmpgtq_avx(auVar258._0_16_ ^ local_c8,auVar180);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar123 = vpcmpgtq_avx(auVar51._16_16_ ^ local_c8,auVar122);
            auVar139._0_8_ = auVar51._0_8_ ^ 0x8000000000000000;
            auVar139._8_4_ = auVar51._8_4_;
            auVar139._12_4_ = auVar51._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar139,auVar148);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar346 = vpackssdw_avx(auVar123 ^ auVar206,auVar346 ^ auVar206);
            auVar123 = vpmovsxwd_avx(auVar346);
            auVar346 = vpunpckhwd_avx(auVar346,auVar346);
            auVar70._16_16_ = auVar346;
            auVar70._0_16_ = auVar123;
            auVar258 = vmaskmovps_avx(auVar70,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar122 = auVar258._16_16_;
            local_118._0_4_ = expf(auVar258._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_03;
            local_118._8_4_ = extraout_XMM0_Dc_03;
            local_118._12_4_ = extraout_XMM0_Dd_03;
            auVar346 = vmovshdup_avx(auVar122);
            auVar99._0_4_ = expf(auVar346._0_4_);
            auVar99._4_60_ = extraout_var_11;
            auVar346 = vinsertps_avx(local_118,auVar99._0_16_,0x10);
            auVar123 = vpermilpd_avx(auVar122,1);
            auVar100._0_4_ = expf(auVar123._0_4_);
            auVar100._4_60_ = extraout_var_12;
            auVar346 = vinsertps_avx(auVar346,auVar100._0_16_,0x20);
            auVar123 = vpermilps_avx(auVar122,0xff);
            auVar101._0_4_ = expf(auVar123._0_4_);
            auVar101._4_60_ = extraout_var_13;
            auVar346 = vinsertps_avx(auVar346,auVar101._0_16_,0x30);
            local_e8._0_4_ = auVar258._0_4_;
            local_118._0_4_ = expf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_04;
            local_118._8_4_ = extraout_XMM0_Dc_04;
            local_118._12_4_ = extraout_XMM0_Dd_04;
            local_e8 = auVar258._0_16_;
            auVar123 = vmovshdup_avx(local_e8);
            auVar102._0_4_ = expf(auVar123._0_4_);
            auVar102._4_60_ = extraout_var_14;
            auVar123 = vinsertps_avx(local_118,auVar102._0_16_,0x10);
            auVar122 = vpermilpd_avx(local_e8,1);
            auVar103._0_4_ = expf(auVar122._0_4_);
            auVar103._4_60_ = extraout_var_15;
            auVar123 = vinsertps_avx(auVar123,auVar103._0_16_,0x20);
            auVar122 = vpermilps_avx(local_e8,0xff);
            auVar104._0_4_ = expf(auVar122._0_4_);
            auVar258 = _DAT_005a57e0;
            auVar104._4_60_ = extraout_var_16;
            auVar206 = vpcmpeqd_avx(auVar206,auVar206);
            auVar123 = vinsertps_avx(auVar123,auVar104._0_16_,0x30);
            auVar71._16_16_ = auVar346;
            auVar71._0_16_ = auVar123;
            auVar51 = vmaskmovps_avx(auVar70,auVar71);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar51;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 8:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar46._8_8_ = 0x8000000000000000;
      auVar46._0_8_ = 0x8000000000000000;
      do {
        auVar282 = in_ZMM5._0_16_;
        auVar571._8_4_ = 0xbdfe5d4f;
        auVar571._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar551._8_4_ = 0x3def251a;
        auVar551._0_8_ = 0x3def251a3def251a;
        auVar534._8_4_ = 0x3d9021bb;
        auVar534._0_8_ = 0x3d9021bb3d9021bb;
        auVar517._8_4_ = 0xbdebd1b8;
        auVar517._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar481._8_4_ = 0x3f3504f3;
        auVar481._0_8_ = 0x3f3504f33f3504f3;
        auVar460._8_4_ = 0x3f000000;
        auVar460._0_8_ = 0x3f0000003f000000;
        auVar418._8_4_ = 0x807fffff;
        auVar418._0_8_ = 0x807fffff807fffff;
        auVar389._8_4_ = 0x800000;
        auVar389._0_8_ = 0x80000000800000;
        auVar571._12_4_ = 0xbdfe5d4f;
        auVar551._12_4_ = 0x3def251a;
        auVar534._12_4_ = 0x3d9021bb;
        auVar517._12_4_ = 0xbdebd1b8;
        auVar481._12_4_ = 0x3f3504f3;
        auVar460._12_4_ = 0x3f000000;
        auVar418._12_4_ = 0x807fffff;
        auVar389._12_4_ = 0x800000;
        auVar571._16_4_ = 0xbdfe5d4f;
        auVar551._16_4_ = 0x3def251a;
        auVar534._16_4_ = 0x3d9021bb;
        auVar517._16_4_ = 0xbdebd1b8;
        auVar481._16_4_ = 0x3f3504f3;
        auVar460._16_4_ = 0x3f000000;
        auVar418._16_4_ = 0x807fffff;
        auVar389._16_4_ = 0x800000;
        auVar571._20_4_ = 0xbdfe5d4f;
        auVar551._20_4_ = 0x3def251a;
        auVar534._20_4_ = 0x3d9021bb;
        auVar517._20_4_ = 0xbdebd1b8;
        auVar481._20_4_ = 0x3f3504f3;
        auVar460._20_4_ = 0x3f000000;
        auVar418._20_4_ = 0x807fffff;
        auVar389._20_4_ = 0x800000;
        auVar571._24_4_ = 0xbdfe5d4f;
        auVar551._24_4_ = 0x3def251a;
        auVar534._24_4_ = 0x3d9021bb;
        auVar517._24_4_ = 0xbdebd1b8;
        auVar481._24_4_ = 0x3f3504f3;
        auVar460._24_4_ = 0x3f000000;
        auVar418._24_4_ = 0x807fffff;
        auVar389._24_4_ = 0x800000;
        auVar571._28_4_ = 0xbdfe5d4f;
        auVar551._28_4_ = 0x3def251a;
        auVar534._28_4_ = 0x3d9021bb;
        auVar517._28_4_ = 0xbdebd1b8;
        auVar481._28_4_ = 0x3f3504f3;
        auVar460._28_4_ = 0x3f000000;
        auVar418._28_4_ = 0x807fffff;
        auVar389._28_4_ = 0x800000;
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          auVar328._8_4_ = 0xffffff81;
          auVar328._0_8_ = 0xffffff81ffffff81;
          auVar328._12_4_ = 0xffffff81;
          do {
            auVar258 = vmaxps_avx(*pauVar19,auVar389);
            auVar180 = vpsrld_avx(auVar258._0_16_,0x17);
            auVar206 = vpsrld_avx(auVar258._16_16_,0x17);
            auVar258 = vandps_avx(auVar418,auVar258);
            auVar458 = vorps_avx(auVar460,auVar258);
            auVar51 = vcmpps_avx(auVar481,auVar458,2);
            auVar258 = vandnps_avx(auVar51,auVar458);
            auVar167._0_4_ = auVar458._0_4_ + -1.0 + auVar258._0_4_;
            auVar167._4_4_ = auVar458._4_4_ + -1.0 + auVar258._4_4_;
            auVar167._8_4_ = auVar458._8_4_ + -1.0 + auVar258._8_4_;
            auVar167._12_4_ = auVar458._12_4_ + -1.0 + auVar258._12_4_;
            auVar167._16_4_ = auVar458._16_4_ + -1.0 + auVar258._16_4_;
            auVar167._20_4_ = auVar458._20_4_ + -1.0 + auVar258._20_4_;
            auVar167._24_4_ = auVar458._24_4_ + -1.0 + auVar258._24_4_;
            auVar167._28_4_ = auVar458._28_4_ + -1.0 + auVar258._28_4_;
            auVar206 = vpsubd_avx(auVar206,auVar51._16_16_);
            auVar206 = vpaddd_avx(auVar206,auVar328);
            auVar180 = vpsubd_avx(auVar180,auVar51._0_16_);
            auVar180 = vpaddd_avx(auVar180,auVar328);
            auVar193._16_16_ = auVar206;
            auVar193._0_16_ = auVar180;
            auVar227._0_4_ = auVar167._0_4_ * auVar167._0_4_;
            auVar227._4_4_ = auVar167._4_4_ * auVar167._4_4_;
            auVar227._8_4_ = auVar167._8_4_ * auVar167._8_4_;
            auVar227._12_4_ = auVar167._12_4_ * auVar167._12_4_;
            auVar227._16_4_ = auVar167._16_4_ * auVar167._16_4_;
            auVar227._20_4_ = auVar167._20_4_ * auVar167._20_4_;
            auVar227._24_4_ = auVar167._24_4_ * auVar167._24_4_;
            auVar227._28_4_ = 0;
            auVar206 = vfmadd213ps_fma(auVar534,auVar167,auVar517);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar167,auVar551);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar167,auVar571);
            auVar306._8_4_ = 0x3e11e9bf;
            auVar306._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar306._12_4_ = 0x3e11e9bf;
            auVar306._16_4_ = 0x3e11e9bf;
            auVar306._20_4_ = 0x3e11e9bf;
            auVar306._24_4_ = 0x3e11e9bf;
            auVar306._28_4_ = 0x3e11e9bf;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar167,auVar306);
            auVar307._8_4_ = 0xbe2aae50;
            auVar307._0_8_ = 0xbe2aae50be2aae50;
            auVar307._12_4_ = 0xbe2aae50;
            auVar307._16_4_ = 0xbe2aae50;
            auVar307._20_4_ = 0xbe2aae50;
            auVar307._24_4_ = 0xbe2aae50;
            auVar307._28_4_ = 0xbe2aae50;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar167,auVar307);
            auVar308._8_4_ = 0x3e4cceac;
            auVar308._0_8_ = 0x3e4cceac3e4cceac;
            auVar308._12_4_ = 0x3e4cceac;
            auVar308._16_4_ = 0x3e4cceac;
            auVar308._20_4_ = 0x3e4cceac;
            auVar308._24_4_ = 0x3e4cceac;
            auVar308._28_4_ = 0x3e4cceac;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar167,auVar308);
            auVar309._8_4_ = 0xbe7ffffc;
            auVar309._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar309._12_4_ = 0xbe7ffffc;
            auVar309._16_4_ = 0xbe7ffffc;
            auVar309._20_4_ = 0xbe7ffffc;
            auVar309._24_4_ = 0xbe7ffffc;
            auVar309._28_4_ = 0xbe7ffffc;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar167,auVar309);
            auVar310._8_4_ = 0x3eaaaaaa;
            auVar310._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar310._12_4_ = 0x3eaaaaaa;
            auVar310._16_4_ = 0x3eaaaaaa;
            auVar310._20_4_ = 0x3eaaaaaa;
            auVar310._24_4_ = 0x3eaaaaaa;
            auVar310._28_4_ = 0x3eaaaaaa;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar167,auVar310);
            auVar264._0_4_ = auVar227._0_4_ * auVar167._0_4_ * auVar206._0_4_;
            auVar264._4_4_ = auVar227._4_4_ * auVar167._4_4_ * auVar206._4_4_;
            auVar264._8_4_ = auVar227._8_4_ * auVar167._8_4_ * auVar206._8_4_;
            auVar264._12_4_ = auVar227._12_4_ * auVar167._12_4_ * auVar206._12_4_;
            auVar264._16_4_ = auVar227._16_4_ * auVar167._16_4_ * 0.0;
            auVar264._20_4_ = auVar227._20_4_ * auVar167._20_4_ * 0.0;
            auVar264._24_4_ = auVar227._24_4_ * auVar167._24_4_ * 0.0;
            auVar264._28_4_ = 0;
            auVar258 = vcvtdq2ps_avx(auVar193);
            auVar282._8_4_ = 0xb95e8083;
            auVar282._0_8_ = 0xb95e8083b95e8083;
            auVar282._12_4_ = 0xb95e8083;
            auVar311._16_4_ = 0xb95e8083;
            auVar311._0_16_ = auVar282;
            auVar311._20_4_ = 0xb95e8083;
            auVar311._24_4_ = 0xb95e8083;
            auVar311._28_4_ = 0xb95e8083;
            auVar206 = vfmadd231ps_fma(auVar264,auVar258,auVar311);
            auVar206 = vfmsub231ps_fma(ZEXT1632(auVar206),auVar460,auVar227);
            auVar51 = vsubps_avx(ZEXT1632(auVar206),auVar167);
            auVar228._8_4_ = 0x3f318000;
            auVar228._0_8_ = 0x3f3180003f318000;
            auVar228._12_4_ = 0x3f318000;
            auVar228._16_4_ = 0x3f318000;
            auVar228._20_4_ = 0x3f318000;
            auVar228._24_4_ = 0x3f318000;
            auVar228._28_4_ = 0x3f318000;
            auVar206 = vfmsub231ps_fma(auVar51,auVar228,auVar258);
            auVar258 = vcmpps_avx(*pauVar19,ZEXT832(0) << 0x20,2);
            auVar258 = vorps_avx(auVar258,ZEXT1632(auVar206));
            *pauVar19 = auVar258;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar410._8_4_ = 0x807fffff;
        auVar410._0_8_ = 0x807fffff807fffff;
        auVar410._12_4_ = 0x807fffff;
        auVar444._8_4_ = 0x3f000000;
        auVar444._0_8_ = 0x3f0000003f000000;
        auVar444._12_4_ = 0x3f000000;
        auVar475._8_4_ = 0xffffff82;
        auVar475._0_8_ = 0xffffff82ffffff82;
        auVar475._12_4_ = 0xffffff82;
        auVar497._8_4_ = 0x3f3504f3;
        auVar497._0_8_ = 0x3f3504f33f3504f3;
        auVar497._12_4_ = 0x3f3504f3;
        auVar528._8_4_ = 0x3f800000;
        auVar528._0_8_ = 0x3f8000003f800000;
        auVar528._12_4_ = 0x3f800000;
        auVar544._8_4_ = 0xbdebd1b8;
        auVar544._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar544._12_4_ = 0xbdebd1b8;
        auVar561._8_4_ = 0x3d9021bb;
        auVar561._0_8_ = 0x3d9021bb3d9021bb;
        auVar561._12_4_ = 0x3d9021bb;
        auVar329._8_4_ = 0x3def251a;
        auVar329._0_8_ = 0x3def251a3def251a;
        auVar329._12_4_ = 0x3def251a;
        auVar364._8_4_ = 0xbdfe5d4f;
        auVar364._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar364._12_4_ = 0xbdfe5d4f;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar150._8_4_ = 0x800000;
          auVar150._0_8_ = 0x80000000800000;
          auVar150._12_4_ = 0x800000;
          auVar206 = vmaxps_avx(*(undefined1 (*) [16])*pauVar19,auVar150);
          auVar180 = vpsrld_avx(auVar206,0x17);
          auVar180 = vpaddd_avx(auVar475,auVar180);
          auVar206 = vandps_avx(auVar410,auVar206);
          auVar314 = vorps_avx(auVar444,auVar206);
          auVar148 = vcvtdq2ps_avx(auVar180);
          auVar180 = vcmpps_avx(auVar314,auVar497,1);
          auVar206 = vandps_avx(auVar180,auVar314);
          auVar151._0_4_ = auVar314._0_4_ + -1.0 + auVar206._0_4_;
          auVar151._4_4_ = auVar314._4_4_ + -1.0 + auVar206._4_4_;
          auVar151._8_4_ = auVar314._8_4_ + -1.0 + auVar206._8_4_;
          auVar151._12_4_ = auVar314._12_4_ + -1.0 + auVar206._12_4_;
          auVar206 = vandps_avx(auVar528,auVar180);
          auVar206 = vsubps_avx(auVar148,auVar206);
          auVar215._0_4_ = auVar151._0_4_ * auVar151._0_4_;
          auVar215._4_4_ = auVar151._4_4_ * auVar151._4_4_;
          auVar215._8_4_ = auVar151._8_4_ * auVar151._8_4_;
          auVar215._12_4_ = auVar151._12_4_ * auVar151._12_4_;
          auVar180 = vfmadd213ps_fma(auVar561,auVar151,auVar544);
          auVar180 = vfmadd213ps_fma(auVar180,auVar151,auVar329);
          auVar180 = vfmadd213ps_fma(auVar180,auVar151,auVar364);
          auVar283._8_4_ = 0x3e11e9bf;
          auVar283._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar283._12_4_ = 0x3e11e9bf;
          auVar180 = vfmadd213ps_fma(auVar180,auVar151,auVar283);
          auVar284._8_4_ = 0xbe2aae50;
          auVar284._0_8_ = 0xbe2aae50be2aae50;
          auVar284._12_4_ = 0xbe2aae50;
          auVar180 = vfmadd213ps_fma(auVar180,auVar151,auVar284);
          auVar285._8_4_ = 0x3e4cceac;
          auVar285._0_8_ = 0x3e4cceac3e4cceac;
          auVar285._12_4_ = 0x3e4cceac;
          auVar180 = vfmadd213ps_fma(auVar180,auVar151,auVar285);
          auVar286._8_4_ = 0xbe7ffffc;
          auVar286._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar286._12_4_ = 0xbe7ffffc;
          auVar180 = vfmadd213ps_fma(auVar180,auVar151,auVar286);
          auVar287._8_4_ = 0x3eaaaaaa;
          auVar287._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar287._12_4_ = 0x3eaaaaaa;
          auVar180 = vfmadd213ps_fma(auVar180,auVar151,auVar287);
          auVar256._0_4_ = auVar215._0_4_ * auVar151._0_4_ * auVar180._0_4_;
          auVar256._4_4_ = auVar215._4_4_ * auVar151._4_4_ * auVar180._4_4_;
          auVar256._8_4_ = auVar215._8_4_ * auVar151._8_4_ * auVar180._8_4_;
          auVar256._12_4_ = auVar215._12_4_ * auVar151._12_4_ * auVar180._12_4_;
          auVar282._8_4_ = 0xb95e8083;
          auVar282._0_8_ = 0xb95e8083b95e8083;
          auVar282._12_4_ = 0xb95e8083;
          auVar180 = vfmadd231ps_fma(auVar256,auVar206,auVar282);
          auVar180 = vfmsub231ps_fma(auVar180,auVar444,auVar215);
          auVar180 = vsubps_avx(auVar180,auVar151);
          auVar216._8_4_ = 0x3f318000;
          auVar216._0_8_ = 0x3f3180003f318000;
          auVar216._12_4_ = 0x3f318000;
          auVar180 = vfmsub231ps_fma(auVar180,auVar216,auVar206);
          auVar206 = vcmpps_avx(*(undefined1 (*) [16])*pauVar19,_DAT_005a4070,2);
          auVar206 = vorps_avx(auVar206,auVar180);
          *(undefined1 (*) [16])*pauVar19 = auVar206;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        auVar206 = vpcmpeqd_avx(auVar282,auVar282);
        in_ZMM5 = ZEXT1664(auVar206);
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar16;
          auVar148 = vpshufd_avx(auVar47,0x44);
          auVar206 = vpor_avx(auVar148,auVar46);
          auVar180 = vpor_avx(auVar148,auVar46);
          uVar24 = 0;
          auVar258 = _DAT_005a57e0;
          do {
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar24;
            auVar314 = vpshufd_avx(auVar48,0x44);
            auVar82._16_16_ = auVar314;
            auVar82._0_16_ = auVar314;
            auVar51 = vorps_avx(auVar82,_DAT_005a57c0);
            auVar258 = vorps_avx(auVar82,auVar258);
            auVar123 = vpor_avx(auVar148,auVar46);
            auVar314 = vpcmpgtq_avx(auVar258._16_16_ ^ auVar46,auVar123);
            auVar346 = vpcmpgtq_avx(auVar258._0_16_ ^ auVar46,auVar206);
            auVar314 = vpackssdw_avx(auVar346,auVar314);
            auVar122 = in_ZMM5._0_16_;
            auVar346 = vpcmpgtq_avx(auVar51._16_16_ ^ auVar46,auVar123);
            auVar152._0_8_ = auVar51._0_8_ ^ 0x8000000000000000;
            auVar152._8_4_ = auVar51._8_4_;
            auVar152._12_4_ = auVar51._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar152,auVar180);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar314 = vpackssdw_avx(auVar346 ^ auVar122,auVar314 ^ auVar122);
            auVar346 = vpmovsxwd_avx(auVar314);
            auVar314 = vpunpckhwd_avx(auVar314,auVar314);
            auVar83._16_16_ = auVar314;
            auVar83._0_16_ = auVar346;
            auVar258 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar123 = auVar258._16_16_;
            local_118._0_4_ = logf(auVar258._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_09;
            local_118._8_4_ = extraout_XMM0_Dc_09;
            local_118._12_4_ = extraout_XMM0_Dd_09;
            auVar314 = vmovshdup_avx(auVar123);
            auVar116._0_4_ = logf(auVar314._0_4_);
            auVar116._4_60_ = extraout_var_29;
            auVar314 = vinsertps_avx(local_118,auVar116._0_16_,0x10);
            auVar346 = vpermilpd_avx(auVar123,1);
            auVar117._0_4_ = logf(auVar346._0_4_);
            auVar117._4_60_ = extraout_var_30;
            auVar314 = vinsertps_avx(auVar314,auVar117._0_16_,0x20);
            auVar346 = vpermilps_avx(auVar123,0xff);
            auVar118._0_4_ = logf(auVar346._0_4_);
            auVar118._4_60_ = extraout_var_31;
            auVar314 = vinsertps_avx(auVar314,auVar118._0_16_,0x30);
            local_e8._0_4_ = auVar258._0_4_;
            local_118._0_4_ = logf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_10;
            local_118._8_4_ = extraout_XMM0_Dc_10;
            local_118._12_4_ = extraout_XMM0_Dd_10;
            local_e8 = auVar258._0_16_;
            auVar346 = vmovshdup_avx(local_e8);
            auVar119._0_4_ = logf(auVar346._0_4_);
            auVar119._4_60_ = extraout_var_32;
            auVar346 = vinsertps_avx(local_118,auVar119._0_16_,0x10);
            auVar123 = vpermilpd_avx(local_e8,1);
            auVar120._0_4_ = logf(auVar123._0_4_);
            auVar120._4_60_ = extraout_var_33;
            auVar346 = vinsertps_avx(auVar346,auVar120._0_16_,0x20);
            auVar123 = vpermilps_avx(local_e8,0xff);
            auVar121._0_4_ = logf(auVar123._0_4_);
            auVar258 = _DAT_005a57e0;
            auVar121._4_60_ = extraout_var_34;
            auVar123 = vpcmpeqd_avx(auVar122,auVar122);
            in_ZMM5 = ZEXT1664(auVar123);
            auVar346 = vinsertps_avx(auVar346,auVar121._0_16_,0x30);
            auVar84._16_16_ = auVar314;
            auVar84._0_16_ = auVar346;
            auVar51 = vmaskmovps_avx(auVar83,auVar84);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar51;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 9:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar206 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
      auVar85 = ZEXT1664(auVar206);
      auVar487._8_8_ = 0xfffffffefffffffe;
      auVar487._0_8_ = 0xfffffffefffffffe;
      auVar507._8_8_ = 0x8000000080000000;
      auVar507._0_8_ = 0x8000000080000000;
      local_c8._8_8_ = 0x8000000000000000;
      local_c8._0_8_ = 0x8000000000000000;
      do {
        auVar378._8_4_ = 0x7fffffff;
        auVar378._0_8_ = 0x7fffffff7fffffff;
        auVar290._8_4_ = 0x80000000;
        auVar290._0_8_ = 0x8000000080000000;
        auVar378._12_4_ = 0x7fffffff;
        auVar290._12_4_ = 0x80000000;
        auVar378._16_4_ = 0x7fffffff;
        auVar290._16_4_ = 0x80000000;
        auVar378._20_4_ = 0x7fffffff;
        auVar290._20_4_ = 0x80000000;
        auVar523._8_4_ = 2;
        auVar523._0_8_ = 0x200000002;
        auVar378._24_4_ = 0x7fffffff;
        auVar290._24_4_ = 0x80000000;
        auVar523._12_4_ = 2;
        auVar378._28_4_ = 0x7fffffff;
        auVar290._28_4_ = 0x80000000;
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar206 = auVar85._0_16_;
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          auVar547._8_4_ = 0xb97da000;
          auVar547._0_8_ = 0xb97da000b97da000;
          auVar547._12_4_ = 0xb97da000;
          auVar547._16_4_ = 0xb97da000;
          auVar547._20_4_ = 0xb97da000;
          auVar547._24_4_ = 0xb97da000;
          auVar547._28_4_ = 0xb97da000;
          do {
            auVar258 = *pauVar19;
            auVar51 = vandps_avx(auVar258,auVar378);
            auVar458 = vandps_avx(auVar258,auVar290);
            auVar175._0_4_ = (int)(auVar51._0_4_ * 1.2732395);
            auVar175._4_4_ = (int)(auVar51._4_4_ * 1.2732395);
            auVar175._8_4_ = (int)(auVar51._8_4_ * 1.2732395);
            auVar175._12_4_ = (int)(auVar51._12_4_ * 1.2732395);
            auVar188._16_4_ = (int)(auVar51._16_4_ * 1.2732395);
            auVar188._0_16_ = auVar175;
            auVar188._20_4_ = (int)(auVar51._20_4_ * 1.2732395);
            auVar188._24_4_ = (int)(auVar51._24_4_ * 1.2732395);
            auVar188._28_4_ = (int)auVar258._28_4_;
            auVar314 = vpsubd_avx(auVar175,auVar206);
            auVar346 = vpsubd_avx(auVar188._16_16_,auVar206);
            auVar180 = vpand_avx(auVar487,auVar314);
            auVar148 = vpand_avx(auVar487,auVar346);
            auVar259._16_16_ = auVar148;
            auVar259._0_16_ = auVar180;
            auVar258 = vcvtdq2ps_avx(auVar259);
            auVar180 = vpslld_avx(auVar314,0x1d);
            auVar180 = vpand_avx(auVar507,auVar180);
            auVar148 = vpslld_avx(auVar346,0x1d);
            auVar148 = vpand_avx(auVar507,auVar148);
            auVar291._8_4_ = 0xbf490000;
            auVar291._0_8_ = 0xbf490000bf490000;
            auVar291._12_4_ = 0xbf490000;
            auVar291._16_4_ = 0xbf490000;
            auVar291._20_4_ = 0xbf490000;
            auVar291._24_4_ = 0xbf490000;
            auVar291._28_4_ = 0xbf490000;
            auVar123 = vfmadd231ps_fma(auVar51,auVar258,auVar291);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar258,auVar547);
            auVar292._8_4_ = 0xb3222169;
            auVar292._0_8_ = 0xb3222169b3222169;
            auVar292._12_4_ = 0xb3222169;
            auVar292._16_4_ = 0xb3222169;
            auVar292._20_4_ = 0xb3222169;
            auVar292._24_4_ = 0xb3222169;
            auVar292._28_4_ = 0xb3222169;
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar292,auVar258);
            fVar26 = auVar122._0_4_ * auVar122._0_4_;
            fVar229 = auVar122._4_4_ * auVar122._4_4_;
            fVar230 = auVar122._8_4_ * auVar122._8_4_;
            fVar231 = auVar122._12_4_ * auVar122._12_4_;
            auVar9._28_4_ = auVar258._28_4_;
            auVar9._0_28_ = ZEXT1628(CONCAT412(fVar231,CONCAT48(fVar230,CONCAT44(fVar229,fVar26))));
            auVar293._8_4_ = 0x37ccf5ce;
            auVar293._0_8_ = 0x37ccf5ce37ccf5ce;
            auVar293._12_4_ = 0x37ccf5ce;
            auVar293._16_4_ = 0x37ccf5ce;
            auVar293._20_4_ = 0x37ccf5ce;
            auVar293._24_4_ = 0x37ccf5ce;
            auVar293._28_4_ = 0x37ccf5ce;
            auVar335._8_4_ = 0xbab6061a;
            auVar335._0_8_ = 0xbab6061abab6061a;
            auVar335._12_4_ = 0xbab6061a;
            auVar335._16_4_ = 0xbab6061a;
            auVar335._20_4_ = 0xbab6061a;
            auVar335._24_4_ = 0xbab6061a;
            auVar335._28_4_ = 0xbab6061a;
            auVar123 = vfmadd213ps_fma(auVar293,auVar9,auVar335);
            auVar336._8_4_ = 0x3d2aaaa5;
            auVar336._0_8_ = 0x3d2aaaa53d2aaaa5;
            auVar336._12_4_ = 0x3d2aaaa5;
            auVar336._16_4_ = 0x3d2aaaa5;
            auVar336._20_4_ = 0x3d2aaaa5;
            auVar336._24_4_ = 0x3d2aaaa5;
            auVar336._28_4_ = 0x3d2aaaa5;
            auVar123 = vfmadd213ps_fma(ZEXT1632(auVar123),auVar9,auVar336);
            auVar337._8_4_ = 0x3f000000;
            auVar337._0_8_ = 0x3f0000003f000000;
            auVar337._12_4_ = 0x3f000000;
            auVar337._16_4_ = 0x3f000000;
            auVar337._20_4_ = 0x3f000000;
            auVar337._24_4_ = 0x3f000000;
            auVar337._28_4_ = 0x3f000000;
            auVar411 = vfnmadd231ps_fma(ZEXT1632(CONCAT412(fVar231 * fVar231 * auVar123._12_4_,
                                                           CONCAT48(fVar230 * fVar230 *
                                                                    auVar123._8_4_,
                                                                    CONCAT44(fVar229 * fVar229 *
                                                                             auVar123._4_4_,
                                                                             fVar26 * fVar26 *
                                                                             auVar123._0_4_)))),
                                        auVar9,auVar337);
            auVar338._8_4_ = 0xb94ca1f9;
            auVar338._0_8_ = 0xb94ca1f9b94ca1f9;
            auVar338._12_4_ = 0xb94ca1f9;
            auVar338._16_4_ = 0xb94ca1f9;
            auVar338._20_4_ = 0xb94ca1f9;
            auVar338._24_4_ = 0xb94ca1f9;
            auVar338._28_4_ = 0xb94ca1f9;
            auVar499._8_4_ = 0x3c08839e;
            auVar499._0_8_ = 0x3c08839e3c08839e;
            auVar499._12_4_ = 0x3c08839e;
            auVar499._16_4_ = 0x3c08839e;
            auVar499._20_4_ = 0x3c08839e;
            auVar499._24_4_ = 0x3c08839e;
            auVar499._28_4_ = 0x3c08839e;
            auVar123 = vfmadd213ps_fma(auVar338,auVar9,auVar499);
            auVar413._8_4_ = 0xbe2aaaa3;
            auVar413._0_8_ = 0xbe2aaaa3be2aaaa3;
            auVar413._12_4_ = 0xbe2aaaa3;
            auVar413._16_4_ = 0xbe2aaaa3;
            auVar413._20_4_ = 0xbe2aaaa3;
            auVar413._24_4_ = 0xbe2aaaa3;
            auVar413._28_4_ = 0xbe2aaaa3;
            auVar123 = vfmadd213ps_fma(ZEXT1632(auVar123),auVar9,auVar413);
            auVar10._28_4_ = auVar258._28_4_;
            auVar10._0_28_ =
                 ZEXT1628(CONCAT412(auVar123._12_4_ * fVar231,
                                    CONCAT48(auVar123._8_4_ * fVar230,
                                             CONCAT44(auVar123._4_4_ * fVar229,
                                                      auVar123._0_4_ * fVar26))));
            auVar123 = vfmadd213ps_fma(auVar10,ZEXT1632(auVar122),ZEXT1632(auVar122));
            auVar314 = vpand_avx(auVar523,auVar314);
            auVar346 = vpand_avx(auVar523,auVar346);
            auVar61._16_16_ = auVar346;
            auVar61._0_16_ = auVar314;
            auVar160._0_4_ = auVar411._0_4_ + 1.0;
            auVar160._4_4_ = auVar411._4_4_ + 1.0;
            auVar160._8_4_ = auVar411._8_4_ + 1.0;
            auVar160._12_4_ = auVar411._12_4_ + 1.0;
            auVar160._16_4_ = 0x3f800000;
            auVar160._20_4_ = 0x3f800000;
            auVar160._24_4_ = 0x3f800000;
            auVar160._28_4_ = 0x3f800000;
            auVar258 = vcvtdq2ps_avx(auVar61);
            auVar51 = vcmpps_avx(auVar258,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0);
            auVar258 = vandps_avx(auVar51,ZEXT1632(auVar123));
            auVar51 = vandnps_avx(auVar51,auVar160);
            auVar62._0_4_ = auVar458._0_4_ ^ auVar180._0_4_ ^ (uint)(auVar51._0_4_ + auVar258._0_4_)
            ;
            auVar62._4_4_ = auVar458._4_4_ ^ auVar180._4_4_ ^ (uint)(auVar51._4_4_ + auVar258._4_4_)
            ;
            auVar62._8_4_ = auVar458._8_4_ ^ auVar180._8_4_ ^ (uint)(auVar51._8_4_ + auVar258._8_4_)
            ;
            auVar62._12_4_ =
                 auVar458._12_4_ ^ auVar180._12_4_ ^ (uint)(auVar51._12_4_ + auVar258._12_4_);
            auVar62._16_4_ =
                 auVar458._16_4_ ^ auVar148._0_4_ ^ (uint)(auVar51._16_4_ + auVar258._16_4_);
            auVar62._20_4_ =
                 auVar458._20_4_ ^ auVar148._4_4_ ^ (uint)(auVar51._20_4_ + auVar258._20_4_);
            auVar62._24_4_ =
                 auVar458._24_4_ ^ auVar148._8_4_ ^ (uint)(auVar51._24_4_ + auVar258._24_4_);
            auVar62._28_4_ =
                 auVar458._28_4_ ^ auVar148._12_4_ ^ (uint)(auVar51._28_4_ + auVar258._28_4_);
            *pauVar19 = auVar62;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar399._8_4_ = 0xfffffffe;
        auVar399._0_8_ = 0xfffffffefffffffe;
        auVar399._12_4_ = 0xfffffffe;
        auVar508._8_4_ = 0xbf490000;
        auVar508._0_8_ = 0xbf490000bf490000;
        auVar508._12_4_ = 0xbf490000;
        auVar539._8_4_ = 0xb97da000;
        auVar539._0_8_ = 0xb97da000b97da000;
        auVar539._12_4_ = 0xb97da000;
        auVar556._8_4_ = 0xb3222169;
        auVar556._0_8_ = 0xb3222169b3222169;
        auVar556._12_4_ = 0xb3222169;
        auVar427._8_4_ = 0xbab6061a;
        auVar427._0_8_ = 0xbab6061abab6061a;
        auVar427._12_4_ = 0xbab6061a;
        auVar350._8_4_ = 0x37ccf5ce;
        auVar350._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar350._12_4_ = 0x37ccf5ce;
        auVar488._8_4_ = 0x3d2aaaa5;
        auVar488._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar488._12_4_ = 0x3d2aaaa5;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar134._8_4_ = 0x7fffffff;
          auVar134._0_8_ = 0x7fffffff7fffffff;
          auVar134._12_4_ = 0x7fffffff;
          auVar180 = vandps_avx(*(undefined1 (*) [16])*pauVar19,auVar134);
          auVar135._0_4_ = (int)(auVar180._0_4_ * 1.2732395);
          auVar135._4_4_ = (int)(auVar180._4_4_ * 1.2732395);
          auVar135._8_4_ = (int)(auVar180._8_4_ * 1.2732395);
          auVar135._12_4_ = (int)(auVar180._12_4_ * 1.2732395);
          auVar314 = vpsubd_avx(auVar135,auVar206);
          auVar148 = vpand_avx(auVar399,auVar314);
          auVar148 = vcvtdq2ps_avx(auVar148);
          auVar180 = vfmadd231ps_fma(auVar180,auVar148,auVar508);
          auVar180 = vfmadd231ps_fma(auVar180,auVar148,auVar539);
          auVar148 = vfmadd231ps_fma(auVar180,auVar556,auVar148);
          auVar204._0_4_ = auVar148._0_4_ * auVar148._0_4_;
          auVar204._4_4_ = auVar148._4_4_ * auVar148._4_4_;
          auVar204._8_4_ = auVar148._8_4_ * auVar148._8_4_;
          auVar204._12_4_ = auVar148._12_4_ * auVar148._12_4_;
          auVar180 = vfmadd213ps_fma(auVar350,auVar204,auVar427);
          auVar180 = vfmadd213ps_fma(auVar180,auVar204,auVar488);
          auVar243._0_4_ = auVar204._0_4_ * auVar204._0_4_ * auVar180._0_4_;
          auVar243._4_4_ = auVar204._4_4_ * auVar204._4_4_ * auVar180._4_4_;
          auVar243._8_4_ = auVar204._8_4_ * auVar204._8_4_ * auVar180._8_4_;
          auVar243._12_4_ = auVar204._12_4_ * auVar204._12_4_ * auVar180._12_4_;
          auVar272._8_4_ = 0x3f000000;
          auVar272._0_8_ = 0x3f0000003f000000;
          auVar272._12_4_ = 0x3f000000;
          auVar346 = vfnmadd231ps_fma(auVar243,auVar204,auVar272);
          auVar273._8_4_ = 0xb94ca1f9;
          auVar273._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar273._12_4_ = 0xb94ca1f9;
          auVar320._8_4_ = 0x3c08839e;
          auVar320._0_8_ = 0x3c08839e3c08839e;
          auVar320._12_4_ = 0x3c08839e;
          auVar180 = vfmadd213ps_fma(auVar273,auVar204,auVar320);
          auVar321._8_4_ = 0xbe2aaaa3;
          auVar321._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar321._12_4_ = 0xbe2aaaa3;
          auVar180 = vfmadd213ps_fma(auVar180,auVar204,auVar321);
          auVar205._0_4_ = auVar180._0_4_ * auVar204._0_4_;
          auVar205._4_4_ = auVar180._4_4_ * auVar204._4_4_;
          auVar205._8_4_ = auVar180._8_4_ * auVar204._8_4_;
          auVar205._12_4_ = auVar180._12_4_ * auVar204._12_4_;
          auVar148 = vfmadd213ps_fma(auVar205,auVar148,auVar148);
          auVar180 = vpand_avx(auVar523,auVar314);
          auVar180 = vpcmpeqd_avx(auVar180,_DAT_005a4070);
          auVar244._0_4_ = auVar346._0_4_ + 1.0;
          auVar244._4_4_ = auVar346._4_4_ + 1.0;
          auVar244._8_4_ = auVar346._8_4_ + 1.0;
          auVar244._12_4_ = auVar346._12_4_ + 1.0;
          auVar180 = vblendvps_avx(auVar244,auVar148,auVar180);
          auVar148 = vpslld_avx(auVar314,0x1d);
          auVar136._8_4_ = 0x80000000;
          auVar136._0_8_ = 0x8000000080000000;
          auVar136._12_4_ = 0x80000000;
          auVar148 = vpand_avx(auVar148 ^ *(undefined1 (*) [16])*pauVar19,auVar136);
          *(undefined1 (*) [16])*pauVar19 = auVar148 ^ auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar16;
          auVar148 = vpshufd_avx(auVar34,0x44);
          auVar206 = vpor_avx(auVar148,local_c8);
          auVar180 = vpor_avx(auVar148,local_c8);
          uVar24 = 0;
          auVar258 = _DAT_005a57e0;
          do {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar24;
            auVar314 = vpshufd_avx(auVar35,0x44);
            auVar63._16_16_ = auVar314;
            auVar63._0_16_ = auVar314;
            auVar51 = vorps_avx(auVar63,_DAT_005a57c0);
            auVar258 = vorps_avx(auVar63,auVar258);
            auVar123 = vpor_avx(auVar148,local_c8);
            auVar314 = vpcmpgtq_avx(auVar258._16_16_ ^ local_c8,auVar123);
            auVar346 = vpcmpgtq_avx(auVar258._0_16_ ^ local_c8,auVar206);
            auVar314 = vpackssdw_avx(auVar346,auVar314);
            auVar122 = auVar85._0_16_;
            auVar346 = vpcmpgtq_avx(auVar51._16_16_ ^ local_c8,auVar123);
            auVar137._0_8_ = auVar51._0_8_ ^ 0x8000000000000000;
            auVar137._8_4_ = auVar51._8_4_;
            auVar137._12_4_ = auVar51._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar137,auVar180);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar314 = vpackssdw_avx(auVar122 ^ auVar346,auVar122 ^ auVar314);
            auVar346 = vpmovsxwd_avx(auVar314);
            auVar314 = vpunpckhwd_avx(auVar314,auVar314);
            auVar64._16_16_ = auVar314;
            auVar64._0_16_ = auVar346;
            auVar258 = vmaskmovps_avx(auVar64,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar123 = auVar258._16_16_;
            local_118._0_4_ = sinf(auVar258._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_01;
            local_118._8_4_ = extraout_XMM0_Dc_01;
            local_118._12_4_ = extraout_XMM0_Dd_01;
            auVar314 = vmovshdup_avx(auVar123);
            auVar93._0_4_ = sinf(auVar314._0_4_);
            auVar93._4_60_ = extraout_var_05;
            auVar314 = vinsertps_avx(local_118,auVar93._0_16_,0x10);
            auVar346 = vpermilpd_avx(auVar123,1);
            auVar94._0_4_ = sinf(auVar346._0_4_);
            auVar94._4_60_ = extraout_var_06;
            auVar314 = vinsertps_avx(auVar314,auVar94._0_16_,0x20);
            auVar346 = vpermilps_avx(auVar123,0xff);
            auVar95._0_4_ = sinf(auVar346._0_4_);
            auVar95._4_60_ = extraout_var_07;
            auVar314 = vinsertps_avx(auVar314,auVar95._0_16_,0x30);
            local_e8._0_4_ = auVar258._0_4_;
            local_118._0_4_ = sinf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_02;
            local_118._8_4_ = extraout_XMM0_Dc_02;
            local_118._12_4_ = extraout_XMM0_Dd_02;
            local_e8 = auVar258._0_16_;
            auVar346 = vmovshdup_avx(local_e8);
            auVar96._0_4_ = sinf(auVar346._0_4_);
            auVar96._4_60_ = extraout_var_08;
            auVar346 = vinsertps_avx(local_118,auVar96._0_16_,0x10);
            auVar123 = vpermilpd_avx(local_e8,1);
            auVar97._0_4_ = sinf(auVar123._0_4_);
            auVar97._4_60_ = extraout_var_09;
            auVar346 = vinsertps_avx(auVar346,auVar97._0_16_,0x20);
            auVar123 = vpermilps_avx(local_e8,0xff);
            auVar98._0_4_ = sinf(auVar123._0_4_);
            auVar258 = _DAT_005a57e0;
            auVar98._4_60_ = extraout_var_10;
            auVar123 = vpcmpeqd_avx(auVar122,auVar122);
            auVar85 = ZEXT1664(auVar123);
            auVar346 = vinsertps_avx(auVar346,auVar98._0_16_,0x30);
            auVar65._16_16_ = auVar314;
            auVar65._0_16_ = auVar346;
            auVar51 = vmaskmovps_avx(auVar64,auVar65);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar51;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 10:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar206 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
      auVar85 = ZEXT1664(auVar206);
      auVar474._8_8_ = 0xfffffffefffffffe;
      auVar474._0_8_ = 0xfffffffefffffffe;
      auVar511._8_8_ = 0x8000000080000000;
      auVar511._0_8_ = 0x8000000080000000;
      local_c8._8_8_ = 0x8000000000000000;
      local_c8._0_8_ = 0x8000000000000000;
      do {
        auVar550._8_4_ = 0xb97da000;
        auVar550._0_8_ = 0xb97da000b97da000;
        auVar341._8_4_ = 0xbf490000;
        auVar341._0_8_ = 0xbf490000bf490000;
        auVar225._8_4_ = 0xb3222169;
        auVar225._0_8_ = 0xb3222169b3222169;
        auVar166._8_4_ = 0x7fffffff;
        auVar166._0_8_ = 0x7fffffff7fffffff;
        auVar550._12_4_ = 0xb97da000;
        auVar341._12_4_ = 0xbf490000;
        auVar225._12_4_ = 0xb3222169;
        auVar166._12_4_ = 0x7fffffff;
        auVar550._16_4_ = 0xb97da000;
        auVar341._16_4_ = 0xbf490000;
        auVar225._16_4_ = 0xb3222169;
        auVar166._16_4_ = 0x7fffffff;
        auVar550._20_4_ = 0xb97da000;
        auVar341._20_4_ = 0xbf490000;
        auVar225._20_4_ = 0xb3222169;
        auVar166._20_4_ = 0x7fffffff;
        auVar496._8_4_ = 0xfffffffe;
        auVar496._0_8_ = 0xfffffffefffffffe;
        auVar281._8_4_ = 2;
        auVar281._0_8_ = 0x200000002;
        auVar550._24_4_ = 0xb97da000;
        auVar341._24_4_ = 0xbf490000;
        auVar225._24_4_ = 0xb3222169;
        auVar166._24_4_ = 0x7fffffff;
        auVar550._28_4_ = 0xb97da000;
        auVar496._12_4_ = 0xfffffffe;
        auVar341._28_4_ = 0xbf490000;
        auVar281._12_4_ = 2;
        auVar225._28_4_ = 0xb3222169;
        auVar166._28_4_ = 0x7fffffff;
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar206 = auVar85._0_16_;
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar258 = vandps_avx(auVar166,*pauVar19);
            auVar146._0_4_ = (int)(auVar258._0_4_ * 1.2732395);
            auVar146._4_4_ = (int)(auVar258._4_4_ * 1.2732395);
            auVar146._8_4_ = (int)(auVar258._8_4_ * 1.2732395);
            auVar146._12_4_ = (int)(auVar258._12_4_ * 1.2732395);
            auVar153._16_4_ = (int)(auVar258._16_4_ * 1.2732395);
            auVar153._0_16_ = auVar146;
            auVar153._20_4_ = (int)(auVar258._20_4_ * 1.2732395);
            auVar153._24_4_ = (int)(auVar258._24_4_ * 1.2732395);
            auVar180 = vpsubd_avx(auVar146,auVar206);
            auVar168._12_4_ = 0;
            auVar168._0_12_ = auVar153._16_12_;
            auVar148 = vpsubd_avx(auVar168,auVar206);
            auVar180 = vpand_avx(auVar474,auVar180);
            auVar148 = vpand_avx(auVar474,auVar148);
            auVar226._16_16_ = auVar148;
            auVar226._0_16_ = auVar180;
            auVar51 = vcvtdq2ps_avx(auVar226);
            auVar180 = vpaddd_avx(auVar496,auVar180);
            auVar148 = vpaddd_avx(auVar496,auVar148);
            auVar314 = vpslld_avx(auVar180,0x1d);
            auVar314 = vpandn_avx(auVar314,auVar511);
            auVar346 = vpslld_avx(auVar148,0x1d);
            auVar346 = vpandn_avx(auVar346,auVar511);
            auVar123 = vfmadd231ps_fma(auVar258,auVar51,auVar341);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar51,auVar550);
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar225,auVar51);
            fVar26 = auVar122._0_4_;
            fVar232 = fVar26 * fVar26;
            fVar229 = auVar122._4_4_;
            fVar233 = fVar229 * fVar229;
            fVar230 = auVar122._8_4_;
            fVar234 = fVar230 * fVar230;
            fVar231 = auVar122._12_4_;
            fVar169 = fVar231 * fVar231;
            auVar14._28_4_ = auVar51._28_4_;
            auVar14._0_28_ =
                 ZEXT1628(CONCAT412(fVar169,CONCAT48(fVar234,CONCAT44(fVar233,fVar232))));
            auVar302._8_4_ = 0xb94ca1f9;
            auVar302._0_8_ = 0xb94ca1f9b94ca1f9;
            auVar302._12_4_ = 0xb94ca1f9;
            auVar302._16_4_ = 0xb94ca1f9;
            auVar302._20_4_ = 0xb94ca1f9;
            auVar302._24_4_ = 0xb94ca1f9;
            auVar302._28_4_ = 0xb94ca1f9;
            auVar569._8_4_ = 0x3c08839e;
            auVar569._0_8_ = 0x3c08839e3c08839e;
            auVar569._12_4_ = 0x3c08839e;
            auVar569._16_4_ = 0x3c08839e;
            auVar569._20_4_ = 0x3c08839e;
            auVar569._24_4_ = 0x3c08839e;
            auVar569._28_4_ = 0x3c08839e;
            auVar123 = vfmadd213ps_fma(auVar302,auVar14,auVar569);
            auVar570._8_4_ = 0xbe2aaaa3;
            auVar570._0_8_ = 0xbe2aaaa3be2aaaa3;
            auVar570._12_4_ = 0xbe2aaaa3;
            auVar570._16_4_ = 0xbe2aaaa3;
            auVar570._20_4_ = 0xbe2aaaa3;
            auVar570._24_4_ = 0xbe2aaaa3;
            auVar570._28_4_ = 0xbe2aaaa3;
            auVar123 = vfmadd213ps_fma(ZEXT1632(auVar123),auVar14,auVar570);
            auVar15._28_4_ = 0xbf490000;
            auVar15._0_28_ =
                 ZEXT1628(CONCAT412(fVar169 * fVar231,
                                    CONCAT48(fVar234 * fVar230,
                                             CONCAT44(fVar233 * fVar229,fVar232 * fVar26))));
            auVar123 = vfmadd213ps_fma(auVar15,ZEXT1632(auVar123),ZEXT1632(auVar122));
            auVar76._8_4_ = 0x37ccf5ce;
            auVar76._0_8_ = 0x37ccf5ce37ccf5ce;
            auVar76._12_4_ = 0x37ccf5ce;
            auVar76._16_4_ = 0x37ccf5ce;
            auVar76._20_4_ = 0x37ccf5ce;
            auVar76._24_4_ = 0x37ccf5ce;
            auVar76._28_4_ = 0x37ccf5ce;
            auVar303._8_4_ = 0xbab6061a;
            auVar303._0_8_ = 0xbab6061abab6061a;
            auVar303._12_4_ = 0xbab6061a;
            auVar303._16_4_ = 0xbab6061a;
            auVar303._20_4_ = 0xbab6061a;
            auVar303._24_4_ = 0xbab6061a;
            auVar303._28_4_ = 0xbab6061a;
            auVar122 = vfmadd213ps_fma(auVar76,auVar14,auVar303);
            auVar304._8_4_ = 0x3d2aaaa5;
            auVar304._0_8_ = 0x3d2aaaa53d2aaaa5;
            auVar304._12_4_ = 0x3d2aaaa5;
            auVar304._16_4_ = 0x3d2aaaa5;
            auVar304._20_4_ = 0x3d2aaaa5;
            auVar304._24_4_ = 0x3d2aaaa5;
            auVar304._28_4_ = 0x3d2aaaa5;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar14,auVar304);
            auVar305._8_4_ = 0x3f000000;
            auVar305._0_8_ = 0x3f0000003f000000;
            auVar305._12_4_ = 0x3f000000;
            auVar305._16_4_ = 0x3f000000;
            auVar305._20_4_ = 0x3f000000;
            auVar305._24_4_ = 0x3f000000;
            auVar305._28_4_ = 0x3f000000;
            auVar122 = vfnmadd231ps_fma(ZEXT1632(CONCAT412(fVar169 * fVar169 * auVar122._12_4_,
                                                           CONCAT48(fVar234 * fVar234 *
                                                                    auVar122._8_4_,
                                                                    CONCAT44(fVar233 * fVar233 *
                                                                             auVar122._4_4_,
                                                                             fVar232 * fVar232 *
                                                                             auVar122._0_4_)))),
                                        auVar14,auVar305);
            auVar281._8_4_ = 2;
            auVar281._0_8_ = 0x200000002;
            auVar281._12_4_ = 2;
            auVar180 = vpand_avx(auVar180,auVar281);
            auVar148 = vpand_avx(auVar148,auVar281);
            auVar192._16_16_ = auVar148;
            auVar192._0_16_ = auVar180;
            auVar77._0_4_ = auVar122._0_4_ + 1.0;
            auVar77._4_4_ = auVar122._4_4_ + 1.0;
            auVar77._8_4_ = auVar122._8_4_ + 1.0;
            auVar77._12_4_ = auVar122._12_4_ + 1.0;
            auVar77._16_4_ = 0x3f800000;
            auVar77._20_4_ = 0x3f800000;
            auVar77._24_4_ = 0x3f800000;
            auVar77._28_4_ = 0x3f800000;
            auVar258 = vcvtdq2ps_avx(auVar192);
            auVar51 = vcmpps_avx(auVar258,ZEXT432(0) << 0x20,0);
            auVar258 = vandps_avx(auVar51,ZEXT1632(auVar123));
            auVar51 = vandnps_avx(auVar51,auVar77);
            auVar78._0_4_ = auVar314._0_4_ ^ (uint)(auVar258._0_4_ + auVar51._0_4_);
            auVar78._4_4_ = auVar314._4_4_ ^ (uint)(auVar258._4_4_ + auVar51._4_4_);
            auVar78._8_4_ = auVar314._8_4_ ^ (uint)(auVar258._8_4_ + auVar51._8_4_);
            auVar78._12_4_ = auVar314._12_4_ ^ (uint)(auVar258._12_4_ + auVar51._12_4_);
            auVar78._16_4_ = auVar346._0_4_ ^ (uint)(auVar258._16_4_ + auVar51._16_4_);
            auVar78._20_4_ = auVar346._4_4_ ^ (uint)(auVar258._20_4_ + auVar51._20_4_);
            auVar78._24_4_ = auVar346._8_4_ ^ (uint)(auVar258._24_4_ + auVar51._24_4_);
            auVar78._28_4_ = auVar346._12_4_ ^ (uint)(auVar258._28_4_ + auVar51._28_4_);
            *pauVar19 = auVar78;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar512._8_4_ = 0xb97da000;
        auVar512._0_8_ = 0xb97da000b97da000;
        auVar512._12_4_ = 0xb97da000;
        auVar527._8_4_ = 0xb3222169;
        auVar527._0_8_ = 0xb3222169b3222169;
        auVar527._12_4_ = 0xb3222169;
        auVar543._8_4_ = 0xbab6061a;
        auVar543._0_8_ = 0xbab6061abab6061a;
        auVar543._12_4_ = 0xbab6061a;
        auVar560._8_4_ = 0x37ccf5ce;
        auVar560._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar560._12_4_ = 0x37ccf5ce;
        auVar409._8_4_ = 0x3d2aaaa5;
        auVar409._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar409._12_4_ = 0x3d2aaaa5;
        auVar327._8_4_ = 0x80000000;
        auVar327._0_8_ = 0x8000000080000000;
        auVar327._12_4_ = 0x80000000;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar43._8_4_ = 0x7fffffff;
          auVar43._0_8_ = 0x7fffffff7fffffff;
          auVar43._12_4_ = 0x7fffffff;
          auVar180 = vandps_avx(auVar43,*(undefined1 (*) [16])*pauVar19);
          auVar147._0_4_ = (int)(auVar180._0_4_ * 1.2732395);
          auVar147._4_4_ = (int)(auVar180._4_4_ * 1.2732395);
          auVar147._8_4_ = (int)(auVar180._8_4_ * 1.2732395);
          auVar147._12_4_ = (int)(auVar180._12_4_ * 1.2732395);
          auVar148 = vpsubd_avx(auVar147,auVar206);
          auVar314 = vpand_avx(auVar496,auVar148);
          auVar148 = vcvtdq2ps_avx(auVar314);
          auVar212._8_4_ = 0xbf490000;
          auVar212._0_8_ = 0xbf490000bf490000;
          auVar212._12_4_ = 0xbf490000;
          auVar180 = vfmadd231ps_fma(auVar180,auVar148,auVar212);
          auVar180 = vfmadd231ps_fma(auVar180,auVar148,auVar512);
          auVar346 = vfmadd231ps_fma(auVar180,auVar527,auVar148);
          auVar183._0_4_ = auVar346._0_4_ * auVar346._0_4_;
          auVar183._4_4_ = auVar346._4_4_ * auVar346._4_4_;
          auVar183._8_4_ = auVar346._8_4_ * auVar346._8_4_;
          auVar183._12_4_ = auVar346._12_4_ * auVar346._12_4_;
          auVar180 = vfmadd213ps_fma(auVar560,auVar183,auVar543);
          auVar180 = vfmadd213ps_fma(auVar180,auVar183,auVar409);
          auVar213._0_4_ = auVar183._0_4_ * auVar183._0_4_ * auVar180._0_4_;
          auVar213._4_4_ = auVar183._4_4_ * auVar183._4_4_ * auVar180._4_4_;
          auVar213._8_4_ = auVar183._8_4_ * auVar183._8_4_ * auVar180._8_4_;
          auVar213._12_4_ = auVar183._12_4_ * auVar183._12_4_ * auVar180._12_4_;
          auVar254._8_4_ = 0x3f000000;
          auVar254._0_8_ = 0x3f0000003f000000;
          auVar254._12_4_ = 0x3f000000;
          auVar123 = vfnmadd231ps_fma(auVar213,auVar183,auVar254);
          auVar255._8_4_ = 0xb94ca1f9;
          auVar255._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar255._12_4_ = 0xb94ca1f9;
          auVar362._8_4_ = 0x3c08839e;
          auVar362._0_8_ = 0x3c08839e3c08839e;
          auVar362._12_4_ = 0x3c08839e;
          auVar180 = vfmadd213ps_fma(auVar255,auVar183,auVar362);
          auVar363._8_4_ = 0xbe2aaaa3;
          auVar363._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar363._12_4_ = 0xbe2aaaa3;
          auVar180 = vfmadd213ps_fma(auVar180,auVar183,auVar363);
          auVar184._0_4_ = auVar180._0_4_ * auVar183._0_4_;
          auVar184._4_4_ = auVar180._4_4_ * auVar183._4_4_;
          auVar184._8_4_ = auVar180._8_4_ * auVar183._8_4_;
          auVar184._12_4_ = auVar180._12_4_ * auVar183._12_4_;
          auVar148 = vpaddd_avx(auVar496,auVar314);
          auVar314 = vfmadd213ps_fma(auVar184,auVar346,auVar346);
          auVar180 = vpand_avx(auVar148,auVar281);
          auVar180 = vpcmpeqd_avx(auVar180,_DAT_005a4070);
          auVar214._0_4_ = auVar123._0_4_ + 1.0;
          auVar214._4_4_ = auVar123._4_4_ + 1.0;
          auVar214._8_4_ = auVar123._8_4_ + 1.0;
          auVar214._12_4_ = auVar123._12_4_ + 1.0;
          auVar180 = vblendvps_avx(auVar214,auVar314,auVar180);
          auVar148 = vpslld_avx(auVar148,0x1d);
          auVar148 = vpand_avx(auVar148,auVar327);
          *(undefined1 (*) [16])*pauVar19 = auVar148 ^ auVar327 ^ auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar16;
          auVar148 = vpshufd_avx(auVar44,0x44);
          auVar206 = vpor_avx(auVar148,local_c8);
          auVar180 = vpor_avx(auVar148,local_c8);
          uVar24 = 0;
          auVar258 = _DAT_005a57e0;
          do {
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar24;
            auVar314 = vpshufd_avx(auVar45,0x44);
            auVar79._16_16_ = auVar314;
            auVar79._0_16_ = auVar314;
            auVar51 = vorps_avx(auVar79,_DAT_005a57c0);
            auVar258 = vorps_avx(auVar79,auVar258);
            auVar123 = vpor_avx(auVar148,local_c8);
            auVar314 = vpcmpgtq_avx(auVar258._16_16_ ^ local_c8,auVar123);
            auVar346 = vpcmpgtq_avx(auVar258._0_16_ ^ local_c8,auVar206);
            auVar314 = vpackssdw_avx(auVar346,auVar314);
            auVar122 = auVar85._0_16_;
            auVar346 = vpcmpgtq_avx(auVar51._16_16_ ^ local_c8,auVar123);
            auVar149._0_8_ = auVar51._0_8_ ^ 0x8000000000000000;
            auVar149._8_4_ = auVar51._8_4_;
            auVar149._12_4_ = auVar51._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar149,auVar180);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar314 = vpackssdw_avx(auVar122 ^ auVar346,auVar122 ^ auVar314);
            auVar346 = vpmovsxwd_avx(auVar314);
            auVar314 = vpunpckhwd_avx(auVar314,auVar314);
            auVar80._16_16_ = auVar314;
            auVar80._0_16_ = auVar346;
            auVar258 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar123 = auVar258._16_16_;
            local_118._0_4_ = cosf(auVar258._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_07;
            local_118._8_4_ = extraout_XMM0_Dc_07;
            local_118._12_4_ = extraout_XMM0_Dd_07;
            auVar314 = vmovshdup_avx(auVar123);
            auVar110._0_4_ = cosf(auVar314._0_4_);
            auVar110._4_60_ = extraout_var_23;
            auVar314 = vinsertps_avx(local_118,auVar110._0_16_,0x10);
            auVar346 = vpermilpd_avx(auVar123,1);
            auVar111._0_4_ = cosf(auVar346._0_4_);
            auVar111._4_60_ = extraout_var_24;
            auVar314 = vinsertps_avx(auVar314,auVar111._0_16_,0x20);
            auVar346 = vpermilps_avx(auVar123,0xff);
            auVar112._0_4_ = cosf(auVar346._0_4_);
            auVar112._4_60_ = extraout_var_25;
            auVar314 = vinsertps_avx(auVar314,auVar112._0_16_,0x30);
            local_e8._0_4_ = auVar258._0_4_;
            local_118._0_4_ = cosf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_08;
            local_118._8_4_ = extraout_XMM0_Dc_08;
            local_118._12_4_ = extraout_XMM0_Dd_08;
            local_e8 = auVar258._0_16_;
            auVar346 = vmovshdup_avx(local_e8);
            auVar113._0_4_ = cosf(auVar346._0_4_);
            auVar113._4_60_ = extraout_var_26;
            auVar346 = vinsertps_avx(local_118,auVar113._0_16_,0x10);
            auVar123 = vpermilpd_avx(local_e8,1);
            auVar114._0_4_ = cosf(auVar123._0_4_);
            auVar114._4_60_ = extraout_var_27;
            auVar346 = vinsertps_avx(auVar346,auVar114._0_16_,0x20);
            auVar123 = vpermilps_avx(local_e8,0xff);
            auVar115._0_4_ = cosf(auVar123._0_4_);
            auVar258 = _DAT_005a57e0;
            auVar115._4_60_ = extraout_var_28;
            auVar123 = vpcmpeqd_avx(auVar122,auVar122);
            auVar85 = ZEXT1664(auVar123);
            auVar346 = vinsertps_avx(auVar346,auVar115._0_16_,0x30);
            auVar81._16_16_ = auVar314;
            auVar81._0_16_ = auVar346;
            auVar51 = vmaskmovps_avx(auVar80,auVar81);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar51;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 0xb:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar206 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      auVar85 = ZEXT1664(auVar206);
      auVar505._8_8_ = 0xfffffffefffffffe;
      auVar505._0_8_ = 0xfffffffefffffffe;
      auVar520._8_8_ = 0x8000000080000000;
      auVar520._0_8_ = 0x8000000080000000;
      auVar31._8_8_ = 0x8000000000000000;
      auVar31._0_8_ = 0x8000000000000000;
      do {
        auVar451._8_4_ = 0x80000000;
        auVar451._0_8_ = 0x8000000080000000;
        auVar451._12_4_ = 0x80000000;
        auVar451._16_4_ = 0x80000000;
        auVar451._20_4_ = 0x80000000;
        auVar345._8_4_ = 2;
        auVar345._0_8_ = 0x200000002;
        auVar451._24_4_ = 0x80000000;
        auVar451._28_4_ = 0x80000000;
        auVar345._12_4_ = 2;
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar206 = auVar85._0_16_;
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          auVar545._8_4_ = 0xbf490000;
          auVar545._0_8_ = 0xbf490000bf490000;
          auVar545._12_4_ = 0xbf490000;
          auVar545._16_4_ = 0xbf490000;
          auVar545._20_4_ = 0xbf490000;
          auVar545._24_4_ = 0xbf490000;
          auVar545._28_4_ = 0xbf490000;
          auVar477._8_4_ = 0xb97da000;
          auVar477._0_8_ = 0xb97da000b97da000;
          auVar477._12_4_ = 0xb97da000;
          auVar477._16_4_ = 0xb97da000;
          auVar477._20_4_ = 0xb97da000;
          auVar477._24_4_ = 0xb97da000;
          auVar477._28_4_ = 0xb97da000;
          do {
            auVar258 = *pauVar19;
            auVar54._8_4_ = 0x7fffffff;
            auVar54._0_8_ = 0x7fffffff7fffffff;
            auVar54._12_4_ = 0x7fffffff;
            auVar54._16_4_ = 0x7fffffff;
            auVar54._20_4_ = 0x7fffffff;
            auVar54._24_4_ = 0x7fffffff;
            auVar54._28_4_ = 0x7fffffff;
            auVar51 = vandps_avx(auVar258,auVar54);
            auVar458 = vandps_avx(auVar451,auVar258);
            auVar172._0_4_ = (int)(auVar51._0_4_ * 1.2732395);
            auVar172._4_4_ = (int)(auVar51._4_4_ * 1.2732395);
            auVar172._8_4_ = (int)(auVar51._8_4_ * 1.2732395);
            auVar172._12_4_ = (int)(auVar51._12_4_ * 1.2732395);
            auVar186._16_4_ = (int)(auVar51._16_4_ * 1.2732395);
            auVar186._0_16_ = auVar172;
            auVar186._20_4_ = (int)(auVar51._20_4_ * 1.2732395);
            auVar186._24_4_ = (int)(auVar51._24_4_ * 1.2732395);
            auVar186._28_4_ = (int)auVar258._28_4_;
            auVar411 = vpsubd_avx(auVar172,auVar206);
            auVar445 = vpsubd_avx(auVar186._16_16_,auVar206);
            auVar180 = vpand_avx(auVar505,auVar411);
            auVar148 = vpand_avx(auVar505,auVar445);
            auVar314 = vpslld_avx(auVar411,0x1d);
            auVar314 = vpand_avx(auVar520,auVar314);
            auVar346 = vpslld_avx(auVar445,0x1d);
            auVar346 = vpand_avx(auVar520,auVar346);
            auVar370._16_16_ = auVar148;
            auVar370._0_16_ = auVar180;
            auVar258 = vcvtdq2ps_avx(auVar370);
            auVar123 = vfmadd231ps_fma(auVar51,auVar258,auVar545);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar258,auVar477);
            auVar333._8_4_ = 0xb3222169;
            auVar333._0_8_ = 0xb3222169b3222169;
            auVar333._12_4_ = 0xb3222169;
            auVar333._16_4_ = 0xb3222169;
            auVar333._20_4_ = 0xb3222169;
            auVar333._24_4_ = 0xb3222169;
            auVar333._28_4_ = 0xb3222169;
            auVar446 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar333,auVar258);
            auVar180 = vpslld_avx(auVar180,0x1d);
            auVar315._8_4_ = 0xc0000000;
            auVar315._0_8_ = 0xc0000000c0000000;
            auVar315._12_4_ = 0xc0000000;
            auVar180 = vpaddd_avx(auVar180,auVar315);
            auVar123 = vpandn_avx(auVar180,auVar520);
            auVar180 = vpslld_avx(auVar148,0x1d);
            auVar180 = vpaddd_avx(auVar180,auVar315);
            auVar122 = vpandn_avx(auVar180,auVar520);
            fVar26 = auVar446._0_4_ * auVar446._0_4_;
            fVar229 = auVar446._4_4_ * auVar446._4_4_;
            fVar230 = auVar446._8_4_ * auVar446._8_4_;
            fVar231 = auVar446._12_4_ * auVar446._12_4_;
            auVar258 = ZEXT1632(CONCAT412(fVar231,CONCAT48(fVar230,CONCAT44(fVar229,fVar26))));
            auVar334._8_4_ = 0x37ccf5ce;
            auVar334._0_8_ = 0x37ccf5ce37ccf5ce;
            auVar334._12_4_ = 0x37ccf5ce;
            auVar334._16_4_ = 0x37ccf5ce;
            auVar334._20_4_ = 0x37ccf5ce;
            auVar334._24_4_ = 0x37ccf5ce;
            auVar334._28_4_ = 0x37ccf5ce;
            auVar371._8_4_ = 0xbab6061a;
            auVar371._0_8_ = 0xbab6061abab6061a;
            auVar371._12_4_ = 0xbab6061a;
            auVar371._16_4_ = 0xbab6061a;
            auVar371._20_4_ = 0xbab6061a;
            auVar371._24_4_ = 0xbab6061a;
            auVar371._28_4_ = 0xbab6061a;
            auVar180 = vfmadd213ps_fma(auVar334,auVar258,auVar371);
            auVar372._8_4_ = 0x3d2aaaa5;
            auVar372._0_8_ = 0x3d2aaaa53d2aaaa5;
            auVar372._12_4_ = 0x3d2aaaa5;
            auVar372._16_4_ = 0x3d2aaaa5;
            auVar372._20_4_ = 0x3d2aaaa5;
            auVar372._24_4_ = 0x3d2aaaa5;
            auVar372._28_4_ = 0x3d2aaaa5;
            auVar180 = vfmadd213ps_fma(ZEXT1632(auVar180),auVar258,auVar372);
            auVar373._8_4_ = 0x3f000000;
            auVar373._0_8_ = 0x3f0000003f000000;
            auVar373._12_4_ = 0x3f000000;
            auVar373._16_4_ = 0x3f000000;
            auVar373._20_4_ = 0x3f000000;
            auVar373._24_4_ = 0x3f000000;
            auVar373._28_4_ = 0x3f000000;
            auVar360 = vfnmadd231ps_fma(ZEXT1632(CONCAT412(fVar231 * fVar231 * auVar180._12_4_,
                                                           CONCAT48(fVar230 * fVar230 *
                                                                    auVar180._8_4_,
                                                                    CONCAT44(fVar229 * fVar229 *
                                                                             auVar180._4_4_,
                                                                             fVar26 * fVar26 *
                                                                             auVar180._0_4_)))),
                                        auVar258,auVar373);
            auVar374._8_4_ = 0xb94ca1f9;
            auVar374._0_8_ = 0xb94ca1f9b94ca1f9;
            auVar374._12_4_ = 0xb94ca1f9;
            auVar374._16_4_ = 0xb94ca1f9;
            auVar374._20_4_ = 0xb94ca1f9;
            auVar374._24_4_ = 0xb94ca1f9;
            auVar374._28_4_ = 0xb94ca1f9;
            auVar563._8_4_ = 0x3c08839e;
            auVar563._0_8_ = 0x3c08839e3c08839e;
            auVar563._12_4_ = 0x3c08839e;
            auVar563._16_4_ = 0x3c08839e;
            auVar563._20_4_ = 0x3c08839e;
            auVar563._24_4_ = 0x3c08839e;
            auVar563._28_4_ = 0x3c08839e;
            auVar180 = vfmadd213ps_fma(auVar374,auVar258,auVar563);
            auVar564._8_4_ = 0xbe2aaaa3;
            auVar564._0_8_ = 0xbe2aaaa3be2aaaa3;
            auVar564._12_4_ = 0xbe2aaaa3;
            auVar564._16_4_ = 0xbe2aaaa3;
            auVar564._20_4_ = 0xbe2aaaa3;
            auVar564._24_4_ = 0xbe2aaaa3;
            auVar564._28_4_ = 0xbe2aaaa3;
            auVar180 = vfmadd213ps_fma(ZEXT1632(auVar180),auVar258,auVar564);
            auVar345._8_4_ = 2;
            auVar345._0_8_ = 0x200000002;
            auVar345._12_4_ = 2;
            auVar446 = vfmadd213ps_fma(ZEXT1632(CONCAT412(auVar180._12_4_ * fVar231,
                                                          CONCAT48(auVar180._8_4_ * fVar230,
                                                                   CONCAT44(auVar180._4_4_ * fVar229
                                                                            ,auVar180._0_4_ * fVar26
                                                                           )))),ZEXT1632(auVar446),
                                       ZEXT1632(auVar446));
            auVar180 = vpand_avx(auVar411,auVar345);
            auVar148 = vpand_avx(auVar445,auVar345);
            auVar187._0_4_ = auVar360._0_4_ + 1.0;
            auVar187._4_4_ = auVar360._4_4_ + 1.0;
            auVar187._8_4_ = auVar360._8_4_ + 1.0;
            auVar187._12_4_ = auVar360._12_4_ + 1.0;
            auVar187._16_4_ = 0x3f800000;
            auVar187._20_4_ = 0x3f800000;
            auVar187._24_4_ = 0x3f800000;
            auVar187._28_4_ = 0x3f800000;
            auVar55._16_16_ = auVar148;
            auVar55._0_16_ = auVar180;
            auVar258 = vcvtdq2ps_avx(auVar55);
            auVar51 = vcmpps_avx(auVar258,ZEXT832(0) << 0x20,0);
            auVar258 = vandps_avx(auVar51,ZEXT1632(auVar446));
            auVar51 = vandnps_avx(auVar51,auVar187);
            auVar56._0_4_ = auVar51._0_4_ + auVar258._0_4_;
            auVar56._4_4_ = auVar51._4_4_ + auVar258._4_4_;
            auVar56._8_4_ = auVar51._8_4_ + auVar258._8_4_;
            auVar56._12_4_ = auVar51._12_4_ + auVar258._12_4_;
            auVar56._16_4_ = auVar51._16_4_ + auVar258._16_4_;
            auVar56._20_4_ = auVar51._20_4_ + auVar258._20_4_;
            auVar56._24_4_ = auVar51._24_4_ + auVar258._24_4_;
            auVar56._28_4_ = auVar51._28_4_ + auVar258._28_4_;
            auVar157._0_4_ = auVar187._0_4_ + auVar446._0_4_;
            auVar157._4_4_ = auVar187._4_4_ + auVar446._4_4_;
            auVar157._8_4_ = auVar187._8_4_ + auVar446._8_4_;
            auVar157._12_4_ = auVar187._12_4_ + auVar446._12_4_;
            auVar157._16_4_ = 0x3f800000;
            auVar157._20_4_ = 0x3f800000;
            auVar157._24_4_ = 0x3f800000;
            auVar157._28_4_ = 0x3f800000;
            auVar258 = vsubps_avx(auVar157,auVar56);
            auVar158._0_4_ = (float)(auVar123._0_4_ ^ auVar258._0_4_);
            auVar158._4_4_ = (float)(auVar123._4_4_ ^ auVar258._4_4_);
            auVar158._8_4_ = (float)(auVar123._8_4_ ^ auVar258._8_4_);
            auVar158._12_4_ = (float)(auVar123._12_4_ ^ auVar258._12_4_);
            auVar158._16_4_ = (float)(auVar122._0_4_ ^ auVar258._16_4_);
            auVar158._20_4_ = (float)(auVar122._4_4_ ^ auVar258._20_4_);
            auVar158._24_4_ = (float)(auVar122._8_4_ ^ auVar258._24_4_);
            auVar158._28_4_ = (float)(auVar122._12_4_ ^ auVar258._28_4_);
            auVar57._0_4_ = auVar458._0_4_ ^ auVar314._0_4_ ^ (uint)auVar56._0_4_;
            auVar57._4_4_ = auVar458._4_4_ ^ auVar314._4_4_ ^ (uint)auVar56._4_4_;
            auVar57._8_4_ = auVar458._8_4_ ^ auVar314._8_4_ ^ (uint)auVar56._8_4_;
            auVar57._12_4_ = auVar458._12_4_ ^ auVar314._12_4_ ^ (uint)auVar56._12_4_;
            auVar57._16_4_ = auVar458._16_4_ ^ auVar346._0_4_ ^ (uint)auVar56._16_4_;
            auVar57._20_4_ = auVar458._20_4_ ^ auVar346._4_4_ ^ (uint)auVar56._20_4_;
            auVar57._24_4_ = auVar458._24_4_ ^ auVar346._8_4_ ^ (uint)auVar56._24_4_;
            auVar57._28_4_ = auVar458._28_4_ ^ auVar346._12_4_ ^ (uint)auVar56._28_4_;
            auVar258 = vcmpps_avx(auVar158,ZEXT832(0) << 0x20,0);
            auVar220._8_4_ = 0x322bcc77;
            auVar220._0_8_ = 0x322bcc77322bcc77;
            auVar220._12_4_ = 0x322bcc77;
            auVar220._16_4_ = 0x322bcc77;
            auVar220._20_4_ = 0x322bcc77;
            auVar220._24_4_ = 0x322bcc77;
            auVar220._28_4_ = 0x322bcc77;
            auVar258 = vandps_avx(auVar258,auVar220);
            auVar159._0_4_ = auVar258._0_4_ + auVar158._0_4_;
            auVar159._4_4_ = auVar258._4_4_ + auVar158._4_4_;
            auVar159._8_4_ = auVar258._8_4_ + auVar158._8_4_;
            auVar159._12_4_ = auVar258._12_4_ + auVar158._12_4_;
            auVar159._16_4_ = auVar258._16_4_ + auVar158._16_4_;
            auVar159._20_4_ = auVar258._20_4_ + auVar158._20_4_;
            auVar159._24_4_ = auVar258._24_4_ + auVar158._24_4_;
            auVar159._28_4_ = auVar258._28_4_ + auVar158._28_4_;
            auVar258 = vdivps_avx(auVar57,auVar159);
            *pauVar19 = auVar258;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar554._8_4_ = 0xb3222169;
        auVar554._0_8_ = 0xb3222169b3222169;
        auVar537._8_4_ = 0xb97da000;
        auVar537._0_8_ = 0xb97da000b97da000;
        auVar554._12_4_ = 0xb3222169;
        auVar537._12_4_ = 0xb97da000;
        auVar464._8_4_ = 0xfffffffe;
        auVar464._0_8_ = 0xfffffffefffffffe;
        auVar464._12_4_ = 0xfffffffe;
        auVar423._8_4_ = 0xe0000000;
        auVar423._0_8_ = 0xe0000000e0000000;
        auVar423._12_4_ = 0xe0000000;
        auVar521._8_4_ = 0x80000000;
        auVar521._0_8_ = 0x8000000080000000;
        auVar521._12_4_ = 0x80000000;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar129._8_4_ = 0x7fffffff;
          auVar129._0_8_ = 0x7fffffff7fffffff;
          auVar129._12_4_ = 0x7fffffff;
          auVar180 = vandps_avx(*(undefined1 (*) [16])*pauVar19,auVar129);
          auVar130._0_4_ = (int)(auVar180._0_4_ * 1.2732395);
          auVar130._4_4_ = (int)(auVar180._4_4_ * 1.2732395);
          auVar130._8_4_ = (int)(auVar180._8_4_ * 1.2732395);
          auVar130._12_4_ = (int)(auVar180._12_4_ * 1.2732395);
          auVar346 = vpsubd_avx(auVar130,auVar206);
          auVar148 = vpand_avx(auVar464,auVar346);
          auVar148 = vcvtdq2ps_avx(auVar148);
          auVar268._8_4_ = 0xbf490000;
          auVar268._0_8_ = 0xbf490000bf490000;
          auVar268._12_4_ = 0xbf490000;
          auVar180 = vfmadd231ps_fma(auVar180,auVar148,auVar268);
          auVar180 = vfmadd231ps_fma(auVar180,auVar148,auVar537);
          auVar148 = vfmadd231ps_fma(auVar180,auVar554,auVar148);
          auVar238._0_4_ = auVar148._0_4_ * auVar148._0_4_;
          auVar238._4_4_ = auVar148._4_4_ * auVar148._4_4_;
          auVar238._8_4_ = auVar148._8_4_ * auVar148._8_4_;
          auVar238._12_4_ = auVar148._12_4_ * auVar148._12_4_;
          auVar269._8_4_ = 0x37ccf5ce;
          auVar269._0_8_ = 0x37ccf5ce37ccf5ce;
          auVar269._12_4_ = 0x37ccf5ce;
          auVar316._8_4_ = 0xbab6061a;
          auVar316._0_8_ = 0xbab6061abab6061a;
          auVar316._12_4_ = 0xbab6061a;
          auVar180 = vfmadd213ps_fma(auVar269,auVar238,auVar316);
          auVar317._8_4_ = 0x3d2aaaa5;
          auVar317._0_8_ = 0x3d2aaaa53d2aaaa5;
          auVar317._12_4_ = 0x3d2aaaa5;
          auVar180 = vfmadd213ps_fma(auVar180,auVar238,auVar317);
          auVar270._0_4_ = auVar238._0_4_ * auVar238._0_4_ * auVar180._0_4_;
          auVar270._4_4_ = auVar238._4_4_ * auVar238._4_4_ * auVar180._4_4_;
          auVar270._8_4_ = auVar238._8_4_ * auVar238._8_4_ * auVar180._8_4_;
          auVar270._12_4_ = auVar238._12_4_ * auVar238._12_4_ * auVar180._12_4_;
          auVar318._8_4_ = 0x3f000000;
          auVar318._0_8_ = 0x3f0000003f000000;
          auVar318._12_4_ = 0x3f000000;
          auVar314 = vfnmadd231ps_fma(auVar270,auVar238,auVar318);
          auVar319._8_4_ = 0xb94ca1f9;
          auVar319._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar319._12_4_ = 0xb94ca1f9;
          auVar395._8_4_ = 0x3c08839e;
          auVar395._0_8_ = 0x3c08839e3c08839e;
          auVar395._12_4_ = 0x3c08839e;
          auVar180 = vfmadd213ps_fma(auVar319,auVar238,auVar395);
          auVar396._8_4_ = 0xbe2aaaa3;
          auVar396._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar396._12_4_ = 0xbe2aaaa3;
          auVar180 = vfmadd213ps_fma(auVar180,auVar238,auVar396);
          auVar239._0_4_ = auVar180._0_4_ * auVar238._0_4_;
          auVar239._4_4_ = auVar180._4_4_ * auVar238._4_4_;
          auVar239._8_4_ = auVar180._8_4_ * auVar238._8_4_;
          auVar239._12_4_ = auVar180._12_4_ * auVar238._12_4_;
          auVar180 = vpand_avx(auVar346,auVar345);
          auVar180 = vpcmpeqd_avx((undefined1  [16])0x0,auVar180);
          auVar271._0_4_ = auVar314._0_4_ + 1.0;
          auVar271._4_4_ = auVar314._4_4_ + 1.0;
          auVar271._8_4_ = auVar314._8_4_ + 1.0;
          auVar271._12_4_ = auVar314._12_4_ + 1.0;
          auVar314 = vfmadd213ps_fma(auVar239,auVar148,auVar148);
          auVar148 = vblendvps_avx(auVar271,auVar314,auVar180);
          auVar314 = vblendvps_avx(auVar314,auVar271,auVar180);
          auVar180 = vpslld_avx(auVar346,0x1d);
          auVar346 = vpand_avx(auVar521,auVar180 ^ *(undefined1 (*) [16])*pauVar19);
          auVar180 = vpslld_avx(auVar130,0x1d);
          auVar180 = vpaddd_avx(auVar423,auVar180);
          auVar123 = vpand_avx(auVar521,auVar180);
          auVar180 = vcmpps_avx((undefined1  [16])0x0,auVar521 ^ auVar123 ^ auVar314,0);
          auVar202._8_4_ = 0x322bcc77;
          auVar202._0_8_ = 0x322bcc77322bcc77;
          auVar202._12_4_ = 0x322bcc77;
          auVar180 = vandps_avx(auVar180,auVar202);
          auVar180 = vsubps_avx(auVar180,auVar123 ^ auVar314);
          auVar180 = vdivps_avx(auVar346 ^ auVar148,auVar180);
          *(undefined1 (*) [16])*pauVar19 = auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar16;
          auVar148 = vpshufd_avx(auVar32,0x44);
          auVar206 = vorps_avx(auVar148,auVar31);
          auVar180 = vorps_avx(auVar148,auVar31);
          uVar24 = 0;
          auVar258 = _DAT_005a57c0;
          auVar51 = _DAT_005a57e0;
          do {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar24;
            auVar314 = vpshufd_avx(auVar33,0x44);
            auVar58._16_16_ = auVar314;
            auVar58._0_16_ = auVar314;
            auVar258 = vorps_avx(auVar58,auVar258);
            auVar51 = vorps_avx(auVar58,auVar51);
            auVar123 = vpor_avx(auVar148,auVar31);
            auVar314 = vpcmpgtq_avx(auVar51._16_16_ ^ auVar31,auVar123);
            auVar346 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar31,auVar206);
            auVar314 = vpackssdw_avx(auVar346,auVar314);
            auVar122 = auVar85._0_16_;
            auVar346 = vpcmpgtq_avx(auVar258._16_16_ ^ auVar31,auVar123);
            auVar131._0_8_ = auVar258._0_8_ ^ 0x8000000000000000;
            auVar131._8_4_ = auVar258._8_4_;
            auVar131._12_4_ = auVar258._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar131,auVar180);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar314 = vpackssdw_avx(auVar122 ^ auVar346,auVar122 ^ auVar314);
            auVar346 = vpmovsxwd_avx(auVar314);
            auVar314 = vpunpckhwd_avx(auVar314,auVar314);
            auVar59._16_16_ = auVar314;
            auVar59._0_16_ = auVar346;
            auVar258 = vmaskmovps_avx(auVar59,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar123 = auVar258._16_16_;
            local_118._0_4_ = tanf(auVar258._16_4_);
            local_118._4_4_ = extraout_XMM0_Db;
            local_118._8_4_ = extraout_XMM0_Dc;
            local_118._12_4_ = extraout_XMM0_Dd;
            auVar314 = vmovshdup_avx(auVar123);
            auVar87._0_4_ = tanf(auVar314._0_4_);
            auVar87._4_60_ = extraout_var;
            auVar314 = vinsertps_avx(local_118,auVar87._0_16_,0x10);
            auVar346 = vpermilpd_avx(auVar123,1);
            auVar88._0_4_ = tanf(auVar346._0_4_);
            auVar88._4_60_ = extraout_var_00;
            auVar314 = vinsertps_avx(auVar314,auVar88._0_16_,0x20);
            auVar346 = vpermilps_avx(auVar123,0xff);
            auVar89._0_4_ = tanf(auVar346._0_4_);
            auVar89._4_60_ = extraout_var_01;
            auVar314 = vinsertps_avx(auVar314,auVar89._0_16_,0x30);
            local_e8._0_4_ = auVar258._0_4_;
            local_118._0_4_ = tanf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_00;
            local_118._8_4_ = extraout_XMM0_Dc_00;
            local_118._12_4_ = extraout_XMM0_Dd_00;
            local_e8 = auVar258._0_16_;
            auVar346 = vmovshdup_avx(local_e8);
            auVar90._0_4_ = tanf(auVar346._0_4_);
            auVar90._4_60_ = extraout_var_02;
            auVar346 = vinsertps_avx(local_118,auVar90._0_16_,0x10);
            auVar123 = vpermilpd_avx(local_e8,1);
            auVar91._0_4_ = tanf(auVar123._0_4_);
            auVar91._4_60_ = extraout_var_03;
            auVar346 = vinsertps_avx(auVar346,auVar91._0_16_,0x20);
            auVar123 = vpermilps_avx(local_e8,0xff);
            auVar92._0_4_ = tanf(auVar123._0_4_);
            auVar51 = _DAT_005a57e0;
            auVar258 = _DAT_005a57c0;
            auVar92._4_60_ = extraout_var_04;
            auVar123 = vpcmpeqd_avx(auVar122,auVar122);
            auVar85 = ZEXT1664(auVar123);
            auVar346 = vinsertps_avx(auVar346,auVar92._0_16_,0x30);
            auVar60._16_16_ = auVar314;
            auVar60._0_16_ = auVar346;
            auVar458 = vmaskmovps_avx(auVar59,auVar60);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 0xc:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      do {
        auVar565._8_4_ = 0x3cc48f19;
        auVar565._0_8_ = 0x3cc48f193cc48f19;
        auVar546._8_4_ = 0x3d997dcc;
        auVar546._0_8_ = 0x3d997dcc3d997dcc;
        auVar531._8_4_ = 0x3e2aaaf8;
        auVar531._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar515._8_4_ = 0x3d2dbdcf;
        auVar515._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar498._8_4_ = 0x3d3a73d8;
        auVar498._0_8_ = 0x3d3a73d83d3a73d8;
        auVar478._8_4_ = 0x3f800000;
        auVar478._0_8_ = 0x3f8000003f800000;
        auVar452._8_4_ = 0x3f000000;
        auVar452._0_8_ = 0x3f0000003f000000;
        auVar412._8_4_ = 0x7fffffff;
        auVar412._0_8_ = 0x7fffffff7fffffff;
        auVar377._8_4_ = 0x80000000;
        auVar377._0_8_ = 0x8000000080000000;
        auVar565._12_4_ = 0x3cc48f19;
        auVar546._12_4_ = 0x3d997dcc;
        auVar531._12_4_ = 0x3e2aaaf8;
        auVar515._12_4_ = 0x3d2dbdcf;
        auVar498._12_4_ = 0x3d3a73d8;
        auVar478._12_4_ = 0x3f800000;
        auVar452._12_4_ = 0x3f000000;
        auVar412._12_4_ = 0x7fffffff;
        auVar377._12_4_ = 0x80000000;
        auVar565._16_4_ = 0x3cc48f19;
        auVar546._16_4_ = 0x3d997dcc;
        auVar531._16_4_ = 0x3e2aaaf8;
        auVar515._16_4_ = 0x3d2dbdcf;
        auVar498._16_4_ = 0x3d3a73d8;
        auVar478._16_4_ = 0x3f800000;
        auVar452._16_4_ = 0x3f000000;
        auVar412._16_4_ = 0x7fffffff;
        auVar377._16_4_ = 0x80000000;
        auVar565._20_4_ = 0x3cc48f19;
        auVar546._20_4_ = 0x3d997dcc;
        auVar531._20_4_ = 0x3e2aaaf8;
        auVar515._20_4_ = 0x3d2dbdcf;
        auVar498._20_4_ = 0x3d3a73d8;
        auVar478._20_4_ = 0x3f800000;
        auVar452._20_4_ = 0x3f000000;
        auVar412._20_4_ = 0x7fffffff;
        auVar377._20_4_ = 0x80000000;
        auVar565._24_4_ = 0x3cc48f19;
        auVar546._24_4_ = 0x3d997dcc;
        auVar531._24_4_ = 0x3e2aaaf8;
        auVar515._24_4_ = 0x3d2dbdcf;
        auVar498._24_4_ = 0x3d3a73d8;
        auVar478._24_4_ = 0x3f800000;
        auVar452._24_4_ = 0x3f000000;
        auVar412._24_4_ = 0x7fffffff;
        auVar377._24_4_ = 0x80000000;
        auVar565._28_4_ = 0x3cc48f19;
        auVar546._28_4_ = 0x3d997dcc;
        auVar531._28_4_ = 0x3e2aaaf8;
        auVar515._28_4_ = 0x3d2dbdcf;
        auVar498._28_4_ = 0x3d3a73d8;
        auVar478._28_4_ = 0x3f800000;
        auVar452._28_4_ = 0x3f000000;
        auVar412._28_4_ = 0x7fffffff;
        auVar377._28_4_ = 0x80000000;
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar258 = vandps_avx(auVar412,*pauVar19);
            auVar206 = vfnmadd213ps_fma(auVar452,auVar258,auVar452);
            auVar390 = vsqrtps_avx(ZEXT1632(auVar206));
            auVar458 = vcmpps_avx(auVar452,auVar258,1);
            auVar51 = vblendvps_avx(auVar258,auVar390,auVar458);
            fVar26 = auVar51._0_4_;
            fVar169 = fVar26 * fVar26;
            fVar229 = auVar51._4_4_;
            fVar194 = fVar229 * fVar229;
            auVar6._4_4_ = fVar194;
            auVar6._0_4_ = fVar169;
            fVar230 = auVar51._8_4_;
            fVar195 = fVar230 * fVar230;
            auVar6._8_4_ = fVar195;
            fVar231 = auVar51._12_4_;
            fVar196 = fVar231 * fVar231;
            auVar6._12_4_ = fVar196;
            fVar232 = auVar51._16_4_;
            fVar197 = fVar232 * fVar232;
            auVar6._16_4_ = fVar197;
            fVar233 = auVar51._20_4_;
            fVar198 = fVar233 * fVar233;
            auVar6._20_4_ = fVar198;
            fVar234 = auVar51._24_4_;
            fVar199 = fVar234 * fVar234;
            auVar6._24_4_ = fVar199;
            auVar6._28_4_ = auVar390._28_4_;
            auVar266._0_4_ = fVar169 * fVar169;
            auVar266._4_4_ = fVar194 * fVar194;
            auVar266._8_4_ = fVar195 * fVar195;
            auVar266._12_4_ = fVar196 * fVar196;
            auVar266._16_4_ = fVar197 * fVar197;
            auVar266._20_4_ = fVar198 * fVar198;
            auVar266._28_36_ = in_ZMM4._28_36_;
            auVar266._24_4_ = fVar199 * fVar199;
            auVar258 = auVar266._0_32_;
            auVar206 = vfmadd213ps_fma(auVar515,auVar258,auVar498);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar258,auVar531);
            auVar180 = vfmadd213ps_fma(auVar565,auVar258,auVar546);
            auVar180 = vfmadd213ps_fma(ZEXT1632(auVar180),auVar258,auVar478);
            auVar206 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar6,ZEXT1632(auVar206));
            auVar258 = vandps_avx(auVar478,auVar458);
            auVar7._4_4_ = auVar206._4_4_ * fVar229;
            auVar7._0_4_ = auVar206._0_4_ * fVar26;
            auVar7._8_4_ = auVar206._8_4_ * fVar230;
            auVar7._12_4_ = auVar206._12_4_ * fVar231;
            auVar7._16_4_ = fVar232 * 0.0;
            auVar7._20_4_ = fVar233 * 0.0;
            auVar7._24_4_ = fVar234 * 0.0;
            auVar7._28_4_ = auVar51._28_4_;
            auVar221._8_4_ = 0xc0400000;
            auVar221._0_8_ = 0xc0400000c0400000;
            auVar221._12_4_ = 0xc0400000;
            auVar221._16_4_ = 0xc0400000;
            auVar221._20_4_ = 0xc0400000;
            auVar221._24_4_ = 0xc0400000;
            auVar221._28_4_ = 0xc0400000;
            auVar206 = vfmadd213ps_fma(auVar221,auVar258,auVar478);
            in_ZMM4 = ZEXT3264(CONCAT428(0x3fc90fdb,
                                         CONCAT424(0x3fc90fdb,
                                                   CONCAT420(0x3fc90fdb,
                                                             CONCAT416(0x3fc90fdb,
                                                                       CONCAT412(0x3fc90fdb,
                                                                                 CONCAT48(0x3fc90fdb
                                                                                          ,
                                                  0x3fc90fdb3fc90fdb)))))));
            auVar8._4_4_ = auVar258._4_4_ * 1.5707964;
            auVar8._0_4_ = auVar258._0_4_ * 1.5707964;
            auVar8._8_4_ = auVar258._8_4_ * 1.5707964;
            auVar8._12_4_ = auVar258._12_4_ * 1.5707964;
            auVar8._16_4_ = auVar258._16_4_ * 1.5707964;
            auVar8._20_4_ = auVar258._20_4_ * 1.5707964;
            auVar8._24_4_ = auVar258._24_4_ * 1.5707964;
            auVar8._28_4_ = auVar258._28_4_;
            auVar206 = vfmadd231ps_fma(auVar8,auVar7,ZEXT1632(auVar206));
            auVar258 = vandps_avx(*pauVar19,auVar377);
            auVar258 = vorps_avx(auVar258,ZEXT1632(auVar206));
            *pauVar19 = auVar258;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar398._8_4_ = 0x7fffffff;
        auVar398._0_8_ = 0x7fffffff7fffffff;
        auVar398._12_4_ = 0x7fffffff;
        auVar426._8_4_ = 0x3f000000;
        auVar426._0_8_ = 0x3f0000003f000000;
        auVar426._12_4_ = 0x3f000000;
        auVar465._8_4_ = 0x3f800000;
        auVar465._0_8_ = 0x3f8000003f800000;
        auVar465._12_4_ = 0x3f800000;
        auVar486._8_4_ = 0x3d3a73d8;
        auVar486._0_8_ = 0x3d3a73d83d3a73d8;
        auVar486._12_4_ = 0x3d3a73d8;
        auVar506._8_4_ = 0x3d2dbdcf;
        auVar506._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar506._12_4_ = 0x3d2dbdcf;
        auVar522._8_4_ = 0x3e2aaaf8;
        auVar522._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar522._12_4_ = 0x3e2aaaf8;
        auVar538._8_4_ = 0x3d997dcc;
        auVar538._0_8_ = 0x3d997dcc3d997dcc;
        auVar538._12_4_ = 0x3d997dcc;
        auVar555._8_4_ = 0x3cc48f19;
        auVar555._0_8_ = 0x3cc48f193cc48f19;
        auVar555._12_4_ = 0x3cc48f19;
        auVar349._8_4_ = 0xc0400000;
        auVar349._0_8_ = 0xc0400000c0400000;
        auVar349._12_4_ = 0xc0400000;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar206 = vandps_avx(auVar398,*(undefined1 (*) [16])*pauVar19);
          auVar180 = vcmpps_avx(auVar426,auVar206,1);
          auVar148 = vfnmadd213ps_fma(auVar426,auVar206,auVar426);
          auVar148 = vsqrtps_avx(auVar148);
          auVar206 = vblendvps_avx(auVar206,auVar148,auVar180);
          fVar26 = auVar206._0_4_;
          auVar203._0_4_ = fVar26 * fVar26;
          fVar229 = auVar206._4_4_;
          auVar203._4_4_ = fVar229 * fVar229;
          fVar230 = auVar206._8_4_;
          auVar203._8_4_ = fVar230 * fVar230;
          fVar231 = auVar206._12_4_;
          auVar203._12_4_ = fVar231 * fVar231;
          auVar242._0_4_ = auVar203._0_4_ * auVar203._0_4_;
          auVar242._4_4_ = auVar203._4_4_ * auVar203._4_4_;
          auVar242._8_4_ = auVar203._8_4_ * auVar203._8_4_;
          auVar242._12_4_ = auVar203._12_4_ * auVar203._12_4_;
          auVar206 = vfmadd213ps_fma(auVar506,auVar242,auVar486);
          auVar206 = vfmadd213ps_fma(auVar206,auVar242,auVar522);
          auVar148 = vfmadd213ps_fma(auVar555,auVar242,auVar538);
          auVar148 = vfmadd213ps_fma(auVar148,auVar242,auVar465);
          auVar148 = vfmadd231ps_fma(auVar148,auVar203,auVar206);
          auVar206 = vandps_avx(auVar465,auVar180);
          auVar132._0_4_ = auVar148._0_4_ * fVar26;
          auVar132._4_4_ = auVar148._4_4_ * fVar229;
          auVar132._8_4_ = auVar148._8_4_ * fVar230;
          auVar132._12_4_ = auVar148._12_4_ * fVar231;
          auVar180 = vfmadd213ps_fma(auVar349,auVar206,auVar465);
          in_ZMM4 = ZEXT1664(CONCAT412(0x3fc90fdb,CONCAT48(0x3fc90fdb,0x3fc90fdb3fc90fdb)));
          auVar174._0_4_ = auVar206._0_4_ * 1.5707964;
          auVar174._4_4_ = auVar206._4_4_ * 1.5707964;
          auVar174._8_4_ = auVar206._8_4_ * 1.5707964;
          auVar174._12_4_ = auVar206._12_4_ * 1.5707964;
          auVar180 = vfmadd231ps_fma(auVar174,auVar132,auVar180);
          auVar133._8_4_ = 0x80000000;
          auVar133._0_8_ = 0x8000000080000000;
          auVar133._12_4_ = 0x80000000;
          auVar206 = vandps_avx(*(undefined1 (*) [16])*pauVar19,auVar133);
          auVar206 = vorps_avx(auVar206,auVar180);
          *(undefined1 (*) [16])*pauVar19 = auVar206;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if (uVar17 - uVar23 != 0 && (int)uVar23 <= (int)uVar17) {
          lVar25 = 0;
          do {
            in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
            fVar26 = asinf(*(float *)(*pauVar19 + lVar25 * 4));
            *(float *)(*pauVar19 + lVar25 * 4) = fVar26;
            lVar25 = lVar25 + 1;
          } while (uVar17 - uVar23 != (int)lVar25);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 0xd:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      do {
        auVar568._8_4_ = 0x3f800000;
        auVar568._0_8_ = 0x3f8000003f800000;
        auVar549._8_4_ = 0x3cc48f19;
        auVar549._0_8_ = 0x3cc48f193cc48f19;
        auVar533._8_4_ = 0x3d997dcc;
        auVar533._0_8_ = 0x3d997dcc3d997dcc;
        auVar516._8_4_ = 0x3e2aaaf8;
        auVar516._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar502._8_4_ = 0x3d2dbdcf;
        auVar502._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar480._8_4_ = 0x3d3a73d8;
        auVar480._0_8_ = 0x3d3a73d83d3a73d8;
        auVar459._8_4_ = 0x3f000000;
        auVar459._0_8_ = 0x3f0000003f000000;
        auVar415._8_4_ = 0x7fffffff;
        auVar415._0_8_ = 0x7fffffff7fffffff;
        auVar386._8_4_ = 0x80000000;
        auVar386._0_8_ = 0x8000000080000000;
        auVar568._12_4_ = 0x3f800000;
        auVar549._12_4_ = 0x3cc48f19;
        auVar533._12_4_ = 0x3d997dcc;
        auVar516._12_4_ = 0x3e2aaaf8;
        auVar502._12_4_ = 0x3d2dbdcf;
        auVar480._12_4_ = 0x3d3a73d8;
        auVar459._12_4_ = 0x3f000000;
        auVar415._12_4_ = 0x7fffffff;
        auVar386._12_4_ = 0x80000000;
        auVar568._16_4_ = 0x3f800000;
        auVar549._16_4_ = 0x3cc48f19;
        auVar533._16_4_ = 0x3d997dcc;
        auVar516._16_4_ = 0x3e2aaaf8;
        auVar502._16_4_ = 0x3d2dbdcf;
        auVar480._16_4_ = 0x3d3a73d8;
        auVar459._16_4_ = 0x3f000000;
        auVar415._16_4_ = 0x7fffffff;
        auVar386._16_4_ = 0x80000000;
        auVar568._20_4_ = 0x3f800000;
        auVar549._20_4_ = 0x3cc48f19;
        auVar533._20_4_ = 0x3d997dcc;
        auVar516._20_4_ = 0x3e2aaaf8;
        auVar502._20_4_ = 0x3d2dbdcf;
        auVar480._20_4_ = 0x3d3a73d8;
        auVar459._20_4_ = 0x3f000000;
        auVar415._20_4_ = 0x7fffffff;
        auVar386._20_4_ = 0x80000000;
        auVar568._24_4_ = 0x3f800000;
        auVar549._24_4_ = 0x3cc48f19;
        auVar533._24_4_ = 0x3d997dcc;
        auVar516._24_4_ = 0x3e2aaaf8;
        auVar502._24_4_ = 0x3d2dbdcf;
        auVar480._24_4_ = 0x3d3a73d8;
        auVar459._24_4_ = 0x3f000000;
        auVar415._24_4_ = 0x7fffffff;
        auVar386._24_4_ = 0x80000000;
        auVar568._28_4_ = 0x3f800000;
        auVar549._28_4_ = 0x3cc48f19;
        auVar533._28_4_ = 0x3d997dcc;
        auVar516._28_4_ = 0x3e2aaaf8;
        auVar502._28_4_ = 0x3d2dbdcf;
        auVar480._28_4_ = 0x3d3a73d8;
        auVar459._28_4_ = 0x3f000000;
        auVar415._28_4_ = 0x7fffffff;
        auVar386._28_4_ = 0x80000000;
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar258 = *pauVar19;
            auVar51 = vandps_avx(auVar415,auVar258);
            auVar206 = vfnmadd213ps_fma(auVar459,auVar51,auVar459);
            auVar391 = vsqrtps_avx(ZEXT1632(auVar206));
            auVar390 = vcmpps_avx(auVar459,auVar51,1);
            auVar458 = vblendvps_avx(auVar51,auVar391,auVar390);
            fVar26 = auVar458._0_4_;
            fVar169 = fVar26 * fVar26;
            fVar229 = auVar458._4_4_;
            fVar194 = fVar229 * fVar229;
            auVar12._4_4_ = fVar194;
            auVar12._0_4_ = fVar169;
            fVar230 = auVar458._8_4_;
            fVar195 = fVar230 * fVar230;
            auVar12._8_4_ = fVar195;
            fVar231 = auVar458._12_4_;
            fVar196 = fVar231 * fVar231;
            auVar12._12_4_ = fVar196;
            fVar232 = auVar458._16_4_;
            fVar197 = fVar232 * fVar232;
            auVar12._16_4_ = fVar197;
            fVar233 = auVar458._20_4_;
            fVar198 = fVar233 * fVar233;
            auVar12._20_4_ = fVar198;
            fVar234 = auVar458._24_4_;
            fVar199 = fVar234 * fVar234;
            auVar12._24_4_ = fVar199;
            auVar12._28_4_ = auVar391._28_4_;
            auVar267._0_4_ = fVar169 * fVar169;
            auVar267._4_4_ = fVar194 * fVar194;
            auVar267._8_4_ = fVar195 * fVar195;
            auVar267._12_4_ = fVar196 * fVar196;
            auVar267._16_4_ = fVar197 * fVar197;
            auVar267._20_4_ = fVar198 * fVar198;
            auVar267._28_36_ = in_ZMM4._28_36_;
            auVar267._24_4_ = fVar199 * fVar199;
            auVar51 = auVar267._0_32_;
            auVar206 = vfmadd213ps_fma(auVar502,auVar51,auVar480);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar51,auVar516);
            auVar180 = vfmadd213ps_fma(auVar549,auVar51,auVar533);
            auVar180 = vfmadd213ps_fma(ZEXT1632(auVar180),auVar51,auVar568);
            auVar206 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar12,ZEXT1632(auVar206));
            auVar51 = vandps_avx(auVar258,auVar386);
            fVar26 = auVar206._0_4_ * fVar26;
            fVar229 = auVar206._4_4_ * fVar229;
            auVar13._4_4_ = fVar229;
            auVar13._0_4_ = fVar26;
            fVar230 = auVar206._8_4_ * fVar230;
            auVar13._8_4_ = fVar230;
            fVar231 = auVar206._12_4_ * fVar231;
            auVar13._12_4_ = fVar231;
            fVar232 = fVar232 * 0.0;
            auVar13._16_4_ = fVar232;
            fVar233 = fVar233 * 0.0;
            auVar13._20_4_ = fVar233;
            fVar169 = auVar458._28_4_;
            fVar234 = fVar234 * 0.0;
            auVar13._24_4_ = fVar234;
            auVar13._28_4_ = fVar169;
            auVar458 = vorps_avx(auVar51,auVar13);
            in_ZMM4 = ZEXT3264(auVar458);
            auVar164._0_4_ = fVar26 + fVar26;
            auVar164._4_4_ = fVar229 + fVar229;
            auVar164._8_4_ = fVar230 + fVar230;
            auVar164._12_4_ = fVar231 + fVar231;
            auVar164._16_4_ = fVar232 + fVar232;
            auVar164._20_4_ = fVar233 + fVar233;
            auVar164._24_4_ = fVar234 + fVar234;
            auVar164._28_4_ = fVar169 + fVar169;
            auVar51 = vorps_avx(auVar51,auVar164);
            auVar258 = vcmpps_avx(auVar258,ZEXT832(0) << 0x20,1);
            auVar191._8_4_ = 0x40490fdb;
            auVar191._0_8_ = 0x40490fdb40490fdb;
            auVar191._12_4_ = 0x40490fdb;
            auVar191._16_4_ = 0x40490fdb;
            auVar191._20_4_ = 0x40490fdb;
            auVar191._24_4_ = 0x40490fdb;
            auVar191._28_4_ = 0x40490fdb;
            auVar258 = vandps_avx(auVar258,auVar191);
            auVar75._0_4_ = auVar258._0_4_ + auVar51._0_4_;
            auVar75._4_4_ = auVar258._4_4_ + auVar51._4_4_;
            auVar75._8_4_ = auVar258._8_4_ + auVar51._8_4_;
            auVar75._12_4_ = auVar258._12_4_ + auVar51._12_4_;
            auVar75._16_4_ = auVar258._16_4_ + auVar51._16_4_;
            auVar75._20_4_ = auVar258._20_4_ + auVar51._20_4_;
            auVar75._24_4_ = auVar258._24_4_ + auVar51._24_4_;
            auVar75._28_4_ = auVar258._28_4_ + auVar51._28_4_;
            auVar165._8_4_ = 0x3fc90fdb;
            auVar165._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar165._12_4_ = 0x3fc90fdb;
            auVar165._16_4_ = 0x3fc90fdb;
            auVar165._20_4_ = 0x3fc90fdb;
            auVar165._24_4_ = 0x3fc90fdb;
            auVar165._28_4_ = 0x3fc90fdb;
            auVar258 = vsubps_avx(auVar165,auVar458);
            auVar258 = vblendvps_avx(auVar258,auVar75,auVar390);
            *pauVar19 = auVar258;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar405._8_4_ = 0x7fffffff;
        auVar405._0_8_ = 0x7fffffff7fffffff;
        auVar405._12_4_ = 0x7fffffff;
        auVar440._8_4_ = 0x3f000000;
        auVar440._0_8_ = 0x3f0000003f000000;
        auVar440._12_4_ = 0x3f000000;
        auVar471._8_4_ = 0x3d3a73d8;
        auVar471._0_8_ = 0x3d3a73d83d3a73d8;
        auVar471._12_4_ = 0x3d3a73d8;
        auVar495._8_4_ = 0x3d2dbdcf;
        auVar495._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar495._12_4_ = 0x3d2dbdcf;
        auVar510._8_4_ = 0x3e2aaaf8;
        auVar510._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar510._12_4_ = 0x3e2aaaf8;
        auVar526._8_4_ = 0x3d997dcc;
        auVar526._0_8_ = 0x3d997dcc3d997dcc;
        auVar526._12_4_ = 0x3d997dcc;
        auVar542._8_4_ = 0x3cc48f19;
        auVar542._0_8_ = 0x3cc48f193cc48f19;
        auVar542._12_4_ = 0x3cc48f19;
        auVar559._8_4_ = 0x3f800000;
        auVar559._0_8_ = 0x3f8000003f800000;
        auVar559._12_4_ = 0x3f800000;
        auVar359._8_4_ = 0x3fc90fdb;
        auVar359._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar359._12_4_ = 0x3fc90fdb;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar206 = *(undefined1 (*) [16])*pauVar19;
          auVar180 = vandps_avx(auVar405,auVar206);
          auVar148 = vcmpps_avx(auVar440,auVar180,1);
          auVar314 = vfnmadd213ps_fma(auVar440,auVar180,auVar440);
          auVar314 = vsqrtps_avx(auVar314);
          auVar180 = vblendvps_avx(auVar180,auVar314,auVar148);
          fVar26 = auVar180._0_4_;
          auVar209._0_4_ = fVar26 * fVar26;
          fVar229 = auVar180._4_4_;
          auVar209._4_4_ = fVar229 * fVar229;
          fVar230 = auVar180._8_4_;
          auVar209._8_4_ = fVar230 * fVar230;
          fVar231 = auVar180._12_4_;
          auVar209._12_4_ = fVar231 * fVar231;
          auVar253._0_4_ = auVar209._0_4_ * auVar209._0_4_;
          auVar253._4_4_ = auVar209._4_4_ * auVar209._4_4_;
          auVar253._8_4_ = auVar209._8_4_ * auVar209._8_4_;
          auVar253._12_4_ = auVar209._12_4_ * auVar209._12_4_;
          auVar180 = vfmadd213ps_fma(auVar495,auVar253,auVar471);
          auVar180 = vfmadd213ps_fma(auVar180,auVar253,auVar510);
          auVar314 = vfmadd213ps_fma(auVar542,auVar253,auVar526);
          auVar314 = vfmadd213ps_fma(auVar314,auVar253,auVar559);
          auVar314 = vfmadd231ps_fma(auVar314,auVar209,auVar180);
          auVar210._8_4_ = 0x80000000;
          auVar210._0_8_ = 0x8000000080000000;
          auVar210._12_4_ = 0x80000000;
          auVar180 = vandps_avx(auVar206,auVar210);
          auVar144._0_4_ = auVar314._0_4_ * fVar26;
          auVar144._4_4_ = auVar314._4_4_ * fVar229;
          auVar144._8_4_ = auVar314._8_4_ * fVar230;
          auVar144._12_4_ = auVar314._12_4_ * fVar231;
          auVar314 = vorps_avx(auVar180,auVar144);
          in_ZMM4 = ZEXT1664(auVar314);
          auVar145._0_4_ = auVar144._0_4_ + auVar144._0_4_;
          auVar145._4_4_ = auVar144._4_4_ + auVar144._4_4_;
          auVar145._8_4_ = auVar144._8_4_ + auVar144._8_4_;
          auVar145._12_4_ = auVar144._12_4_ + auVar144._12_4_;
          auVar180 = vorps_avx(auVar180,auVar145);
          auVar206 = vcmpps_avx(auVar206,_DAT_005a4070,1);
          auVar211._8_4_ = 0x40490fdb;
          auVar211._0_8_ = 0x40490fdb40490fdb;
          auVar211._12_4_ = 0x40490fdb;
          auVar206 = vandps_avx(auVar206,auVar211);
          auVar42._0_4_ = auVar206._0_4_ + auVar180._0_4_;
          auVar42._4_4_ = auVar206._4_4_ + auVar180._4_4_;
          auVar42._8_4_ = auVar206._8_4_ + auVar180._8_4_;
          auVar42._12_4_ = auVar206._12_4_ + auVar180._12_4_;
          auVar206 = vsubps_avx(auVar359,auVar314);
          auVar206 = vblendvps_avx(auVar206,auVar42,auVar148);
          *(undefined1 (*) [16])*pauVar19 = auVar206;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if (uVar17 - uVar23 != 0 && (int)uVar23 <= (int)uVar17) {
          lVar25 = 0;
          do {
            in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
            fVar26 = acosf(*(float *)(*pauVar19 + lVar25 * 4));
            *(float *)(*pauVar19 + lVar25 * 4) = fVar26;
            lVar25 = lVar25 + 1;
          } while (uVar17 - uVar23 != (int)lVar25);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 0xe:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      do {
        auVar562._8_4_ = 0xbeaaaa53;
        auVar562._0_8_ = 0xbeaaaa53beaaaa53;
        auVar514._8_4_ = 0xbe117200;
        auVar514._0_8_ = 0xbe117200be117200;
        auVar450._8_4_ = 0x3f800000;
        auVar450._0_8_ = 0x3f8000003f800000;
        auVar366._8_4_ = 0x80000000;
        auVar366._0_8_ = 0x8000000080000000;
        auVar331._8_4_ = 0xbd99b01e;
        auVar331._0_8_ = 0xbd99b01ebd99b01e;
        auVar289._8_4_ = 0xbc83a25c;
        auVar289._0_8_ = 0xbc83a25cbc83a25c;
        auVar218._8_4_ = 0xbf800000;
        auVar218._0_8_ = 0xbf800000bf800000;
        auVar156._8_4_ = 0x7fffffff;
        auVar156._0_8_ = 0x7fffffff7fffffff;
        auVar562._12_4_ = 0xbeaaaa53;
        auVar514._12_4_ = 0xbe117200;
        auVar450._12_4_ = 0x3f800000;
        auVar366._12_4_ = 0x80000000;
        auVar331._12_4_ = 0xbd99b01e;
        auVar289._12_4_ = 0xbc83a25c;
        auVar218._12_4_ = 0xbf800000;
        auVar156._12_4_ = 0x7fffffff;
        auVar562._16_4_ = 0xbeaaaa53;
        auVar514._16_4_ = 0xbe117200;
        auVar450._16_4_ = 0x3f800000;
        auVar366._16_4_ = 0x80000000;
        auVar331._16_4_ = 0xbd99b01e;
        auVar289._16_4_ = 0xbc83a25c;
        auVar218._16_4_ = 0xbf800000;
        auVar156._16_4_ = 0x7fffffff;
        auVar562._20_4_ = 0xbeaaaa53;
        auVar514._20_4_ = 0xbe117200;
        auVar450._20_4_ = 0x3f800000;
        auVar366._20_4_ = 0x80000000;
        auVar331._20_4_ = 0xbd99b01e;
        auVar289._20_4_ = 0xbc83a25c;
        auVar218._20_4_ = 0xbf800000;
        auVar156._20_4_ = 0x7fffffff;
        auVar562._24_4_ = 0xbeaaaa53;
        auVar514._24_4_ = 0xbe117200;
        auVar450._24_4_ = 0x3f800000;
        auVar366._24_4_ = 0x80000000;
        auVar331._24_4_ = 0xbd99b01e;
        auVar289._24_4_ = 0xbc83a25c;
        auVar218._24_4_ = 0xbf800000;
        auVar156._24_4_ = 0x7fffffff;
        auVar562._28_4_ = 0xbeaaaa53;
        auVar514._28_4_ = 0xbe117200;
        auVar450._28_4_ = 0x3f800000;
        auVar366._28_4_ = 0x80000000;
        auVar331._28_4_ = 0xbd99b01e;
        auVar289._28_4_ = 0xbc83a25c;
        auVar218._28_4_ = 0xbf800000;
        auVar156._28_4_ = 0x7fffffff;
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar258 = vandps_avx(*pauVar19,auVar156);
            auVar458 = vcmpps_avx(auVar450,auVar258,1);
            auVar51 = vblendvps_avx(auVar258,auVar218,auVar458);
            auVar258 = vmaxps_avx(auVar450,auVar258);
            auVar390 = vdivps_avx(auVar51,auVar258);
            fVar26 = auVar390._0_4_ * auVar390._0_4_;
            fVar229 = auVar390._4_4_ * auVar390._4_4_;
            auVar3._4_4_ = fVar229;
            auVar3._0_4_ = fVar26;
            fVar230 = auVar390._8_4_ * auVar390._8_4_;
            auVar3._8_4_ = fVar230;
            fVar231 = auVar390._12_4_ * auVar390._12_4_;
            auVar3._12_4_ = fVar231;
            fVar232 = auVar390._16_4_ * auVar390._16_4_;
            auVar3._16_4_ = fVar232;
            fVar233 = auVar390._20_4_ * auVar390._20_4_;
            auVar3._20_4_ = fVar233;
            fVar234 = auVar390._24_4_ * auVar390._24_4_;
            auVar3._24_4_ = fVar234;
            auVar3._28_4_ = auVar51._28_4_;
            auVar265._0_4_ = fVar26 * fVar26;
            auVar265._4_4_ = fVar229 * fVar229;
            auVar265._8_4_ = fVar230 * fVar230;
            auVar265._12_4_ = fVar231 * fVar231;
            auVar265._16_4_ = fVar232 * fVar232;
            auVar265._20_4_ = fVar233 * fVar233;
            auVar265._28_36_ = in_ZMM4._28_36_;
            auVar265._24_4_ = fVar234 * fVar234;
            auVar258 = auVar265._0_32_;
            in_ZMM4 = ZEXT3264(auVar258);
            auVar206 = vfmadd213ps_fma(auVar289,auVar258,auVar331);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar258,auVar514);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar258,auVar562);
            auVar332._8_4_ = 0x3b3ac537;
            auVar332._0_8_ = 0x3b3ac5373b3ac537;
            auVar332._12_4_ = 0x3b3ac537;
            auVar332._16_4_ = 0x3b3ac537;
            auVar332._20_4_ = 0x3b3ac537;
            auVar332._24_4_ = 0x3b3ac537;
            auVar332._28_4_ = 0x3b3ac537;
            auVar367._8_4_ = 0x3d2edd4e;
            auVar367._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar367._12_4_ = 0x3d2edd4e;
            auVar367._16_4_ = 0x3d2edd4e;
            auVar367._20_4_ = 0x3d2edd4e;
            auVar367._24_4_ = 0x3d2edd4e;
            auVar367._28_4_ = 0x3d2edd4e;
            auVar180 = vfmadd213ps_fma(auVar332,auVar258,auVar367);
            auVar368._8_4_ = 0x3dd9ed24;
            auVar368._0_8_ = 0x3dd9ed243dd9ed24;
            auVar368._12_4_ = 0x3dd9ed24;
            auVar368._16_4_ = 0x3dd9ed24;
            auVar368._20_4_ = 0x3dd9ed24;
            auVar368._24_4_ = 0x3dd9ed24;
            auVar368._28_4_ = 0x3dd9ed24;
            auVar180 = vfmadd213ps_fma(ZEXT1632(auVar180),auVar258,auVar368);
            auVar369._8_4_ = 0x3e4cb974;
            auVar369._0_8_ = 0x3e4cb9743e4cb974;
            auVar369._12_4_ = 0x3e4cb974;
            auVar369._16_4_ = 0x3e4cb974;
            auVar369._20_4_ = 0x3e4cb974;
            auVar369._24_4_ = 0x3e4cb974;
            auVar369._28_4_ = 0x3e4cb974;
            auVar180 = vfmadd213ps_fma(ZEXT1632(auVar180),auVar258,auVar369);
            auVar180 = vfmadd213ps_fma(ZEXT1632(auVar180),auVar258,auVar450);
            auVar206 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar3,ZEXT1632(auVar206));
            auVar219._8_4_ = 0x3fc90fdb;
            auVar219._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar219._12_4_ = 0x3fc90fdb;
            auVar219._16_4_ = 0x3fc90fdb;
            auVar219._20_4_ = 0x3fc90fdb;
            auVar219._24_4_ = 0x3fc90fdb;
            auVar219._28_4_ = 0x3fc90fdb;
            auVar258 = vandps_avx(auVar458,auVar219);
            auVar206 = vfmadd231ps_fma(auVar258,auVar390,ZEXT1632(auVar206));
            auVar258 = vandps_avx(auVar366,*pauVar19);
            auVar258 = vorps_avx(auVar258,ZEXT1632(auVar206));
            *pauVar19 = auVar258;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar422._8_4_ = 0x3f800000;
        auVar422._0_8_ = 0x3f8000003f800000;
        auVar422._12_4_ = 0x3f800000;
        auVar463._8_4_ = 0xbf800000;
        auVar463._0_8_ = 0xbf800000bf800000;
        auVar463._12_4_ = 0xbf800000;
        auVar485._8_4_ = 0xbd99b01e;
        auVar485._0_8_ = 0xbd99b01ebd99b01e;
        auVar485._12_4_ = 0xbd99b01e;
        auVar504._8_4_ = 0xbc83a25c;
        auVar504._0_8_ = 0xbc83a25cbc83a25c;
        auVar504._12_4_ = 0xbc83a25c;
        auVar519._8_4_ = 0xbe117200;
        auVar519._0_8_ = 0xbe117200be117200;
        auVar519._12_4_ = 0xbe117200;
        auVar536._8_4_ = 0xbeaaaa53;
        auVar536._0_8_ = 0xbeaaaa53beaaaa53;
        auVar536._12_4_ = 0xbeaaaa53;
        auVar553._8_4_ = 0x3d2edd4e;
        auVar553._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar553._12_4_ = 0x3d2edd4e;
        auVar394._8_4_ = 0x3b3ac537;
        auVar394._0_8_ = 0x3b3ac5373b3ac537;
        auVar394._12_4_ = 0x3b3ac537;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar127._8_4_ = 0x7fffffff;
          auVar127._0_8_ = 0x7fffffff7fffffff;
          auVar127._12_4_ = 0x7fffffff;
          auVar206 = vandps_avx(*(undefined1 (*) [16])*pauVar19,auVar127);
          auVar148 = vcmpps_avx(auVar422,auVar206,1);
          auVar180 = vblendvps_avx(auVar206,auVar463,auVar148);
          auVar206 = vmaxps_avx(auVar422,auVar206);
          auVar180 = vdivps_avx(auVar180,auVar206);
          auVar200._0_4_ = auVar180._0_4_ * auVar180._0_4_;
          auVar200._4_4_ = auVar180._4_4_ * auVar180._4_4_;
          auVar200._8_4_ = auVar180._8_4_ * auVar180._8_4_;
          auVar200._12_4_ = auVar180._12_4_ * auVar180._12_4_;
          auVar237._0_4_ = auVar200._0_4_ * auVar200._0_4_;
          auVar237._4_4_ = auVar200._4_4_ * auVar200._4_4_;
          auVar237._8_4_ = auVar200._8_4_ * auVar200._8_4_;
          auVar237._12_4_ = auVar200._12_4_ * auVar200._12_4_;
          in_ZMM4 = ZEXT1664(auVar237);
          auVar206 = vfmadd213ps_fma(auVar504,auVar237,auVar485);
          auVar206 = vfmadd213ps_fma(auVar206,auVar237,auVar519);
          auVar206 = vfmadd213ps_fma(auVar206,auVar237,auVar536);
          auVar314 = vfmadd213ps_fma(auVar394,auVar237,auVar553);
          auVar343._8_4_ = 0x3dd9ed24;
          auVar343._0_8_ = 0x3dd9ed243dd9ed24;
          auVar343._12_4_ = 0x3dd9ed24;
          auVar314 = vfmadd213ps_fma(auVar314,auVar237,auVar343);
          auVar344._8_4_ = 0x3e4cb974;
          auVar344._0_8_ = 0x3e4cb9743e4cb974;
          auVar344._12_4_ = 0x3e4cb974;
          auVar314 = vfmadd213ps_fma(auVar314,auVar237,auVar344);
          auVar314 = vfmadd213ps_fma(auVar314,auVar237,auVar422);
          auVar314 = vfmadd231ps_fma(auVar314,auVar200,auVar206);
          auVar201._8_4_ = 0x3fc90fdb;
          auVar201._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar201._12_4_ = 0x3fc90fdb;
          auVar206 = vandps_avx(auVar148,auVar201);
          auVar180 = vfmadd231ps_fma(auVar206,auVar180,auVar314);
          auVar128._8_4_ = 0x80000000;
          auVar128._0_8_ = 0x8000000080000000;
          auVar128._12_4_ = 0x80000000;
          auVar206 = vandps_avx(*(undefined1 (*) [16])*pauVar19,auVar128);
          auVar206 = vorps_avx(auVar206,auVar180);
          *(undefined1 (*) [16])*pauVar19 = auVar206;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if (uVar17 - uVar23 != 0 && (int)uVar23 <= (int)uVar17) {
          lVar25 = 0;
          do {
            in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
            fVar26 = atanf(*(float *)(*pauVar19 + lVar25 * 4));
            *(float *)(*pauVar19 + lVar25 * 4) = fVar26;
            lVar25 = lVar25 + 1;
          } while (uVar17 - uVar23 != (int)lVar25);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 0xf:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar66._8_4_ = 0x3f800000;
      auVar66._0_8_ = 0x3f8000003f800000;
      auVar66._12_4_ = 0x3f800000;
      auVar66._16_4_ = 0x3f800000;
      auVar66._20_4_ = 0x3f800000;
      auVar66._24_4_ = 0x3f800000;
      auVar66._28_4_ = 0x3f800000;
      auVar138._8_4_ = 0x3f800000;
      auVar138._0_8_ = 0x3f8000003f800000;
      auVar138._12_4_ = 0x3f800000;
      auVar246._8_8_ = 0x8000000000000000;
      auVar246._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar180,auVar180);
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar458 = vdivps_avx(auVar66,*pauVar19);
            *pauVar19 = auVar458;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar180 = vdivps_avx(auVar138,*(undefined1 (*) [16])*pauVar19);
          *(undefined1 (*) [16])*pauVar19 = auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar322._8_8_ = 0;
          auVar322._0_8_ = uVar16;
          auVar314 = vpshufd_avx(auVar322,0x44);
          auVar180 = vorps_avx(auVar314,auVar246);
          auVar148 = vorps_avx(auVar314,auVar246);
          auVar314 = vorps_avx(auVar314,auVar246);
          uVar24 = 0;
          do {
            auVar430._8_8_ = 0;
            auVar430._0_8_ = uVar24;
            auVar346 = vpshufd_avx(auVar430,0x44);
            auVar453._16_16_ = auVar346;
            auVar453._0_16_ = auVar346;
            auVar458 = vorps_avx(auVar453,auVar258);
            auVar390 = vorps_avx(auVar453,auVar51);
            auVar489._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar489._8_4_ = auVar390._24_4_;
            auVar489._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar346 = vpcmpgtq_avx(auVar489,auVar180);
            auVar431._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar431._8_4_ = auVar390._8_4_;
            auVar431._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar431,auVar148);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar490._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar490._8_4_ = auVar458._24_4_;
            auVar490._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar490,auVar180);
            auVar466._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar466._8_4_ = auVar458._8_4_;
            auVar466._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar466,auVar314);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar346 = vpackssdw_avx(auVar123 ^ auVar206,auVar346 ^ auVar206);
            auVar123 = vpmovsxwd_avx(auVar346);
            auVar346 = vpunpckhwd_avx(auVar346,auVar346);
            auVar454._16_16_ = auVar346;
            auVar454._0_16_ = auVar123;
            auVar458 = vmaskmovps_avx(auVar454,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar458 = vdivps_avx(auVar66,auVar458);
            auVar458 = vmaskmovps_avx(auVar454,auVar458);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 0x10:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      do {
        auVar513._8_4_ = 0x395e8083;
        auVar513._0_8_ = 0x395e8083395e8083;
        auVar476._8_4_ = 0x3f318000;
        auVar476._0_8_ = 0x3f3180003f318000;
        auVar449._8_4_ = 0x3f800000;
        auVar449._0_8_ = 0x3f8000003f800000;
        auVar365._8_4_ = 0x3f000000;
        auVar365._0_8_ = 0x3f0000003f000000;
        auVar330._8_4_ = 0x3d2aa9c1;
        auVar330._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar288._8_4_ = 0x3c088908;
        auVar288._0_8_ = 0x3c0889083c088908;
        auVar257._8_4_ = 0xc0000000;
        auVar257._0_8_ = 0xc0000000c0000000;
        auVar217._8_4_ = 0x3fb8aa3b;
        auVar217._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar185._8_4_ = 0xc2b0c0a5;
        auVar185._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar154._8_4_ = 0x42b0c0a5;
        auVar154._0_8_ = 0x42b0c0a542b0c0a5;
        auVar50._8_4_ = 0x39506967;
        auVar50._0_8_ = 0x3950696739506967;
        auVar513._12_4_ = 0x395e8083;
        auVar476._12_4_ = 0x3f318000;
        auVar449._12_4_ = 0x3f800000;
        auVar365._12_4_ = 0x3f000000;
        auVar330._12_4_ = 0x3d2aa9c1;
        auVar288._12_4_ = 0x3c088908;
        auVar257._12_4_ = 0xc0000000;
        auVar217._12_4_ = 0x3fb8aa3b;
        auVar185._12_4_ = 0xc2b0c0a5;
        auVar154._12_4_ = 0x42b0c0a5;
        auVar50._12_4_ = 0x39506967;
        auVar513._16_4_ = 0x395e8083;
        auVar476._16_4_ = 0x3f318000;
        auVar449._16_4_ = 0x3f800000;
        auVar365._16_4_ = 0x3f000000;
        auVar330._16_4_ = 0x3d2aa9c1;
        auVar288._16_4_ = 0x3c088908;
        auVar257._16_4_ = 0xc0000000;
        auVar217._16_4_ = 0x3fb8aa3b;
        auVar185._16_4_ = 0xc2b0c0a5;
        auVar154._16_4_ = 0x42b0c0a5;
        auVar50._16_4_ = 0x39506967;
        auVar513._20_4_ = 0x395e8083;
        auVar476._20_4_ = 0x3f318000;
        auVar449._20_4_ = 0x3f800000;
        auVar365._20_4_ = 0x3f000000;
        auVar330._20_4_ = 0x3d2aa9c1;
        auVar288._20_4_ = 0x3c088908;
        auVar257._20_4_ = 0xc0000000;
        auVar217._20_4_ = 0x3fb8aa3b;
        auVar185._20_4_ = 0xc2b0c0a5;
        auVar154._20_4_ = 0x42b0c0a5;
        auVar50._20_4_ = 0x39506967;
        auVar513._24_4_ = 0x395e8083;
        auVar476._24_4_ = 0x3f318000;
        auVar449._24_4_ = 0x3f800000;
        auVar365._24_4_ = 0x3f000000;
        auVar330._24_4_ = 0x3d2aa9c1;
        auVar288._24_4_ = 0x3c088908;
        auVar257._24_4_ = 0xc0000000;
        auVar217._24_4_ = 0x3fb8aa3b;
        auVar185._24_4_ = 0xc2b0c0a5;
        auVar154._24_4_ = 0x42b0c0a5;
        auVar50._24_4_ = 0x39506967;
        auVar513._28_4_ = 0x395e8083;
        auVar476._28_4_ = 0x3f318000;
        auVar449._28_4_ = 0x3f800000;
        auVar365._28_4_ = 0x3f000000;
        auVar330._28_4_ = 0x3d2aa9c1;
        auVar288._28_4_ = 0x3c088908;
        auVar257._28_4_ = 0xc0000000;
        auVar217._28_4_ = 0x3fb8aa3b;
        auVar185._28_4_ = 0xc2b0c0a5;
        auVar154._28_4_ = 0x42b0c0a5;
        auVar50._28_4_ = 0x39506967;
        auVar85 = ZEXT3264(auVar50);
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar86._0_4_ = *(float *)*pauVar19 * -2.0;
            auVar86._4_4_ = *(float *)((long)*pauVar19 + 4) * -2.0;
            auVar86._8_4_ = *(float *)((long)*pauVar19 + 8) * -2.0;
            auVar86._12_4_ = *(float *)((long)*pauVar19 + 0xc) * -2.0;
            auVar86._16_4_ = *(float *)((long)*pauVar19 + 0x10) * -2.0;
            auVar86._20_4_ = *(float *)((long)*pauVar19 + 0x14) * -2.0;
            auVar86._28_36_ = auVar85._28_36_;
            auVar86._24_4_ = *(float *)((long)*pauVar19 + 0x18) * -2.0;
            auVar258 = vminps_avx(auVar86._0_32_,auVar154);
            auVar51 = vmaxps_avx(auVar258,auVar185);
            auVar206 = vfmadd213ps_fma(auVar217,auVar51,auVar365);
            auVar458 = vroundps_avx(ZEXT1632(auVar206),1);
            auVar258 = vcmpps_avx(ZEXT1632(auVar206),auVar458,1);
            auVar258 = vandps_avx(auVar449,auVar258);
            auVar258 = vsubps_avx(auVar458,auVar258);
            auVar206 = vfmsub231ps_fma(auVar51,auVar258,auVar476);
            auVar180 = vfmsub231ps_fma(ZEXT1632(auVar206),auVar258,auVar513);
            auVar51 = ZEXT1632(auVar180);
            auVar2._28_4_ = auVar458._28_4_;
            auVar2._0_28_ =
                 ZEXT1628(CONCAT412(auVar180._12_4_ * auVar180._12_4_,
                                    CONCAT48(auVar180._8_4_ * auVar180._8_4_,
                                             CONCAT44(auVar180._4_4_ * auVar180._4_4_,
                                                      auVar180._0_4_ * auVar180._0_4_))));
            auVar529._8_4_ = 0x3ab743ce;
            auVar529._0_8_ = 0x3ab743ce3ab743ce;
            auVar529._12_4_ = 0x3ab743ce;
            auVar529._16_4_ = 0x3ab743ce;
            auVar529._20_4_ = 0x3ab743ce;
            auVar529._24_4_ = 0x3ab743ce;
            auVar529._28_4_ = 0x3ab743ce;
            auVar206 = vfmadd213ps_fma(auVar50,auVar51,auVar529);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar51,auVar288);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar51,auVar330);
            auVar530._8_4_ = 0x3e2aaaaa;
            auVar530._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar530._12_4_ = 0x3e2aaaaa;
            auVar530._16_4_ = 0x3e2aaaaa;
            auVar530._20_4_ = 0x3e2aaaaa;
            auVar530._24_4_ = 0x3e2aaaaa;
            auVar530._28_4_ = 0x3e2aaaaa;
            auVar51 = ZEXT1632(auVar180);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar51,auVar530);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar51,auVar365);
            auVar148 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar2,auVar51);
            auVar27._0_4_ = (int)auVar258._0_4_;
            auVar27._4_4_ = (int)auVar258._4_4_;
            auVar27._8_4_ = (int)auVar258._8_4_;
            auVar27._12_4_ = (int)auVar258._12_4_;
            auVar52._16_4_ = (int)auVar258._16_4_;
            auVar52._0_16_ = auVar27;
            auVar52._20_4_ = (int)auVar258._20_4_;
            auVar52._24_4_ = (int)auVar258._24_4_;
            auVar52._28_4_ = (int)auVar258._28_4_;
            auVar180 = vpslld_avx(auVar27,0x17);
            auVar206 = vpslld_avx(auVar52._16_16_,0x17);
            auVar392._8_4_ = 0x3f800000;
            auVar392._0_8_ = 0x3f8000003f800000;
            auVar392._12_4_ = 0x3f800000;
            auVar206 = vpaddd_avx(auVar392,auVar206);
            auVar180 = vpaddd_avx(auVar392,auVar180);
            auVar53._16_16_ = auVar206;
            auVar53._0_16_ = auVar180;
            auVar155._0_4_ = auVar148._0_4_ + 1.0;
            auVar155._4_4_ = auVar148._4_4_ + 1.0;
            auVar155._8_4_ = auVar148._8_4_ + 1.0;
            auVar155._12_4_ = auVar148._12_4_ + 1.0;
            auVar155._16_4_ = 0x3f800000;
            auVar155._20_4_ = 0x3f800000;
            auVar155._24_4_ = 0x3f800000;
            auVar155._28_4_ = 0x3f800000;
            auVar206 = vfmadd213ps_fma(auVar53,auVar155,auVar449);
            auVar258 = vdivps_avx(auVar449,ZEXT1632(auVar206));
            auVar206 = vfnmsub213ps_fma(auVar258,auVar257,auVar449);
            auVar85 = ZEXT1664(auVar206);
            *pauVar19 = ZEXT1632(auVar206);
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar236._8_4_ = 0x3f800000;
        auVar236._0_8_ = 0x3f8000003f800000;
        auVar236._12_4_ = 0x3f800000;
        auVar342._8_4_ = 0xc2b0c0a5;
        auVar342._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar342._12_4_ = 0xc2b0c0a5;
        auVar393._8_4_ = 0x3fb8aa3b;
        auVar393._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar393._12_4_ = 0x3fb8aa3b;
        auVar421._8_4_ = 0x3f000000;
        auVar421._0_8_ = 0x3f0000003f000000;
        auVar421._12_4_ = 0x3f000000;
        auVar462._8_4_ = 0x3f318000;
        auVar462._0_8_ = 0x3f3180003f318000;
        auVar462._12_4_ = 0x3f318000;
        auVar484._8_4_ = 0x395e8083;
        auVar484._0_8_ = 0x395e8083395e8083;
        auVar484._12_4_ = 0x395e8083;
        auVar503._8_4_ = 0x3ab743ce;
        auVar503._0_8_ = 0x3ab743ce3ab743ce;
        auVar503._12_4_ = 0x3ab743ce;
        auVar518._8_4_ = 0x39506967;
        auVar518._0_8_ = 0x3950696739506967;
        auVar518._12_4_ = 0x39506967;
        auVar535._8_4_ = 0x3c088908;
        auVar535._0_8_ = 0x3c0889083c088908;
        auVar535._12_4_ = 0x3c088908;
        auVar552._8_4_ = 0x3d2aa9c1;
        auVar552._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar552._12_4_ = 0x3d2aa9c1;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar28._0_4_ = *(float *)*pauVar19 * -2.0;
          auVar28._4_4_ = *(float *)((long)*pauVar19 + 4) * -2.0;
          auVar28._8_4_ = *(float *)((long)*pauVar19 + 8) * -2.0;
          auVar28._12_4_ = *(float *)((long)*pauVar19 + 0xc) * -2.0;
          auVar125._8_4_ = 0x42b0c0a5;
          auVar125._0_8_ = 0x42b0c0a542b0c0a5;
          auVar125._12_4_ = 0x42b0c0a5;
          auVar206 = vminps_avx(auVar28,auVar125);
          auVar148 = vmaxps_avx(auVar206,auVar342);
          auVar206 = vfmadd213ps_fma(auVar393,auVar148,auVar421);
          auVar170._0_4_ = (int)auVar206._0_4_;
          auVar170._4_4_ = (int)auVar206._4_4_;
          auVar170._8_4_ = (int)auVar206._8_4_;
          auVar170._12_4_ = (int)auVar206._12_4_;
          auVar180 = vcvtdq2ps_avx(auVar170);
          auVar206 = vcmpps_avx(auVar206,auVar180,1);
          auVar206 = vandps_avx(auVar206,auVar236);
          auVar206 = vsubps_avx(auVar180,auVar206);
          auVar180 = vfmsub231ps_fma(auVar148,auVar206,auVar462);
          auVar148 = vfmsub231ps_fma(auVar180,auVar206,auVar484);
          auVar171._0_4_ = auVar148._0_4_ * auVar148._0_4_;
          auVar171._4_4_ = auVar148._4_4_ * auVar148._4_4_;
          auVar171._8_4_ = auVar148._8_4_ * auVar148._8_4_;
          auVar171._12_4_ = auVar148._12_4_ * auVar148._12_4_;
          auVar180 = vfmadd213ps_fma(auVar518,auVar148,auVar503);
          auVar180 = vfmadd213ps_fma(auVar180,auVar148,auVar535);
          auVar180 = vfmadd213ps_fma(auVar180,auVar148,auVar552);
          auVar313._8_4_ = 0x3e2aaaaa;
          auVar313._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar313._12_4_ = 0x3e2aaaaa;
          auVar180 = vfmadd213ps_fma(auVar180,auVar148,auVar313);
          auVar180 = vfmadd213ps_fma(auVar180,auVar148,auVar421);
          auVar180 = vfmadd213ps_fma(auVar180,auVar171,auVar148);
          auVar29._0_4_ = auVar180._0_4_ + 1.0;
          auVar29._4_4_ = auVar180._4_4_ + 1.0;
          auVar29._8_4_ = auVar180._8_4_ + 1.0;
          auVar29._12_4_ = auVar180._12_4_ + 1.0;
          auVar126._0_4_ = (int)auVar206._0_4_;
          auVar126._4_4_ = (int)auVar206._4_4_;
          auVar126._8_4_ = (int)auVar206._8_4_;
          auVar126._12_4_ = (int)auVar206._12_4_;
          auVar206 = vpslld_avx(auVar126,0x17);
          auVar206 = vpaddd_avx(auVar206,auVar236);
          auVar206 = vfmadd213ps_fma(auVar206,auVar29,auVar236);
          auVar30._8_4_ = 0x40000000;
          auVar30._0_8_ = 0x4000000040000000;
          auVar30._12_4_ = 0x40000000;
          auVar206 = vdivps_avx(auVar30,auVar206);
          *(float *)*pauVar19 = auVar206._0_4_ + -1.0;
          *(float *)((long)*pauVar19 + 4) = auVar206._4_4_ + -1.0;
          *(float *)((long)*pauVar19 + 8) = auVar206._8_4_ + -1.0;
          *(float *)((long)*pauVar19 + 0xc) = auVar206._12_4_ + -1.0;
          pauVar19 = (undefined1 (*) [32])((long)*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if (uVar17 - uVar23 != 0 && (int)uVar23 <= (int)uVar17) {
          lVar25 = 0;
          do {
            fVar26 = tanhf(*(float *)((long)*pauVar19 + lVar25 * 4));
            *(float *)((long)*pauVar19 + lVar25 * 4) = fVar26;
            lVar25 = lVar25 + 1;
          } while (uVar17 - uVar23 != (int)lVar25);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 0x11:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      local_c8._8_8_ = 0x8000000000000000;
      local_c8._0_8_ = 0x8000000000000000;
      do {
        auVar206 = in_ZMM5._0_16_;
        auVar567._8_4_ = 0x3def251a;
        auVar567._0_8_ = 0x3def251a3def251a;
        auVar548._8_4_ = 0x3d9021bb;
        auVar548._0_8_ = 0x3d9021bb3d9021bb;
        auVar532._8_4_ = 0xbdebd1b8;
        auVar532._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar501._8_4_ = 0x3f3504f3;
        auVar501._0_8_ = 0x3f3504f33f3504f3;
        auVar458._8_4_ = 0x3f000000;
        auVar458._0_8_ = 0x3f0000003f000000;
        auVar51._8_4_ = 0x807fffff;
        auVar51._0_8_ = 0x807fffff807fffff;
        auVar258._8_4_ = 0x800000;
        auVar258._0_8_ = 0x80000000800000;
        auVar567._12_4_ = 0x3def251a;
        auVar548._12_4_ = 0x3d9021bb;
        auVar532._12_4_ = 0xbdebd1b8;
        auVar501._12_4_ = 0x3f3504f3;
        auVar458._12_4_ = 0x3f000000;
        auVar51._12_4_ = 0x807fffff;
        auVar258._12_4_ = 0x800000;
        auVar567._16_4_ = 0x3def251a;
        auVar548._16_4_ = 0x3d9021bb;
        auVar532._16_4_ = 0xbdebd1b8;
        auVar501._16_4_ = 0x3f3504f3;
        auVar458._16_4_ = 0x3f000000;
        auVar51._16_4_ = 0x807fffff;
        auVar258._16_4_ = 0x800000;
        auVar567._20_4_ = 0x3def251a;
        auVar548._20_4_ = 0x3d9021bb;
        auVar532._20_4_ = 0xbdebd1b8;
        auVar501._20_4_ = 0x3f3504f3;
        auVar458._20_4_ = 0x3f000000;
        auVar51._20_4_ = 0x807fffff;
        auVar258._20_4_ = 0x800000;
        auVar469._8_4_ = 0xffffff81;
        auVar469._0_8_ = 0xffffff81ffffff81;
        auVar567._24_4_ = 0x3def251a;
        auVar548._24_4_ = 0x3d9021bb;
        auVar532._24_4_ = 0xbdebd1b8;
        auVar501._24_4_ = 0x3f3504f3;
        auVar458._24_4_ = 0x3f000000;
        auVar51._24_4_ = 0x807fffff;
        auVar258._24_4_ = 0x800000;
        auVar567._28_4_ = 0x3def251a;
        auVar548._28_4_ = 0x3d9021bb;
        auVar532._28_4_ = 0xbdebd1b8;
        auVar501._28_4_ = 0x3f3504f3;
        auVar469._12_4_ = 0xffffff81;
        auVar458._28_4_ = 0x3f000000;
        auVar51._28_4_ = 0x807fffff;
        auVar258._28_4_ = 0x800000;
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar390 = vmaxps_avx(*pauVar19,auVar258);
            auVar180 = vpsrld_avx(auVar390._0_16_,0x17);
            auVar206 = vpsrld_avx(auVar390._16_16_,0x17);
            auVar390 = vandps_avx(auVar390,auVar51);
            auVar387 = vorps_avx(auVar458,auVar390);
            auVar391 = vcmpps_avx(auVar501,auVar387,2);
            auVar390 = vandnps_avx(auVar391,auVar387);
            auVar162._0_4_ = auVar387._0_4_ + -1.0 + auVar390._0_4_;
            auVar162._4_4_ = auVar387._4_4_ + -1.0 + auVar390._4_4_;
            auVar162._8_4_ = auVar387._8_4_ + -1.0 + auVar390._8_4_;
            auVar162._12_4_ = auVar387._12_4_ + -1.0 + auVar390._12_4_;
            auVar162._16_4_ = auVar387._16_4_ + -1.0 + auVar390._16_4_;
            auVar162._20_4_ = auVar387._20_4_ + -1.0 + auVar390._20_4_;
            auVar162._24_4_ = auVar387._24_4_ + -1.0 + auVar390._24_4_;
            auVar162._28_4_ = auVar387._28_4_ + -1.0 + auVar390._28_4_;
            auVar206 = vpsubd_avx(auVar206,auVar391._16_16_);
            auVar206 = vpaddd_avx(auVar469,auVar206);
            auVar180 = vpsubd_avx(auVar180,auVar391._0_16_);
            auVar180 = vpaddd_avx(auVar469,auVar180);
            auVar190._16_16_ = auVar206;
            auVar190._0_16_ = auVar180;
            auVar223._0_4_ = auVar162._0_4_ * auVar162._0_4_;
            auVar223._4_4_ = auVar162._4_4_ * auVar162._4_4_;
            auVar223._8_4_ = auVar162._8_4_ * auVar162._8_4_;
            auVar223._12_4_ = auVar162._12_4_ * auVar162._12_4_;
            auVar223._16_4_ = auVar162._16_4_ * auVar162._16_4_;
            auVar223._20_4_ = auVar162._20_4_ * auVar162._20_4_;
            auVar223._24_4_ = auVar162._24_4_ * auVar162._24_4_;
            auVar223._28_4_ = 0;
            auVar206 = vfmadd213ps_fma(auVar548,auVar162,auVar532);
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar162,auVar567);
            auVar295._8_4_ = 0xbdfe5d4f;
            auVar295._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar295._12_4_ = 0xbdfe5d4f;
            auVar295._16_4_ = 0xbdfe5d4f;
            auVar295._20_4_ = 0xbdfe5d4f;
            auVar295._24_4_ = 0xbdfe5d4f;
            auVar295._28_4_ = 0xbdfe5d4f;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar162,auVar295);
            auVar296._8_4_ = 0x3e11e9bf;
            auVar296._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar296._12_4_ = 0x3e11e9bf;
            auVar296._16_4_ = 0x3e11e9bf;
            auVar296._20_4_ = 0x3e11e9bf;
            auVar296._24_4_ = 0x3e11e9bf;
            auVar296._28_4_ = 0x3e11e9bf;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar162,auVar296);
            auVar297._8_4_ = 0xbe2aae50;
            auVar297._0_8_ = 0xbe2aae50be2aae50;
            auVar297._12_4_ = 0xbe2aae50;
            auVar297._16_4_ = 0xbe2aae50;
            auVar297._20_4_ = 0xbe2aae50;
            auVar297._24_4_ = 0xbe2aae50;
            auVar297._28_4_ = 0xbe2aae50;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar162,auVar297);
            auVar298._8_4_ = 0x3e4cceac;
            auVar298._0_8_ = 0x3e4cceac3e4cceac;
            auVar298._12_4_ = 0x3e4cceac;
            auVar298._16_4_ = 0x3e4cceac;
            auVar298._20_4_ = 0x3e4cceac;
            auVar298._24_4_ = 0x3e4cceac;
            auVar298._28_4_ = 0x3e4cceac;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar162,auVar298);
            auVar299._8_4_ = 0xbe7ffffc;
            auVar299._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar299._12_4_ = 0xbe7ffffc;
            auVar299._16_4_ = 0xbe7ffffc;
            auVar299._20_4_ = 0xbe7ffffc;
            auVar299._24_4_ = 0xbe7ffffc;
            auVar299._28_4_ = 0xbe7ffffc;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar162,auVar299);
            auVar300._8_4_ = 0x3eaaaaaa;
            auVar300._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar300._12_4_ = 0x3eaaaaaa;
            auVar300._16_4_ = 0x3eaaaaaa;
            auVar300._20_4_ = 0x3eaaaaaa;
            auVar300._24_4_ = 0x3eaaaaaa;
            auVar300._28_4_ = 0x3eaaaaaa;
            auVar206 = vfmadd213ps_fma(ZEXT1632(auVar206),auVar162,auVar300);
            auVar262._0_4_ = auVar223._0_4_ * auVar162._0_4_ * auVar206._0_4_;
            auVar262._4_4_ = auVar223._4_4_ * auVar162._4_4_ * auVar206._4_4_;
            auVar262._8_4_ = auVar223._8_4_ * auVar162._8_4_ * auVar206._8_4_;
            auVar262._12_4_ = auVar223._12_4_ * auVar162._12_4_ * auVar206._12_4_;
            auVar262._16_4_ = auVar223._16_4_ * auVar162._16_4_ * 0.0;
            auVar262._20_4_ = auVar223._20_4_ * auVar162._20_4_ * 0.0;
            auVar262._24_4_ = auVar223._24_4_ * auVar162._24_4_ * 0.0;
            auVar262._28_4_ = 0;
            auVar390 = vcvtdq2ps_avx(auVar190);
            auVar206._8_4_ = 0xb95e8083;
            auVar206._0_8_ = 0xb95e8083b95e8083;
            auVar206._12_4_ = 0xb95e8083;
            auVar301._16_4_ = 0xb95e8083;
            auVar301._0_16_ = auVar206;
            auVar301._20_4_ = 0xb95e8083;
            auVar301._24_4_ = 0xb95e8083;
            auVar301._28_4_ = 0xb95e8083;
            auVar180 = vfmadd231ps_fma(auVar262,auVar390,auVar301);
            auVar180 = vfmsub231ps_fma(ZEXT1632(auVar180),auVar458,auVar223);
            auVar391 = vsubps_avx(ZEXT1632(auVar180),auVar162);
            auVar224._8_4_ = 0x3f318000;
            auVar224._0_8_ = 0x3f3180003f318000;
            auVar224._12_4_ = 0x3f318000;
            auVar224._16_4_ = 0x3f318000;
            auVar224._20_4_ = 0x3f318000;
            auVar224._24_4_ = 0x3f318000;
            auVar224._28_4_ = 0x3f318000;
            auVar180 = vfnmadd231ps_fma(auVar391,auVar224,auVar390);
            auVar390 = vcmpps_avx(*pauVar19,ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar163._0_4_ = auVar180._0_4_ * -0.4342945;
            auVar163._4_4_ = auVar180._4_4_ * -0.4342945;
            auVar163._8_4_ = auVar180._8_4_ * -0.4342945;
            auVar163._12_4_ = auVar180._12_4_ * -0.4342945;
            auVar163._16_4_ = 0x80000000;
            auVar163._20_4_ = 0x80000000;
            auVar163._24_4_ = 0x80000000;
            auVar163._28_4_ = 0;
            auVar390 = vorps_avx(auVar390,auVar163);
            *pauVar19 = auVar390;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        auVar403._8_4_ = 0x807fffff;
        auVar403._0_8_ = 0x807fffff807fffff;
        auVar403._12_4_ = 0x807fffff;
        auVar437._8_4_ = 0x3f000000;
        auVar437._0_8_ = 0x3f0000003f000000;
        auVar437._12_4_ = 0x3f000000;
        auVar470._8_4_ = 0xffffff82;
        auVar470._0_8_ = 0xffffff82ffffff82;
        auVar470._12_4_ = 0xffffff82;
        auVar494._8_4_ = 0x3f3504f3;
        auVar494._0_8_ = 0x3f3504f33f3504f3;
        auVar494._12_4_ = 0x3f3504f3;
        auVar525._8_4_ = 0x3f800000;
        auVar525._0_8_ = 0x3f8000003f800000;
        auVar525._12_4_ = 0x3f800000;
        auVar541._8_4_ = 0xbdebd1b8;
        auVar541._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar541._12_4_ = 0xbdebd1b8;
        auVar558._8_4_ = 0x3d9021bb;
        auVar558._0_8_ = 0x3d9021bb3d9021bb;
        auVar558._12_4_ = 0x3d9021bb;
        auVar326._8_4_ = 0x3def251a;
        auVar326._0_8_ = 0x3def251a3def251a;
        auVar326._12_4_ = 0x3def251a;
        auVar356._8_4_ = 0xbdfe5d4f;
        auVar356._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar356._12_4_ = 0xbdfe5d4f;
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar140._8_4_ = 0x800000;
          auVar140._0_8_ = 0x80000000800000;
          auVar140._12_4_ = 0x800000;
          auVar206 = vmaxps_avx(*(undefined1 (*) [16])*pauVar19,auVar140);
          auVar180 = vpsrld_avx(auVar206,0x17);
          auVar180 = vpaddd_avx(auVar470,auVar180);
          auVar206 = vandps_avx(auVar403,auVar206);
          auVar314 = vorps_avx(auVar437,auVar206);
          auVar148 = vcvtdq2ps_avx(auVar180);
          auVar180 = vcmpps_avx(auVar314,auVar494,1);
          auVar206 = vandps_avx(auVar180,auVar314);
          auVar141._0_4_ = auVar314._0_4_ + -1.0 + auVar206._0_4_;
          auVar141._4_4_ = auVar314._4_4_ + -1.0 + auVar206._4_4_;
          auVar141._8_4_ = auVar314._8_4_ + -1.0 + auVar206._8_4_;
          auVar141._12_4_ = auVar314._12_4_ + -1.0 + auVar206._12_4_;
          auVar206 = vandps_avx(auVar525,auVar180);
          auVar180 = vsubps_avx(auVar148,auVar206);
          auVar207._0_4_ = auVar141._0_4_ * auVar141._0_4_;
          auVar207._4_4_ = auVar141._4_4_ * auVar141._4_4_;
          auVar207._8_4_ = auVar141._8_4_ * auVar141._8_4_;
          auVar207._12_4_ = auVar141._12_4_ * auVar141._12_4_;
          auVar206 = vfmadd213ps_fma(auVar558,auVar141,auVar541);
          auVar206 = vfmadd213ps_fma(auVar206,auVar141,auVar326);
          auVar206 = vfmadd213ps_fma(auVar206,auVar141,auVar356);
          auVar275._8_4_ = 0x3e11e9bf;
          auVar275._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar275._12_4_ = 0x3e11e9bf;
          auVar206 = vfmadd213ps_fma(auVar206,auVar141,auVar275);
          auVar276._8_4_ = 0xbe2aae50;
          auVar276._0_8_ = 0xbe2aae50be2aae50;
          auVar276._12_4_ = 0xbe2aae50;
          auVar206 = vfmadd213ps_fma(auVar206,auVar141,auVar276);
          auVar277._8_4_ = 0x3e4cceac;
          auVar277._0_8_ = 0x3e4cceac3e4cceac;
          auVar277._12_4_ = 0x3e4cceac;
          auVar206 = vfmadd213ps_fma(auVar206,auVar141,auVar277);
          auVar278._8_4_ = 0xbe7ffffc;
          auVar278._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar278._12_4_ = 0xbe7ffffc;
          auVar206 = vfmadd213ps_fma(auVar206,auVar141,auVar278);
          auVar279._8_4_ = 0x3eaaaaaa;
          auVar279._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar279._12_4_ = 0x3eaaaaaa;
          auVar206 = vfmadd213ps_fma(auVar206,auVar141,auVar279);
          auVar251._0_4_ = auVar207._0_4_ * auVar141._0_4_ * auVar206._0_4_;
          auVar251._4_4_ = auVar207._4_4_ * auVar141._4_4_ * auVar206._4_4_;
          auVar251._8_4_ = auVar207._8_4_ * auVar141._8_4_ * auVar206._8_4_;
          auVar251._12_4_ = auVar207._12_4_ * auVar141._12_4_ * auVar206._12_4_;
          auVar206._8_4_ = 0xb95e8083;
          auVar206._0_8_ = 0xb95e8083b95e8083;
          auVar206._12_4_ = 0xb95e8083;
          auVar148 = vfmadd231ps_fma(auVar251,auVar180,auVar206);
          auVar148 = vfmsub231ps_fma(auVar148,auVar437,auVar207);
          auVar148 = vsubps_avx(auVar148,auVar141);
          auVar208._8_4_ = 0x3f318000;
          auVar208._0_8_ = 0x3f3180003f318000;
          auVar208._12_4_ = 0x3f318000;
          auVar148 = vfnmadd231ps_fma(auVar148,auVar208,auVar180);
          auVar180 = vcmpps_avx(*(undefined1 (*) [16])*pauVar19,_DAT_005a4070,2);
          auVar142._0_4_ = auVar148._0_4_ * -0.4342945;
          auVar142._4_4_ = auVar148._4_4_ * -0.4342945;
          auVar142._8_4_ = auVar148._8_4_ * -0.4342945;
          auVar142._12_4_ = auVar148._12_4_ * -0.4342945;
          auVar180 = vorps_avx(auVar180,auVar142);
          *(undefined1 (*) [16])*pauVar19 = auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        auVar206 = vpcmpeqd_avx(auVar206,auVar206);
        in_ZMM5 = ZEXT1664(auVar206);
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar16;
          auVar148 = vpshufd_avx(auVar40,0x44);
          auVar206 = vpor_avx(auVar148,local_c8);
          auVar180 = vpor_avx(auVar148,local_c8);
          uVar24 = 0;
          auVar258 = _DAT_005a57e0;
          do {
            auVar41._8_8_ = 0;
            auVar41._0_8_ = uVar24;
            auVar314 = vpshufd_avx(auVar41,0x44);
            auVar72._16_16_ = auVar314;
            auVar72._0_16_ = auVar314;
            auVar51 = vorps_avx(auVar72,_DAT_005a57c0);
            auVar258 = vorps_avx(auVar72,auVar258);
            auVar123 = vpor_avx(auVar148,local_c8);
            auVar314 = vpcmpgtq_avx(auVar258._16_16_ ^ local_c8,auVar123);
            auVar346 = vpcmpgtq_avx(auVar258._0_16_ ^ local_c8,auVar206);
            auVar314 = vpackssdw_avx(auVar346,auVar314);
            auVar122 = in_ZMM5._0_16_;
            auVar346 = vpcmpgtq_avx(auVar51._16_16_ ^ local_c8,auVar123);
            auVar143._0_8_ = auVar51._0_8_ ^ 0x8000000000000000;
            auVar143._8_4_ = auVar51._8_4_;
            auVar143._12_4_ = auVar51._12_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar143,auVar180);
            auVar346 = vpackssdw_avx(auVar123,auVar346);
            auVar314 = vpackssdw_avx(auVar346 ^ auVar122,auVar314 ^ auVar122);
            auVar346 = vpmovsxwd_avx(auVar314);
            auVar314 = vpunpckhwd_avx(auVar314,auVar314);
            auVar73._16_16_ = auVar314;
            auVar73._0_16_ = auVar346;
            auVar258 = vmaskmovps_avx(auVar73,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar123 = auVar258._16_16_;
            local_118._0_4_ = log10f(auVar258._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_05;
            local_118._8_4_ = extraout_XMM0_Dc_05;
            local_118._12_4_ = extraout_XMM0_Dd_05;
            auVar314 = vmovshdup_avx(auVar123);
            auVar85._0_4_ = log10f(auVar314._0_4_);
            auVar85._4_60_ = extraout_var_17;
            auVar314 = vinsertps_avx(local_118,auVar85._0_16_,0x10);
            auVar346 = vpermilpd_avx(auVar123,1);
            auVar105._0_4_ = log10f(auVar346._0_4_);
            auVar105._4_60_ = extraout_var_18;
            auVar314 = vinsertps_avx(auVar314,auVar105._0_16_,0x20);
            auVar346 = vpermilps_avx(auVar123,0xff);
            auVar106._0_4_ = log10f(auVar346._0_4_);
            auVar106._4_60_ = extraout_var_19;
            auVar314 = vinsertps_avx(auVar314,auVar106._0_16_,0x30);
            local_e8._0_4_ = auVar258._0_4_;
            local_118._0_4_ = log10f((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_06;
            local_118._8_4_ = extraout_XMM0_Dc_06;
            local_118._12_4_ = extraout_XMM0_Dd_06;
            local_e8 = auVar258._0_16_;
            auVar346 = vmovshdup_avx(local_e8);
            auVar107._0_4_ = log10f(auVar346._0_4_);
            auVar107._4_60_ = extraout_var_20;
            auVar346 = vinsertps_avx(local_118,auVar107._0_16_,0x10);
            auVar123 = vpermilpd_avx(local_e8,1);
            auVar108._0_4_ = log10f(auVar123._0_4_);
            auVar108._4_60_ = extraout_var_21;
            auVar346 = vinsertps_avx(auVar346,auVar108._0_16_,0x20);
            auVar123 = vpermilps_avx(local_e8,0xff);
            auVar109._0_4_ = log10f(auVar123._0_4_);
            auVar258 = _DAT_005a57e0;
            auVar109._4_60_ = extraout_var_22;
            auVar123 = vpcmpeqd_avx(auVar122,auVar122);
            in_ZMM5 = ZEXT1664(auVar123);
            auVar346 = vinsertps_avx(auVar346,auVar109._0_16_,0x30);
            auVar74._16_16_ = auVar314;
            auVar74._0_16_ = auVar346;
            auVar51 = vmaskmovps_avx(auVar73,auVar74);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar51;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    break;
  case 0x12:
    iVar21 = fegetround();
    fesetround(0);
    auVar51 = _DAT_005a57e0;
    auVar258 = _DAT_005a57c0;
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar314._8_8_ = 0x8000000000000000;
      auVar314._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar206,auVar206);
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar20 = 7;
          do {
            auVar458 = vroundps_avx(*pauVar19,8);
            *pauVar19 = auVar458;
            pauVar19 = pauVar19 + 1;
            iVar20 = iVar20 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar20 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar180 = vroundps_avx(*(undefined1 (*) [16])*pauVar19,8);
          *(undefined1 (*) [16])*pauVar19 = auVar180;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar346._8_8_ = 0;
          auVar346._0_8_ = uVar16;
          auVar346 = vpshufd_avx(auVar346,0x44);
          auVar180 = vorps_avx(auVar346,auVar314);
          auVar148 = vorps_avx(auVar346,auVar314);
          auVar346 = vorps_avx(auVar346,auVar314);
          uVar24 = 0;
          do {
            auVar360._8_8_ = 0;
            auVar360._0_8_ = uVar24;
            auVar123 = vpshufd_avx(auVar360,0x44);
            auVar387._16_16_ = auVar123;
            auVar387._0_16_ = auVar123;
            auVar458 = vorps_avx(auVar387,auVar258);
            auVar390 = vorps_avx(auVar387,auVar51);
            auVar442._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar442._8_4_ = auVar390._24_4_;
            auVar442._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar442,auVar180);
            auVar361._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar361._8_4_ = auVar390._8_4_;
            auVar361._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar361,auVar148);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar443._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar443._8_4_ = auVar458._24_4_;
            auVar443._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar443,auVar180);
            auVar408._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar408._8_4_ = auVar458._8_4_;
            auVar408._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar411 = vpcmpgtq_avx(auVar408,auVar346);
            auVar122 = vpackssdw_avx(auVar411,auVar122);
            auVar123 = vpackssdw_avx(auVar122 ^ auVar206,auVar123 ^ auVar206);
            auVar122 = vpmovsxwd_avx(auVar123);
            auVar123 = vpunpckhwd_avx(auVar123,auVar123);
            auVar388._16_16_ = auVar123;
            auVar388._0_16_ = auVar122;
            auVar458 = vmaskmovps_avx(auVar388,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar458 = vroundps_avx(auVar458,0xc);
            auVar458 = vmaskmovps_avx(auVar388,auVar458);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
    fesetround(iVar21);
    break;
  case 0x13:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar180._8_8_ = 0x8000000000000000;
      auVar180._0_8_ = 0x8000000000000000;
      auVar206 = vpcmpeqd_avx(auVar206,auVar206);
      do {
        pauVar19 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar17 < 8) {
          uVar23 = 0;
        }
        else {
          iVar21 = 7;
          do {
            auVar458 = vroundps_avx(*pauVar19,0xb);
            *pauVar19 = auVar458;
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar23 = uVar17 & 0xfffffff8;
          } while (iVar21 < (int)uVar17);
        }
        uVar22 = uVar23 | 3;
        while ((int)uVar22 < (int)uVar17) {
          auVar148 = vroundps_avx(*(undefined1 (*) [16])*pauVar19,0xb);
          *(undefined1 (*) [16])*pauVar19 = auVar148;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar16 = CONCAT44(0,~uVar23 + uVar17);
          auVar148._8_8_ = 0;
          auVar148._0_8_ = uVar16;
          auVar346 = vpshufd_avx(auVar148,0x44);
          auVar148 = vorps_avx(auVar346,auVar180);
          auVar314 = vorps_avx(auVar346,auVar180);
          auVar346 = vorps_avx(auVar346,auVar180);
          uVar24 = 0;
          do {
            auVar123._8_8_ = 0;
            auVar123._0_8_ = uVar24;
            auVar123 = vpshufd_avx(auVar123,0x44);
            auVar390._16_16_ = auVar123;
            auVar390._0_16_ = auVar123;
            auVar458 = vorps_avx(auVar390,auVar258);
            auVar390 = vorps_avx(auVar390,auVar51);
            auVar445._0_8_ = auVar390._16_8_ ^ 0x8000000000000000;
            auVar445._8_4_ = auVar390._24_4_;
            auVar445._12_4_ = auVar390._28_4_ ^ 0x80000000;
            auVar123 = vpcmpgtq_avx(auVar445,auVar148);
            auVar122._0_8_ = auVar390._0_8_ ^ 0x8000000000000000;
            auVar122._8_4_ = auVar390._8_4_;
            auVar122._12_4_ = auVar390._12_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar122,auVar314);
            auVar123 = vpackssdw_avx(auVar122,auVar123);
            auVar446._0_8_ = auVar458._16_8_ ^ 0x8000000000000000;
            auVar446._8_4_ = auVar458._24_4_;
            auVar446._12_4_ = auVar458._28_4_ ^ 0x80000000;
            auVar122 = vpcmpgtq_avx(auVar446,auVar148);
            auVar411._0_8_ = auVar458._0_8_ ^ 0x8000000000000000;
            auVar411._8_4_ = auVar458._8_4_;
            auVar411._12_4_ = auVar458._12_4_ ^ 0x80000000;
            auVar411 = vpcmpgtq_avx(auVar411,auVar346);
            auVar122 = vpackssdw_avx(auVar411,auVar122);
            auVar123 = vpackssdw_avx(auVar122 ^ auVar206,auVar123 ^ auVar206);
            auVar122 = vpmovsxwd_avx(auVar123);
            auVar123 = vpunpckhwd_avx(auVar123,auVar123);
            auVar391._16_16_ = auVar123;
            auVar391._0_16_ = auVar122;
            auVar458 = vmaskmovps_avx(auVar391,*(undefined1 (*) [32])(*pauVar19 + uVar24 * 4));
            auVar458 = vroundps_avx(auVar458,0xb);
            auVar458 = vmaskmovps_avx(auVar391,auVar458);
            *(undefined1 (*) [32])(*pauVar19 + uVar24 * 4) = auVar458;
            uVar24 = uVar24 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar24);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar1);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_fma_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    if (op_type == Operation_ROUND)
    {
        // round to nearest even
#ifdef FE_TONEAREST
        int old_rm = fegetround();
        fesetround(FE_TONEAREST);
#endif
        int ret = unary_op_inplace<unary_op_round>(bottom_top_blob, opt);
#ifdef FE_TONEAREST
        fesetround(old_rm);
#endif
        return ret;
    }

    if (op_type == Operation_TRUNC)
        return unary_op_inplace<unary_op_trunc>(bottom_top_blob, opt);

    return 0;
}